

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solvers.cpp
# Opt level: O1

vector<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>_>
* solver1P3L<double>(vector<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>_>
                     *__return_storage_ptr__,
                    vector<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::allocator<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>_>
                    *ptPair,vector<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::allocator<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>_>
                            *plPair,
                    vector<std::pair<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>,_std::allocator<std::pair<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>_>_>
                    *lPair,vector<std::pair<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>,_std::allocator<std::pair<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>_>_>
                           *lCPair)

{
  pointer ppVar1;
  pointer ppVar2;
  iterator __position;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [12];
  undefined1 auVar13 [12];
  undefined8 uVar14;
  undefined1 auVar15 [16];
  SrcEvaluatorType srcEvaluator_1;
  double *pdVar16;
  CommaInitializer<Eigen::Matrix<double,_4,_4,_0,_4,_4>_> *pCVar17;
  ostream *poVar18;
  long lVar19;
  undefined8 *puVar20;
  int iVar21;
  long lVar22;
  pointer pMVar23;
  Matrix<double,_4,_4,_0,_4,_4> *pMVar24;
  iterator iVar25;
  int iVar26;
  byte bVar27;
  double dVar28;
  double dVar29;
  double dVar30;
  double dVar31;
  double dVar32;
  double dVar33;
  double dVar34;
  double dVar35;
  double dVar36;
  double dVar37;
  double dVar38;
  double dVar39;
  double dVar40;
  double dVar41;
  double dVar42;
  double dVar43;
  double dVar44;
  double dVar45;
  double dVar46;
  double dVar47;
  double dVar48;
  double dVar49;
  double dVar50;
  double dVar51;
  double dVar52;
  double dVar53;
  double dVar54;
  double dVar55;
  double dVar56;
  double dVar57;
  double dVar58;
  double dVar59;
  double dVar60;
  double dVar61;
  double dVar62;
  double dVar63;
  double dVar64;
  double dVar65;
  double dVar66;
  double dVar67;
  double dVar68;
  double dVar69;
  double dVar70;
  double dVar71;
  double dVar72;
  double dVar73;
  double dVar74;
  double dVar75;
  double dVar76;
  double dVar77;
  double dVar78;
  double dVar79;
  double dVar80;
  double dVar81;
  double dVar82;
  double dVar83;
  double dVar84;
  double dVar85;
  double dVar86;
  double dVar87;
  double dVar88;
  double dVar89;
  double dVar90;
  double dVar91;
  double dVar92;
  double dVar93;
  double dVar94;
  double dVar95;
  double dVar96;
  double dVar97;
  double dVar98;
  double dVar99;
  double dVar100;
  double dVar101;
  double dVar102;
  double dVar103;
  double dVar104;
  double dVar105;
  double dVar106;
  double dVar107;
  double dVar108;
  double dVar109;
  double dVar110;
  double dVar111;
  double dVar112;
  double dVar113;
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  double dVar127;
  undefined1 auVar125 [16];
  double dVar128;
  undefined1 auVar126 [16];
  double dVar129;
  double dVar130;
  double dVar131;
  double dVar132;
  double dVar133;
  double dVar134;
  double dVar135;
  double dVar136;
  double dVar137;
  double dVar138;
  double dVar139;
  double dVar140;
  double dVar141;
  double dVar142;
  double dVar143;
  double dVar144;
  double dVar145;
  double dVar146;
  double dVar147;
  double dVar148;
  double dVar149;
  double dVar150;
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  double dVar156;
  double dVar157;
  double dVar158;
  double dVar159;
  double dVar160;
  double dVar161;
  double dVar162;
  double dVar163;
  double dVar164;
  double dVar165;
  double dVar166;
  double dVar167;
  double dVar168;
  undefined1 auVar169 [16];
  double dVar170;
  double dVar171;
  double dVar172;
  double dVar173;
  undefined4 uVar174;
  undefined4 uVar175;
  undefined4 uVar176;
  undefined4 uVar177;
  undefined4 uVar178;
  double dVar179;
  double dVar180;
  double dVar181;
  double dVar182;
  double dVar183;
  double dVar184;
  double dVar185;
  double dVar186;
  double dVar187;
  double dVar188;
  double dVar189;
  double dVar190;
  double dVar191;
  double dVar192;
  double dVar193;
  double dVar194;
  double dVar195;
  double dVar196;
  double dVar197;
  double dVar198;
  double dVar199;
  double dVar200;
  double dVar201;
  double dVar202;
  double dVar203;
  double dVar204;
  double dVar205;
  undefined1 auVar206 [16];
  double dVar207;
  double dVar208;
  double dVar209;
  double dVar210;
  double dVar211;
  double dVar212;
  double dVar213;
  double dVar214;
  double dVar215;
  double dVar216;
  double dVar217;
  undefined1 auVar218 [16];
  double dVar219;
  double dVar220;
  double dVar221;
  double dVar222;
  double dVar223;
  double dVar224;
  double dVar225;
  double dVar226;
  double dVar227;
  double dVar228;
  undefined1 auVar229 [16];
  undefined1 auVar230 [16];
  double dVar231;
  double dVar232;
  double dVar233;
  double dVar234;
  double dVar235;
  double dVar236;
  double dVar237;
  double dVar238;
  double dVar239;
  double dVar240;
  double dVar241;
  double dVar242;
  double dVar243;
  double dVar244;
  double dVar245;
  double dVar246;
  double dVar247;
  double dVar248;
  double dVar249;
  double dVar250;
  undefined1 auVar251 [16];
  double dVar252;
  double dVar253;
  double dVar254;
  undefined1 auVar255 [16];
  double dVar256;
  double dVar257;
  double dVar258;
  double dVar259;
  double dVar260;
  double dVar261;
  undefined1 auVar262 [16];
  vector<double,_std::allocator<double>_> realRoots;
  double b;
  double a;
  double ty;
  double tx;
  type tmp;
  vector<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>_>
  predTrans;
  Matrix<double,_6,_1,_0,_6,_1> L32;
  Matrix<double,_6,_1,_0,_6,_1> L22;
  Matrix<double,_6,_1,_0,_6,_1> L12;
  Matrix<double,_6,_1,_0,_6,_1> L31;
  Matrix<double,_6,_1,_0,_6,_1> L21;
  Matrix<double,_6,_1,_0,_6,_1> L11;
  Matrix<double,_4,_4,_0,_4,_4> TU;
  Matrix<double,_6,_6,_0,_6,_6> TK;
  Matrix<double,_6,_6,_0,_6,_6> TL;
  Matrix<double,_4,_4,_0,_4,_4> transOut;
  Matrix<double,_5,_1,_0,_5,_1> factors;
  Matrix<double,_4,_4,_0,_4,_4> TV;
  double local_20e8;
  double dStack_20e0;
  double local_20d8;
  double dStack_20d0;
  ulong uStack_20c0;
  double local_2098;
  double dStack_2090;
  double local_2078;
  double dStack_2070;
  undefined8 local_2048;
  undefined8 uStack_2040;
  double local_2018;
  double dStack_2010;
  double local_1fb8;
  double dStack_1fb0;
  double local_1fa8;
  double dStack_1fa0;
  undefined4 uStack_1e64;
  undefined4 uStack_1e60;
  uint uStack_1e5c;
  double local_1d68;
  double dStack_1d60;
  double local_1b98;
  double dStack_1b90;
  vector<double,_std::allocator<double>_> local_1890;
  double local_1878;
  double dStack_1870;
  double local_1868;
  double dStack_1860;
  double local_1858;
  double dStack_1850;
  double local_1848;
  double dStack_1840;
  double local_1838;
  double dStack_1830;
  double local_1828;
  double dStack_1820;
  double local_1818;
  double dStack_1810;
  double local_1808;
  double dStack_1800;
  double local_17f8;
  double dStack_17f0;
  double local_17e8;
  double dStack_17e0;
  double local_17d8;
  double dStack_17d0;
  double local_17c8;
  double dStack_17c0;
  double local_17b8;
  ulong uStack_17b0;
  double local_17a8;
  double dStack_17a0;
  double local_1798;
  double dStack_1790;
  double local_1788;
  double dStack_1780;
  double local_1778;
  double dStack_1770;
  double local_1768;
  double dStack_1760;
  double local_1758;
  double dStack_1750;
  double local_1748;
  double dStack_1740;
  double local_1738;
  double dStack_1730;
  double local_1728;
  double dStack_1720;
  double local_1718;
  double dStack_1710;
  double local_1708;
  double dStack_1700;
  double local_16f8;
  double dStack_16f0;
  double local_16e8;
  double dStack_16e0;
  double local_16d8;
  double dStack_16d0;
  double local_16c8;
  double dStack_16c0;
  double local_16b8;
  double dStack_16b0;
  double local_16a8;
  double dStack_16a0;
  double local_1698;
  double dStack_1690;
  double local_1688;
  double dStack_1680;
  double local_1678;
  double dStack_1670;
  SrcXprType local_1668;
  Matrix<double,_4,_4,_0,_4,_4> *local_1660;
  double local_1658;
  double dStack_1650;
  double local_1648;
  double dStack_1640;
  double local_1638;
  double dStack_1630;
  undefined1 local_1628 [16];
  double local_1618;
  double dStack_1610;
  undefined1 local_1608 [16];
  undefined1 local_15f8 [16];
  double local_15e8;
  ulong uStack_15e0;
  double local_15d8;
  double dStack_15d0;
  double local_15c8;
  double dStack_15c0;
  double local_15b8;
  double dStack_15b0;
  double local_15a8;
  ulong uStack_15a0;
  undefined1 local_1598 [16];
  undefined1 local_1588 [16];
  double local_1578;
  double dStack_1570;
  double local_1568;
  double dStack_1560;
  double local_1558;
  undefined8 uStack_1550;
  double local_1548;
  double dStack_1540;
  double local_1538;
  double dStack_1530;
  undefined1 local_1528 [16];
  double local_1518;
  double dStack_1510;
  double local_1508;
  double dStack_1500;
  double local_14f8;
  double dStack_14f0;
  double local_14e8;
  double dStack_14e0;
  double local_14d8;
  double dStack_14d0;
  double local_14c8;
  double dStack_14c0;
  double local_14b8;
  double dStack_14b0;
  double local_14a8;
  undefined8 uStack_14a0;
  double local_1498;
  double dStack_1490;
  double local_1488;
  double dStack_1480;
  double local_1478;
  undefined8 uStack_1470;
  double local_1468;
  double dStack_1460;
  double local_1458;
  double dStack_1450;
  double local_1448;
  double dStack_1440;
  double local_1438;
  double dStack_1430;
  double local_1428;
  double dStack_1420;
  double local_1418;
  double dStack_1410;
  double local_1408;
  double dStack_1400;
  double local_13f8;
  double dStack_13f0;
  double local_13e8;
  double dStack_13e0;
  double local_13d8;
  double dStack_13d0;
  double local_13c8;
  double dStack_13c0;
  double local_13b8;
  double dStack_13b0;
  double local_13a8;
  double dStack_13a0;
  double local_1398;
  double dStack_1390;
  double local_1388;
  double dStack_1380;
  double local_1378;
  double dStack_1370;
  double local_1368;
  double dStack_1360;
  double local_1358;
  double dStack_1350;
  double local_1348;
  double dStack_1340;
  double local_1338;
  double dStack_1330;
  double local_1328;
  double dStack_1320;
  double local_1318;
  double dStack_1310;
  double local_1308;
  double dStack_1300;
  double local_12f8;
  double dStack_12f0;
  double local_12e8;
  double dStack_12e0;
  double local_12d8;
  undefined8 uStack_12d0;
  double local_12c8;
  double dStack_12c0;
  double local_12b8;
  undefined8 uStack_12b0;
  double local_12a8;
  double dStack_12a0;
  double local_1298;
  double dStack_1290;
  double local_1288;
  double dStack_1280;
  double local_1278;
  double dStack_1270;
  double local_1268;
  double dStack_1260;
  double local_1258;
  double dStack_1250;
  double local_1248;
  double dStack_1240;
  double local_1238;
  double dStack_1230;
  double local_1228;
  double dStack_1220;
  double local_1218;
  double dStack_1210;
  double local_1208;
  double dStack_1200;
  double local_11f8;
  double dStack_11f0;
  double local_11e8;
  double dStack_11e0;
  double local_11d8;
  double dStack_11d0;
  double local_11c8;
  double dStack_11c0;
  double local_11b8;
  double dStack_11b0;
  double local_11a8;
  double dStack_11a0;
  double local_1198;
  double dStack_1190;
  double local_1188;
  double dStack_1180;
  double local_1178;
  double dStack_1170;
  double local_1168;
  double dStack_1160;
  double local_1158;
  double dStack_1150;
  double local_1148;
  double dStack_1140;
  double local_1138;
  double dStack_1130;
  double local_1128;
  double dStack_1120;
  double local_1118;
  double dStack_1110;
  double local_1108;
  double dStack_1100;
  double local_10f8;
  double dStack_10f0;
  double local_10e8;
  double dStack_10e0;
  double local_10d8;
  double dStack_10d0;
  undefined1 local_10c8 [16];
  double local_10b8;
  double dStack_10b0;
  double local_10a8;
  double dStack_10a0;
  double local_1098;
  undefined8 uStack_1090;
  double local_1088;
  double dStack_1080;
  double local_1078;
  double dStack_1070;
  double local_1068;
  double dStack_1060;
  double local_1058;
  double dStack_1050;
  double local_1048;
  double dStack_1040;
  double local_1038;
  double dStack_1030;
  double local_1028;
  double dStack_1020;
  double local_1018;
  double dStack_1010;
  double local_1008;
  double dStack_1000;
  double local_ff8;
  double dStack_ff0;
  double local_fe8;
  double dStack_fe0;
  double local_fd8;
  double dStack_fd0;
  double local_fc8;
  double dStack_fc0;
  double local_fb8;
  double dStack_fb0;
  double local_fa8;
  double dStack_fa0;
  double local_f98;
  double dStack_f90;
  double local_f88;
  double dStack_f80;
  double local_f78;
  double dStack_f70;
  double local_f68;
  double dStack_f60;
  double local_f58;
  double dStack_f50;
  double local_f48;
  double dStack_f40;
  double local_f38;
  undefined8 uStack_f30;
  double local_f28;
  double dStack_f20;
  double local_f18;
  double dStack_f10;
  double local_f08;
  double dStack_f00;
  double local_ef8;
  double dStack_ef0;
  double local_ee8;
  double dStack_ee0;
  double local_ed8;
  double dStack_ed0;
  double local_ec8;
  double dStack_ec0;
  double local_eb8;
  double dStack_eb0;
  double local_ea8;
  double dStack_ea0;
  double local_e98;
  double dStack_e90;
  double local_e88;
  undefined8 uStack_e80;
  double local_e78;
  double dStack_e70;
  double local_e68;
  double dStack_e60;
  double local_e58;
  double dStack_e50;
  double local_e48;
  double dStack_e40;
  double local_e38;
  double dStack_e30;
  double local_e28;
  double dStack_e20;
  double local_e18;
  Scalar local_e10;
  Scalar local_e08;
  Scalar local_e00;
  Scalar local_df8;
  Scalar local_df0;
  Scalar local_de8;
  Scalar local_de0;
  Scalar local_dd8;
  Scalar local_dd0;
  double local_dc8;
  PointerType local_dc0;
  double local_db8;
  double local_db0;
  Matrix<double,_4,_4,_0,_4,_4> local_da8;
  Matrix<double,_4,_4,_0,_4,_4> *local_d28;
  Matrix<double,_4,_4,_0,_4,_4> *local_d20;
  Matrix<double,_4,_4,_0,_4,_4> *local_d18;
  undefined8 local_d10;
  vector<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>_>
  local_d00;
  undefined1 local_ce8 [16];
  double local_cd8;
  double dStack_cd0;
  double local_cc8;
  double dStack_cc0;
  double local_cb8;
  double dStack_cb0;
  double local_ca8;
  double dStack_ca0;
  double local_c98;
  double dStack_c90;
  double local_c88;
  ulong uStack_c80;
  double local_c78;
  double dStack_c70;
  double local_c68;
  double dStack_c60;
  double local_c58;
  double dStack_c50;
  double local_c48;
  double dStack_c40;
  double local_c38;
  double dStack_c30;
  double local_c28;
  double dStack_c20;
  double local_c18;
  double dStack_c10;
  double local_c08;
  double dStack_c00;
  double local_bf8;
  double dStack_bf0;
  double local_be8;
  double dStack_be0;
  double local_bd8;
  double dStack_bd0;
  double local_bc8;
  double dStack_bc0;
  double local_bb8;
  ulong uStack_bb0;
  double local_ba8;
  double dStack_ba0;
  double local_b98;
  double dStack_b90;
  double local_b88;
  double dStack_b80;
  undefined1 local_b78 [16];
  undefined1 local_b68 [16];
  undefined1 local_b58 [16];
  undefined1 local_b48 [16];
  undefined1 local_b38 [16];
  undefined1 local_b28 [16];
  undefined1 local_b18 [16];
  undefined1 local_b08 [16];
  undefined1 local_af8 [16];
  undefined1 local_ae8 [16];
  undefined1 local_ad8 [16];
  undefined1 local_ac8 [16];
  undefined1 local_ab8 [16];
  undefined1 local_aa8 [16];
  undefined1 local_a98 [16];
  undefined1 local_a88 [16];
  undefined1 local_a78 [16];
  undefined1 local_a68 [16];
  double local_a58;
  double dStack_a50;
  double local_a48;
  double dStack_a40;
  double local_a38;
  double dStack_a30;
  double local_a28;
  double dStack_a20;
  double local_a18;
  double dStack_a10;
  double local_a08;
  double dStack_a00;
  double local_9f8;
  double dStack_9f0;
  double local_9e8;
  double dStack_9e0;
  double local_9d8;
  double dStack_9d0;
  double local_9c8;
  double dStack_9c0;
  double local_9b8;
  double dStack_9b0;
  double local_9a8;
  double dStack_9a0;
  undefined1 local_998 [16];
  double local_988;
  double dStack_980;
  double local_978;
  double dStack_970;
  double local_968;
  double dStack_960;
  double local_958;
  double dStack_950;
  double local_948;
  double dStack_940;
  double local_938;
  double dStack_930;
  double local_928;
  double dStack_920;
  double local_918;
  double dStack_910;
  double local_908;
  double dStack_900;
  double local_8f8;
  double dStack_8f0;
  double local_8e8;
  double dStack_8e0;
  double local_8d8;
  double dStack_8d0;
  double local_8c8;
  double dStack_8c0;
  double local_8b8;
  double dStack_8b0;
  double local_8a8;
  double dStack_8a0;
  double local_898;
  double dStack_890;
  double local_888;
  double dStack_880;
  double local_878;
  ulong uStack_870;
  double local_868;
  ulong uStack_860;
  double local_858;
  double dStack_850;
  double local_848;
  double dStack_840;
  double local_838;
  double dStack_830;
  double local_828;
  double dStack_820;
  double local_818;
  double dStack_810;
  double local_808;
  ulong uStack_800;
  double local_7f8;
  ulong uStack_7f0;
  double local_7e8;
  double dStack_7e0;
  double local_7d8;
  double dStack_7d0;
  double local_7c8;
  double dStack_7c0;
  double local_7b8;
  double dStack_7b0;
  double local_7a8;
  double dStack_7a0;
  double local_798;
  double dStack_790;
  double local_788;
  double dStack_780;
  double local_778;
  double dStack_770;
  double local_768;
  double dStack_760;
  double local_758;
  double dStack_750;
  double local_748;
  double dStack_740;
  double local_738;
  double dStack_730;
  double local_728;
  double dStack_720;
  double local_718;
  double dStack_710;
  double local_708;
  double dStack_700;
  double local_6f8;
  double dStack_6f0;
  double local_6e8;
  double dStack_6e0;
  double local_6d8;
  double dStack_6d0;
  double local_6c8;
  double dStack_6c0;
  double local_6b8;
  double dStack_6b0;
  double local_6a8;
  double dStack_6a0;
  double local_698;
  double dStack_690;
  double local_688;
  double dStack_680;
  double local_678;
  double dStack_670;
  double local_668;
  double dStack_660;
  double local_658;
  double dStack_650;
  double local_648;
  double dStack_640;
  double local_638;
  double dStack_630;
  double local_628;
  double dStack_620;
  double local_618;
  ulong uStack_610;
  double local_608;
  ulong uStack_600;
  double local_5f8;
  double dStack_5f0;
  double local_5e8;
  double dStack_5e0;
  double local_5d8;
  double dStack_5d0;
  double local_5c8;
  double dStack_5c0;
  double local_5b8;
  double dStack_5b0;
  double local_5a8;
  double dStack_5a0;
  double local_598;
  double dStack_590;
  double local_588;
  double dStack_580;
  double local_578;
  double dStack_570;
  double local_568;
  double dStack_560;
  double local_558;
  double dStack_550;
  Matrix<double,_3,_3,_0,_3,_3> local_548;
  double dStack_500;
  double local_4f8;
  double dStack_4f0;
  double local_4e8;
  double dStack_4e0;
  double local_4d8;
  double dStack_4d0;
  Matrix<double,_4,_4,_0,_4,_4> *local_4c8;
  Matrix<double,_3,_3,_0,_3,_3> *local_4c0;
  Matrix<double,_4,_4,_0,_4,_4> *local_4b8;
  double local_4b0;
  Matrix<double,_4,_4,_0,_4,_4> local_4a8;
  undefined1 local_428 [32];
  double local_408;
  double dStack_400;
  double local_3f8;
  double dStack_3f0;
  double local_3e8;
  double dStack_3e0;
  double local_3d8;
  double dStack_3d0;
  double local_3c8;
  double dStack_3c0;
  double local_3b8;
  double dStack_3b0;
  double local_3a8;
  double dStack_3a0;
  double local_398;
  double dStack_390;
  double local_388;
  double dStack_380;
  double local_378;
  double dStack_370;
  double local_368;
  double dStack_360;
  double local_358;
  double dStack_350;
  double local_348;
  double dStack_340;
  double local_338;
  double dStack_330;
  double local_328;
  double dStack_320;
  double local_318;
  double dStack_310;
  Matrix<double,_6,_6,_0,_6,_6> local_308;
  Matrix<double,_4,_4,_0,_4,_4> local_1e8;
  Matrix<double,_5,_1,_0,_5,_1> local_160;
  Matrix<double,_4,_4,_0,_4,_4> local_138;
  Matrix<double,_3,_1,_0,_3,_1> local_b8;
  Matrix<double,_3,_1,_0,_3,_1> local_98;
  Matrix<double,_4,_1,_0,_4,_1> local_78;
  Matrix<double,_4,_1,_0,_4,_1> local_58;
  
  bVar27 = 0;
  ppVar1 = (plPair->
           super__Vector_base<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::allocator<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  if (((plPair->
       super__Vector_base<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::allocator<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>_>
       )._M_impl.super__Vector_impl_data._M_finish == ppVar1) ||
     (ppVar2 = (lPair->
               super__Vector_base<std::pair<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>,_std::allocator<std::pair<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start,
     (ulong)((long)(lPair->
                   super__Vector_base<std::pair<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>,_std::allocator<std::pair<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_finish - (long)ppVar2) < 0x101)) {
    poVar18 = std::operator<<((ostream *)&std::cerr,
                              "Solver 3L1Q requires at least 1 plane, and 3 line pairs!");
    std::endl<char,std::char_traits<char>>(poVar18);
    exit(-1);
  }
  dVar113 = (ppVar1->first).super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.
            m_data.array[0];
  dVar149 = (ppVar1->first).super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.
            m_data.array[1];
  dVar150 = (ppVar1->first).super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.
            m_data.array[2];
  dVar112 = (ppVar1->first).super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.
            m_data.array[3];
  dVar111 = (ppVar1->second).super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.
            m_data.array[0];
  dVar38 = (ppVar1->second).super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.
           m_data.array[1];
  dVar50 = (ppVar1->second).super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.
           m_data.array[2];
  dVar138 = (ppVar1->second).super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.
            m_data.array[3];
  auVar169 = *(undefined1 (*) [16])
              ((long)&(ppVar2->first).first.
                      super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_> + 0x10);
  auVar114 = *(undefined1 (*) [16])
              ((long)&(ppVar2->first).second.
                      super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_> + 0x10);
  auVar115 = *(undefined1 (*) [16])
              ((long)&(ppVar2->second).first.
                      super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_> + 0x10);
  dVar28 = *(double *)
            ((long)&(ppVar2->second).second.
                    super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_> + 0x10);
  dVar140 = *(double *)
             ((long)&(ppVar2->second).second.
                     super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_> + 0x18);
  dVar232 = *(double *)
             ((long)&ppVar2[1].first.first.
                     super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_> + 0x18);
  auVar229._8_4_ = auVar169._8_4_;
  auVar229._0_8_ = auVar169._8_8_;
  auVar229._12_4_ = auVar169._12_4_;
  auVar229 = divpd(*(undefined1 (*) [16])
                    &(ppVar2->first).first.
                     super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,auVar229);
  dVar244 = auVar169._0_8_ / auVar169._8_8_;
  auVar169._8_4_ = auVar114._8_4_;
  auVar169._0_8_ = auVar114._8_8_;
  auVar169._12_4_ = auVar114._12_4_;
  auVar169 = divpd(*(undefined1 (*) [16])
                    &(ppVar2->first).second.
                     super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data,
                   auVar169);
  dVar170 = auVar114._0_8_ / auVar114._8_8_;
  dVar34 = auVar169._0_8_;
  dVar35 = auVar169._8_8_;
  dVar36 = auVar229._0_8_;
  dVar37 = auVar229._8_8_;
  local_428._8_8_ = local_a88;
  dVar157 = *(double *)
             ((long)&ppVar2[1].first.second.
                     super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_> + 0x18);
  auVar169 = *(undefined1 (*) [16])
              ((long)&ppVar2[1].second.first.
                      super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_> + 0x10);
  dVar30 = *(double *)
            ((long)&ppVar2[1].second.second.
                    super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_> + 0x10);
  dVar39 = *(double *)
            ((long)&ppVar2[1].second.second.
                    super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_> + 0x18);
  auVar114 = *(undefined1 (*) [16])
              ((long)&ppVar2[2].first.first.
                      super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_> + 0x10);
  dVar29 = *(double *)
            ((long)&ppVar2[2].first.second.
                    super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_> + 0x10);
  dVar32 = *(double *)
            ((long)&ppVar2[2].first.second.
                    super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_> + 0x18);
  auVar229 = *(undefined1 (*) [16])
              ((long)&ppVar2[2].second.first.
                      super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_> + 0x10);
  dVar31 = *(double *)
            ((long)&ppVar2[2].second.second.
                    super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_> + 0x10);
  dVar33 = *(double *)
            ((long)&ppVar2[2].second.second.
                    super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_> + 0x18);
  local_a88._8_4_ = SUB84(dVar35 - dVar37,0);
  local_a88._0_8_ = dVar34 - dVar36;
  local_a88._12_4_ = (int)((ulong)(dVar35 - dVar37) >> 0x20);
  dVar256 = auVar115._0_8_ / auVar115._8_8_;
  auVar151._8_4_ = auVar115._8_4_;
  auVar151._0_8_ = auVar115._8_8_;
  auVar151._12_4_ = auVar115._12_4_;
  auVar262 = divpd(*(undefined1 (*) [16])
                    &(ppVar2->second).first.
                     super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage,auVar151
                  );
  dVar257 = *(double *)
             ((long)&ppVar2[1].first.first.
                     super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_> + 0x10) / dVar232;
  auVar115._8_4_ = SUB84(dVar232,0);
  auVar115._0_8_ = dVar232;
  auVar115._12_4_ = (int)((ulong)dVar232 >> 0x20);
  auVar206 = divpd(*(undefined1 (*) [16])
                    &ppVar2[1].first.first.
                     super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,auVar115);
  dVar236 = auVar169._0_8_ / auVar169._8_8_;
  auVar152._8_4_ = auVar169._8_4_;
  auVar152._0_8_ = auVar169._8_8_;
  auVar152._12_4_ = auVar169._12_4_;
  auVar251 = divpd(*(undefined1 (*) [16])
                    &ppVar2[1].second.first.
                     super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage,auVar152
                  );
  dVar232 = auVar114._0_8_ / auVar114._8_8_;
  auVar218._8_4_ = auVar114._8_4_;
  auVar218._0_8_ = auVar114._8_8_;
  auVar218._12_4_ = auVar114._12_4_;
  auVar151 = divpd(*(undefined1 (*) [16])
                    &ppVar2[2].first.first.
                     super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,auVar218);
  dVar260 = auVar229._0_8_ / auVar229._8_8_;
  auVar114._8_4_ = auVar229._8_4_;
  auVar114._0_8_ = auVar229._8_8_;
  auVar114._12_4_ = auVar229._12_4_;
  auVar218 = divpd(*(undefined1 (*) [16])
                    &ppVar2[2].second.first.
                     super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage,auVar114
                  );
  local_a78._8_8_ = dVar35 * dVar244 - dVar37 * dVar170;
  local_a78._0_8_ = dVar170 - dVar244;
  auVar255._8_8_ = dVar157;
  auVar255._0_8_ = dVar157;
  auVar152 = divpd(*(undefined1 (*) [16])
                    &ppVar2[1].first.second.
                     super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data,
                   auVar255);
  dVar157 = *(double *)
             ((long)&ppVar2[1].first.second.
                     super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_> + 0x10) / dVar157;
  local_a68._8_8_ = dVar34 * dVar37 - dVar36 * dVar35;
  local_a68._0_8_ = dVar170 * dVar36 - dVar244 * dVar34;
  auVar153._8_8_ = dVar140;
  auVar153._0_8_ = dVar140;
  auVar169 = divpd(*(undefined1 (*) [16])
                    &(ppVar2->second).second.
                     super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data,
                   auVar153);
  auVar154._8_8_ = dVar39;
  auVar154._0_8_ = dVar39;
  auVar114 = divpd(*(undefined1 (*) [16])
                    &ppVar2[1].second.second.
                     super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data,
                   auVar154);
  auVar155._8_8_ = dVar32;
  auVar155._0_8_ = dVar32;
  auVar115 = divpd(*(undefined1 (*) [16])
                    &ppVar2[2].first.second.
                     super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data,
                   auVar155);
  auVar230._8_8_ = dVar33;
  auVar230._0_8_ = dVar33;
  auVar255 = divpd(*(undefined1 (*) [16])
                    &ppVar2[2].second.second.
                     super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data,
                   auVar230);
  local_308.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[1] =
       1.48219693752374e-323;
  local_308.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[4] =
       0.0;
  local_308.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[6] =
       2.96439387504748e-323;
  local_308.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[0] =
       (double)local_428._8_8_;
  local_308.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[3] =
       (double)local_428._8_8_;
  auVar116._0_8_ =
       Eigen::internal::
       redux_impl<Eigen::internal::scalar_sum_op<double,double>,Eigen::internal::redux_evaluator<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<double>,Eigen::Block<Eigen::Matrix<double,6,1,0,6,1>,-1,1,false>const>>,3,0>
       ::
       run<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<double>,Eigen::Block<Eigen::Matrix<double,6,1,0,6,1>,_1,1,false>const>>
                 ((redux_evaluator<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<double>,_const_Eigen::Block<Eigen::Matrix<double,_6,_1,_0,_6,_1>,__1,_1,_false>_>_>
                   *)local_428,(scalar_sum_op<double,_double> *)&local_da8,
                  (CwiseUnaryOp<Eigen::internal::scalar_abs2_op<double>,_const_Eigen::Block<Eigen::Matrix<double,_6,_1,_0,_6,_1>,__1,_1,_false>_>
                   *)&local_308);
  auVar116._8_8_ = 0;
  auVar229 = sqrtpd(auVar116,auVar116);
  auVar117._0_8_ = auVar229._0_8_;
  auVar117._8_8_ = auVar117._0_8_;
  local_a88 = divpd(local_a88,auVar117);
  local_a78 = divpd(local_a78,auVar117);
  local_a68 = divpd(local_a68,auVar117);
  local_2048 = auVar152._0_8_;
  uStack_2040 = auVar152._8_8_;
  local_1d68 = auVar206._0_8_;
  dStack_1d60 = auVar206._8_8_;
  local_428._8_8_ = local_ab8;
  local_ab8._8_8_ = uStack_2040 - dStack_1d60;
  local_ab8._0_8_ = local_2048 - local_1d68;
  dVar28 = dVar28 / dVar140;
  dVar29 = dVar29 / dVar32;
  local_aa8._8_8_ = uStack_2040 * dVar257 - dStack_1d60 * dVar157;
  local_aa8._0_8_ = dVar157 - dVar257;
  dVar30 = dVar30 / dVar39;
  local_a98._8_8_ = local_2048 * dStack_1d60 - local_1d68 * uStack_2040;
  local_a98._0_8_ = dVar157 * local_1d68 - dVar257 * local_2048;
  local_308.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[1] =
       1.48219693752374e-323;
  local_308.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[4] =
       0.0;
  local_308.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[6] =
       2.96439387504748e-323;
  local_308.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[0] =
       (double)local_428._8_8_;
  local_308.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[3] =
       (double)local_428._8_8_;
  auVar206._0_8_ =
       Eigen::internal::
       redux_impl<Eigen::internal::scalar_sum_op<double,double>,Eigen::internal::redux_evaluator<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<double>,Eigen::Block<Eigen::Matrix<double,6,1,0,6,1>,-1,1,false>const>>,3,0>
       ::
       run<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<double>,Eigen::Block<Eigen::Matrix<double,6,1,0,6,1>,_1,1,false>const>>
                 ((redux_evaluator<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<double>,_const_Eigen::Block<Eigen::Matrix<double,_6,_1,_0,_6,_1>,__1,_1,_false>_>_>
                   *)local_428,(scalar_sum_op<double,_double> *)&local_da8,
                  (CwiseUnaryOp<Eigen::internal::scalar_abs2_op<double>,_const_Eigen::Block<Eigen::Matrix<double,_6,_1,_0,_6,_1>,__1,_1,_false>_>
                   *)&local_308);
  auVar206._8_8_ = 0;
  auVar229 = sqrtpd(auVar206,auVar206);
  auVar118._0_8_ = auVar229._0_8_;
  auVar118._8_8_ = auVar118._0_8_;
  local_ab8 = divpd(local_ab8,auVar118);
  local_aa8 = divpd(local_aa8,auVar118);
  local_a98 = divpd(local_a98,auVar118);
  local_2098 = auVar115._0_8_;
  dStack_2090 = auVar115._8_8_;
  local_2018 = auVar151._0_8_;
  dStack_2010 = auVar151._8_8_;
  local_428._8_8_ = local_ae8;
  local_ae8._8_8_ = dStack_2090 - dStack_2010;
  local_ae8._0_8_ = local_2098 - local_2018;
  local_ad8._8_8_ = dStack_2090 * dVar232 - dStack_2010 * dVar29;
  local_ad8._0_8_ = dVar29 - dVar232;
  local_ac8._8_8_ = local_2098 * dStack_2010 - local_2018 * dStack_2090;
  local_ac8._0_8_ = dVar29 * local_2018 - dVar232 * local_2098;
  local_308.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[1] =
       1.48219693752374e-323;
  local_308.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[4] =
       0.0;
  local_308.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[6] =
       2.96439387504748e-323;
  local_308.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[0] =
       (double)local_428._8_8_;
  local_308.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[3] =
       (double)local_428._8_8_;
  auVar119._0_8_ =
       Eigen::internal::
       redux_impl<Eigen::internal::scalar_sum_op<double,double>,Eigen::internal::redux_evaluator<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<double>,Eigen::Block<Eigen::Matrix<double,6,1,0,6,1>,-1,1,false>const>>,3,0>
       ::
       run<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<double>,Eigen::Block<Eigen::Matrix<double,6,1,0,6,1>,_1,1,false>const>>
                 ((redux_evaluator<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<double>,_const_Eigen::Block<Eigen::Matrix<double,_6,_1,_0,_6,_1>,__1,_1,_false>_>_>
                   *)local_428,(scalar_sum_op<double,_double> *)&local_da8,
                  (CwiseUnaryOp<Eigen::internal::scalar_abs2_op<double>,_const_Eigen::Block<Eigen::Matrix<double,_6,_1,_0,_6,_1>,__1,_1,_false>_>
                   *)&local_308);
  auVar119._8_8_ = 0;
  auVar115 = sqrtpd(auVar119,auVar119);
  auVar120._0_8_ = auVar115._0_8_;
  auVar120._8_8_ = auVar120._0_8_;
  local_ae8 = divpd(local_ae8,auVar120);
  local_ad8 = divpd(local_ad8,auVar120);
  local_ac8 = divpd(local_ac8,auVar120);
  local_1fa8 = auVar169._0_8_;
  dStack_1fa0 = auVar169._8_8_;
  local_20d8 = auVar262._0_8_;
  dStack_20d0 = auVar262._8_8_;
  local_428._8_8_ = local_b18;
  local_b18._8_8_ = dStack_1fa0 - dStack_20d0;
  local_b18._0_8_ = local_1fa8 - local_20d8;
  local_b08._8_8_ = dStack_1fa0 * dVar256 - dStack_20d0 * dVar28;
  local_b08._0_8_ = dVar28 - dVar256;
  local_af8._8_8_ = local_1fa8 * dStack_20d0 - local_20d8 * dStack_1fa0;
  local_af8._0_8_ = dVar28 * local_20d8 - dVar256 * local_1fa8;
  local_308.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[1] =
       1.48219693752374e-323;
  local_308.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[4] =
       0.0;
  local_308.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[6] =
       2.96439387504748e-323;
  local_308.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[0] =
       (double)local_428._8_8_;
  local_308.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[3] =
       (double)local_428._8_8_;
  auVar262._0_8_ =
       Eigen::internal::
       redux_impl<Eigen::internal::scalar_sum_op<double,double>,Eigen::internal::redux_evaluator<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<double>,Eigen::Block<Eigen::Matrix<double,6,1,0,6,1>,-1,1,false>const>>,3,0>
       ::
       run<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<double>,Eigen::Block<Eigen::Matrix<double,6,1,0,6,1>,_1,1,false>const>>
                 ((redux_evaluator<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<double>,_const_Eigen::Block<Eigen::Matrix<double,_6,_1,_0,_6,_1>,__1,_1,_false>_>_>
                   *)local_428,(scalar_sum_op<double,_double> *)&local_da8,
                  (CwiseUnaryOp<Eigen::internal::scalar_abs2_op<double>,_const_Eigen::Block<Eigen::Matrix<double,_6,_1,_0,_6,_1>,__1,_1,_false>_>
                   *)&local_308);
  auVar262._8_8_ = 0;
  auVar169 = sqrtpd(auVar262,auVar262);
  auVar121._0_8_ = auVar169._0_8_;
  auVar121._8_8_ = auVar121._0_8_;
  local_b18 = divpd(local_b18,auVar121);
  local_b08 = divpd(local_b08,auVar121);
  local_af8 = divpd(local_af8,auVar121);
  local_1fb8 = auVar114._0_8_;
  dStack_1fb0 = auVar114._8_8_;
  local_20e8 = auVar251._0_8_;
  dStack_20e0 = auVar251._8_8_;
  local_428._8_8_ = local_b48;
  local_b48._8_8_ = dStack_1fb0 - dStack_20e0;
  local_b48._0_8_ = local_1fb8 - local_20e8;
  local_b38._8_8_ = dStack_1fb0 * dVar236 - dStack_20e0 * dVar30;
  local_b38._0_8_ = dVar30 - dVar236;
  dVar31 = dVar31 / dVar33;
  local_b28._8_8_ = local_1fb8 * dStack_20e0 - local_20e8 * dStack_1fb0;
  local_b28._0_8_ = dVar30 * local_20e8 - dVar236 * local_1fb8;
  local_308.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[1] =
       1.48219693752374e-323;
  local_308.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[4] =
       0.0;
  local_308.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[6] =
       2.96439387504748e-323;
  local_308.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[0] =
       (double)local_428._8_8_;
  local_308.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[3] =
       (double)local_428._8_8_;
  auVar251._0_8_ =
       Eigen::internal::
       redux_impl<Eigen::internal::scalar_sum_op<double,double>,Eigen::internal::redux_evaluator<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<double>,Eigen::Block<Eigen::Matrix<double,6,1,0,6,1>,-1,1,false>const>>,3,0>
       ::
       run<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<double>,Eigen::Block<Eigen::Matrix<double,6,1,0,6,1>,_1,1,false>const>>
                 ((redux_evaluator<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<double>,_const_Eigen::Block<Eigen::Matrix<double,_6,_1,_0,_6,_1>,__1,_1,_false>_>_>
                   *)local_428,(scalar_sum_op<double,_double> *)&local_da8,
                  (CwiseUnaryOp<Eigen::internal::scalar_abs2_op<double>,_const_Eigen::Block<Eigen::Matrix<double,_6,_1,_0,_6,_1>,__1,_1,_false>_>
                   *)&local_308);
  auVar251._8_8_ = 0;
  auVar169 = sqrtpd(auVar251,auVar251);
  auVar122._0_8_ = auVar169._0_8_;
  auVar122._8_8_ = auVar122._0_8_;
  local_b48 = divpd(local_b48,auVar122);
  local_b38 = divpd(local_b38,auVar122);
  local_b28 = divpd(local_b28,auVar122);
  local_2078 = auVar255._0_8_;
  dStack_2070 = auVar255._8_8_;
  local_1b98 = auVar218._0_8_;
  dStack_1b90 = auVar218._8_8_;
  local_428._8_8_ = local_b78;
  local_b78._8_8_ = dStack_2070 - dStack_1b90;
  local_b78._0_8_ = local_2078 - local_1b98;
  local_b68._8_8_ = dStack_2070 * dVar260 - dStack_1b90 * dVar31;
  local_b68._0_8_ = dVar31 - dVar260;
  local_b58._8_8_ = local_2078 * dStack_1b90 - local_1b98 * dStack_2070;
  local_b58._0_8_ = dVar31 * local_1b98 - dVar260 * local_2078;
  local_308.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[1] =
       1.48219693752374e-323;
  local_308.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[4] =
       0.0;
  local_308.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[6] =
       2.96439387504748e-323;
  local_308.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[0] =
       (double)local_428._8_8_;
  local_308.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[3] =
       (double)local_428._8_8_;
  auVar123._0_8_ =
       Eigen::internal::
       redux_impl<Eigen::internal::scalar_sum_op<double,double>,Eigen::internal::redux_evaluator<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<double>,Eigen::Block<Eigen::Matrix<double,6,1,0,6,1>,-1,1,false>const>>,3,0>
       ::
       run<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<double>,Eigen::Block<Eigen::Matrix<double,6,1,0,6,1>,_1,1,false>const>>
                 ((redux_evaluator<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<double>,_const_Eigen::Block<Eigen::Matrix<double,_6,_1,_0,_6,_1>,__1,_1,_false>_>_>
                   *)local_428,(scalar_sum_op<double,_double> *)&local_da8,
                  (CwiseUnaryOp<Eigen::internal::scalar_abs2_op<double>,_const_Eigen::Block<Eigen::Matrix<double,_6,_1,_0,_6,_1>,__1,_1,_false>_>
                   *)&local_308);
  auVar123._8_8_ = 0;
  auVar169 = sqrtpd(auVar123,auVar123);
  auVar124._0_8_ = auVar169._0_8_;
  auVar124._8_8_ = auVar124._0_8_;
  local_b78 = divpd(local_b78,auVar124);
  local_b68 = divpd(local_b68,auVar124);
  local_b58 = divpd(local_b58,auVar124);
  local_78.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data.array[0] =
       dVar111;
  local_78.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data.array[1] =
       dVar38;
  local_78.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data.array[2] =
       dVar50;
  local_78.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data.array[3] =
       dVar138;
  local_58.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data.array[0] =
       dVar113;
  local_58.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data.array[1] =
       dVar149;
  local_58.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data.array[2] =
       dVar150;
  local_58.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data.array[3] =
       dVar112;
  getPredefinedTransformations1Plane3Line<double>(&local_d00,&local_58,&local_78,false);
  lVar22 = 0x10;
  pMVar23 = local_d00.
            super__Vector_base<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>_>
            ._M_impl.super__Vector_impl_data._M_finish + -1;
  pMVar24 = &local_138;
  for (lVar19 = 0x10; lVar19 != 0; lVar19 = lVar19 + -1) {
    (pMVar24->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.array
    [0] = (pMVar23->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.
          array[0];
    pMVar23 = (pointer)((long)pMVar23 + ((ulong)bVar27 * -2 + 1) * 8);
    pMVar24 = (Matrix<double,_4,_4,_0,_4,_4> *)((long)pMVar24 + ((ulong)bVar27 * -2 + 1) * 8);
  }
  local_d00.
  super__Vector_base<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>_>
  ._M_impl.super__Vector_impl_data._M_finish =
       local_d00.
       super__Vector_base<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>_>
       ._M_impl.super__Vector_impl_data._M_finish + -2;
  pMVar23 = local_d00.
            super__Vector_base<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  pMVar24 = &local_4a8;
  for (lVar19 = 0x10; lVar19 != 0; lVar19 = lVar19 + -1) {
    (pMVar24->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.array
    [0] = (pMVar23->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.
          array[0];
    pMVar23 = (pointer)((long)pMVar23 + ((ulong)bVar27 * -2 + 1) * 8);
    pMVar24 = (Matrix<double,_4,_4,_0,_4,_4> *)((long)pMVar24 + ((ulong)bVar27 * -2 + 1) * 8);
  }
  memset(&local_308,0,0x120);
  pdVar16 = local_308.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.
            array + 2;
  do {
    dVar113 = *(double *)
               ((long)&local_4a8.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.
                       m_storage.m_data + lVar22 + -8);
    ((plain_array<double,_36,_0,_16> *)(pdVar16 + -2))->array[0] =
         *(double *)((long)&local_4b8 + lVar22);
    pdVar16[-1] = dVar113;
    *pdVar16 = *(double *)
                ((long)&local_4a8.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.
                        m_storage.m_data + lVar22);
    lVar22 = lVar22 + 0x20;
    pdVar16 = pdVar16 + 6;
  } while (lVar22 != 0x70);
  lVar19 = 8;
  pdVar16 = local_308.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.
            array + 0x16;
  do {
    pdVar16[-1] = *(double *)
                   ((long)&local_4a8.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.
                           m_storage.m_data + lVar19 + -8);
    dVar113 = *(double *)
               ((long)&local_4a8.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.
                       m_storage.m_data + lVar19 + 8);
    *pdVar16 = *(double *)
                ((long)&local_4a8.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.
                        m_storage.m_data + lVar19);
    pdVar16[1] = dVar113;
    pdVar16 = pdVar16 + 6;
    lVar19 = lVar19 + 0x20;
  } while (lVar19 != 0x68);
  local_98.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[0] =
       local_4a8.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array
       [0xc];
  local_98.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[1] =
       local_4a8.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array
       [0xd];
  local_98.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[2] =
       local_4a8.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array
       [0xe];
  getSkew<double>(&local_548,&local_98);
  local_1e8.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[0] =
       (double)(local_308.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.
                m_data.array + 3);
  local_da8.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[9] =
       0.0;
  local_da8.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[10]
       = 0.0;
  local_da8.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[2] =
       -1.0;
  local_da8.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[5] =
       (double)&local_4a8;
  local_da8.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[6] =
       1.48219693752374e-323;
  local_da8.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[7] =
       1.48219693752374e-323;
  local_da8.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[0xb]
       = 1.97626258336499e-323;
  local_1e8.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[1] =
       1.48219693752374e-323;
  local_1e8.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[2] =
       1.48219693752374e-323;
  local_1e8.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[4] =
       1.48219693752374e-323;
  local_1e8.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[5] =
       0.0;
  local_1e8.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[6] =
       2.96439387504748e-323;
  local_da8.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[3] =
       (double)&local_548;
  local_da8.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[8] =
       local_da8.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array
       [5];
  local_1e8.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[3] =
       (double)&local_308;
  Eigen::internal::
  call_assignment<Eigen::Block<Eigen::Matrix<double,6,6,0,6,6>,_1,_1,false>,Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,3,0,3,3>const>const,Eigen::Matrix<double,3,3,0,3,3>const>,Eigen::Block<Eigen::Matrix<double,4,4,0,4,4>,_1,_1,false>,0>,Eigen::internal::assign_op<double,double>>
            ((Block<Eigen::Matrix<double,_6,_6,_0,_6,_6>,__1,__1,_false> *)&local_1e8,
             (Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false>,_0>
              *)&local_da8,(assign_op<double,_double> *)&local_160,(type)0x0);
  memset((Matrix<double,_3,_3,_0,_3,_3> *)local_428,0,0x120);
  lVar19 = 0x10;
  puVar20 = (undefined8 *)(local_428 + 0x10);
  do {
    uVar14 = *(undefined8 *)
              ((long)local_160.super_PlainObjectBase<Eigen::Matrix<double,_5,_1,_0,_5,_1>_>.
                     m_storage.m_data.array + lVar19 + 0x20);
    puVar20[-2] = *(undefined8 *)
                   ((long)local_160.super_PlainObjectBase<Eigen::Matrix<double,_5,_1,_0,_5,_1>_>.
                          m_storage.m_data.array + lVar19 + 0x18);
    puVar20[-1] = uVar14;
    *puVar20 = *(undefined8 *)
                ((long)local_138.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.
                       m_storage.m_data.array + lVar19);
    lVar19 = lVar19 + 0x20;
    puVar20 = puVar20 + 6;
  } while (lVar19 != 0x70);
  lVar19 = 8;
  puVar20 = (undefined8 *)(local_428 + 0xb0);
  do {
    puVar20[-1] = *(undefined8 *)
                   ((long)local_160.super_PlainObjectBase<Eigen::Matrix<double,_5,_1,_0,_5,_1>_>.
                          m_storage.m_data.array + lVar19 + 0x20);
    uVar14 = *(undefined8 *)
              ((long)local_138.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.
                     m_storage.m_data.array + lVar19 + 8);
    *puVar20 = *(undefined8 *)
                ((long)local_138.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.
                       m_storage.m_data.array + lVar19);
    puVar20[1] = uVar14;
    puVar20 = puVar20 + 6;
    lVar19 = lVar19 + 0x20;
  } while (lVar19 != 0x68);
  local_b8.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[0] =
       local_138.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array
       [0xc];
  local_b8.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[1] =
       local_138.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array
       [0xd];
  local_b8.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[2] =
       local_138.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array
       [0xe];
  getSkew<double>(&local_548,&local_b8);
  local_1e8.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[0] =
       (double)(local_428 + 0x18);
  local_da8.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[9] =
       0.0;
  local_da8.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[10]
       = 0.0;
  local_da8.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[2] =
       -1.0;
  local_da8.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[5] =
       (double)&local_138;
  local_da8.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[6] =
       1.48219693752374e-323;
  local_da8.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[7] =
       1.48219693752374e-323;
  local_da8.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[0xb]
       = 1.97626258336499e-323;
  local_1e8.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[1] =
       1.48219693752374e-323;
  local_1e8.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[2] =
       1.48219693752374e-323;
  local_1e8.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[4] =
       1.48219693752374e-323;
  local_1e8.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[5] =
       0.0;
  local_1e8.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[6] =
       2.96439387504748e-323;
  local_da8.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[3] =
       (double)&local_548;
  local_da8.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[8] =
       local_da8.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array
       [5];
  local_1e8.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[3] =
       (double)local_428;
  Eigen::internal::
  call_assignment<Eigen::Block<Eigen::Matrix<double,6,6,0,6,6>,_1,_1,false>,Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,3,0,3,3>const>const,Eigen::Matrix<double,3,3,0,3,3>const>,Eigen::Block<Eigen::Matrix<double,4,4,0,4,4>,_1,_1,false>,0>,Eigen::internal::assign_op<double,double>>
            ((Block<Eigen::Matrix<double,_6,_6,_0,_6,_6>,__1,__1,_false> *)&local_1e8,
             (Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false>,_0>
              *)&local_da8,(assign_op<double,_double> *)&local_160,(type)0x0);
  dVar179 = local_308.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.
            array[0x1e] * (double)local_a68._8_8_ +
            local_308.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.
            array[0x18] * (double)local_a68._0_8_ +
            local_308.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.
            array[0x12] * (double)local_a78._8_8_ +
            local_308.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.
            array[0xc] * (double)local_a78._0_8_ +
            local_308.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.
            array[6] * (double)local_a88._8_8_ +
            local_308.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.
            array[0] * (double)local_a88._0_8_;
  dVar207 = local_308.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.
            array[0x1f] * (double)local_a68._8_8_ +
            local_308.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.
            array[0x19] * (double)local_a68._0_8_ +
            local_308.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.
            array[0x13] * (double)local_a78._8_8_ +
            local_308.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.
            array[0xd] * (double)local_a78._0_8_ +
            local_308.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.
            array[7] * (double)local_a88._8_8_ +
            local_308.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.
            array[1] * (double)local_a88._0_8_;
  dVar211 = (double)local_a68._8_8_ *
            local_308.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.
            array[0x20] +
            (double)local_a68._0_8_ *
            local_308.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.
            array[0x1a] +
            (double)local_a78._8_8_ *
            local_308.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.
            array[0x14] +
            (double)local_a78._0_8_ *
            local_308.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.
            array[0xe] +
            (double)local_a88._8_8_ *
            local_308.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.
            array[8] +
            (double)local_a88._0_8_ *
            local_308.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.
            array[2];
  dVar219 = (double)local_a68._8_8_ *
            local_308.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.
            array[0x21] +
            (double)local_a68._0_8_ *
            local_308.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.
            array[0x1b] +
            (double)local_a78._8_8_ *
            local_308.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.
            array[0x15] +
            (double)local_a78._0_8_ *
            local_308.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.
            array[0xf] +
            (double)local_a88._8_8_ *
            local_308.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.
            array[9] +
            (double)local_a88._0_8_ *
            local_308.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.
            array[3];
  dVar220 = (double)local_a68._8_8_ *
            local_308.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.
            array[0x22] +
            (double)local_a68._0_8_ *
            local_308.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.
            array[0x1c] +
            (double)local_a78._8_8_ *
            local_308.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.
            array[0x16] +
            (double)local_a78._0_8_ *
            local_308.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.
            array[0x10] +
            (double)local_a88._8_8_ *
            local_308.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.
            array[10] +
            (double)local_a88._0_8_ *
            local_308.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.
            array[4];
  dStack_1740 = (double)local_a68._8_8_ *
                local_308.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.
                m_data.array[0x23] +
                (double)local_a68._0_8_ *
                local_308.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.
                m_data.array[0x1d] +
                (double)local_a78._8_8_ *
                local_308.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.
                m_data.array[0x17] +
                (double)local_a78._0_8_ *
                local_308.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.
                m_data.array[0x11] +
                (double)local_a88._8_8_ *
                local_308.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.
                m_data.array[0xb] +
                (double)local_a88._0_8_ *
                local_308.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.
                m_data.array[5];
  uStack_1e64 = (undefined4)((ulong)dVar220 >> 0x20);
  uStack_1e60 = SUB84(dStack_1740,0);
  uStack_1e5c = (uint)((ulong)dStack_1740 >> 0x20);
  dVar32 = local_338 * (double)local_af8._8_8_ +
           local_368 * (double)local_af8._0_8_ +
           local_398 * (double)local_b08._8_8_ +
           local_3c8 * (double)local_b08._0_8_ +
           local_3f8 * (double)local_b18._8_8_ + (double)local_428._0_8_ * (double)local_b18._0_8_;
  dVar127 = dStack_330 * (double)local_af8._8_8_ +
            dStack_360 * (double)local_af8._0_8_ +
            dStack_390 * (double)local_b08._8_8_ +
            dStack_3c0 * (double)local_b08._0_8_ +
            dStack_3f0 * (double)local_b18._8_8_ + (double)local_428._8_8_ * (double)local_b18._0_8_
  ;
  dVar130 = (double)local_af8._8_8_ * local_328 +
            (double)local_af8._0_8_ * local_358 +
            (double)local_b08._8_8_ * local_388 +
            (double)local_b08._0_8_ * local_3b8 +
            (double)local_b18._8_8_ * local_3e8 + (double)local_b18._0_8_ * (double)local_428._16_8_
  ;
  dVar156 = (double)local_af8._8_8_ * dStack_320 +
            (double)local_af8._0_8_ * dStack_350 +
            (double)local_b08._8_8_ * dStack_380 +
            (double)local_b08._0_8_ * dStack_3b0 +
            (double)local_b18._8_8_ * dStack_3e0 +
            (double)local_b18._0_8_ * (double)local_428._24_8_;
  dVar237 = (double)local_af8._8_8_ * local_318 +
            (double)local_af8._0_8_ * local_348 +
            (double)local_b08._8_8_ * local_378 +
            (double)local_b08._0_8_ * local_3a8 +
            (double)local_b18._8_8_ * local_3d8 + (double)local_b18._0_8_ * local_408;
  dStack_c30 = (double)local_af8._8_8_ * dStack_310 +
               (double)local_af8._0_8_ * dStack_340 +
               (double)local_b08._8_8_ * dStack_370 +
               (double)local_b08._0_8_ * dStack_3a0 +
               (double)local_b18._8_8_ * dStack_3d0 + (double)local_b18._0_8_ * dStack_400;
  dVar180 = local_308.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.
            array[0x1e] * (double)local_a98._8_8_ +
            local_308.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.
            array[0x18] * (double)local_a98._0_8_ +
            local_308.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.
            array[0x12] * (double)local_aa8._8_8_ +
            local_308.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.
            array[0xc] * (double)local_aa8._0_8_ +
            local_308.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.
            array[6] * (double)local_ab8._8_8_ +
            local_308.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.
            array[0] * (double)local_ab8._0_8_;
  dVar208 = local_308.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.
            array[0x1f] * (double)local_a98._8_8_ +
            local_308.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.
            array[0x19] * (double)local_a98._0_8_ +
            local_308.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.
            array[0x13] * (double)local_aa8._8_8_ +
            local_308.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.
            array[0xd] * (double)local_aa8._0_8_ +
            local_308.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.
            array[7] * (double)local_ab8._8_8_ +
            local_308.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.
            array[1] * (double)local_ab8._0_8_;
  local_1678 = local_308.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.
               m_data.array[0x20] * (double)local_a98._8_8_ +
               local_308.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.
               m_data.array[0x1a] * (double)local_a98._0_8_ +
               local_308.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.
               m_data.array[0x14] * (double)local_aa8._8_8_ +
               local_308.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.
               m_data.array[0xe] * (double)local_aa8._0_8_ +
               local_308.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.
               m_data.array[8] * (double)local_ab8._8_8_ +
               local_308.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.
               m_data.array[2] * (double)local_ab8._0_8_;
  dVar209 = local_308.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.
            array[0x21] * (double)local_a98._8_8_ +
            local_308.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.
            array[0x1b] * (double)local_a98._0_8_ +
            local_308.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.
            array[0x15] * (double)local_aa8._8_8_ +
            local_308.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.
            array[0xf] * (double)local_aa8._0_8_ +
            local_308.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.
            array[9] * (double)local_ab8._8_8_ +
            local_308.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.
            array[3] * (double)local_ab8._0_8_;
  dVar238 = (double)local_a98._8_8_ *
            local_308.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.
            array[0x22] +
            (double)local_a98._0_8_ *
            local_308.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.
            array[0x1c] +
            (double)local_aa8._8_8_ *
            local_308.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.
            array[0x16] +
            (double)local_aa8._0_8_ *
            local_308.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.
            array[0x10] +
            (double)local_ab8._8_8_ *
            local_308.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.
            array[10] +
            (double)local_ab8._0_8_ *
            local_308.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.
            array[4];
  dVar242 = (double)local_a98._8_8_ *
            local_308.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.
            array[0x23] +
            (double)local_a98._0_8_ *
            local_308.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.
            array[0x1d] +
            (double)local_aa8._8_8_ *
            local_308.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.
            array[0x17] +
            (double)local_aa8._0_8_ *
            local_308.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.
            array[0x11] +
            (double)local_ab8._8_8_ *
            local_308.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.
            array[0xb] +
            (double)local_ab8._0_8_ *
            local_308.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.
            array[5];
  dVar221 = local_338 * (double)local_b28._8_8_ +
            local_368 * (double)local_b28._0_8_ +
            local_398 * (double)local_b38._8_8_ +
            local_3c8 * (double)local_b38._0_8_ +
            local_3f8 * (double)local_b48._8_8_ + (double)local_428._0_8_ * (double)local_b48._0_8_;
  dVar231 = dStack_330 * (double)local_b28._8_8_ +
            dStack_360 * (double)local_b28._0_8_ +
            dStack_390 * (double)local_b38._8_8_ +
            dStack_3c0 * (double)local_b38._0_8_ +
            dStack_3f0 * (double)local_b48._8_8_ + (double)local_428._8_8_ * (double)local_b48._0_8_
  ;
  local_1688 = local_328 * (double)local_b28._8_8_ +
               local_358 * (double)local_b28._0_8_ +
               local_388 * (double)local_b38._8_8_ +
               local_3b8 * (double)local_b38._0_8_ +
               local_3e8 * (double)local_b48._8_8_ +
               (double)local_428._16_8_ * (double)local_b48._0_8_;
  dVar210 = dStack_320 * (double)local_b28._8_8_ +
            dStack_350 * (double)local_b28._0_8_ +
            dStack_380 * (double)local_b38._8_8_ +
            dStack_3b0 * (double)local_b38._0_8_ +
            dStack_3e0 * (double)local_b48._8_8_ +
            (double)local_428._24_8_ * (double)local_b48._0_8_;
  dVar239 = (double)local_b28._8_8_ * local_318 +
            (double)local_b28._0_8_ * local_348 +
            (double)local_b38._8_8_ * local_378 +
            (double)local_b38._0_8_ * local_3a8 +
            (double)local_b48._8_8_ * local_3d8 + (double)local_b48._0_8_ * local_408;
  dVar243 = (double)local_b28._8_8_ * dStack_310 +
            (double)local_b28._0_8_ * dStack_340 +
            (double)local_b38._8_8_ * dStack_370 +
            (double)local_b38._0_8_ * dStack_3a0 +
            (double)local_b48._8_8_ * dStack_3d0 + (double)local_b48._0_8_ * dStack_400;
  dVar222 = local_308.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.
            array[0x1e] * (double)local_ac8._8_8_ +
            local_308.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.
            array[0x18] * (double)local_ac8._0_8_ +
            local_308.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.
            array[0x12] * (double)local_ad8._8_8_ +
            local_308.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.
            array[0xc] * (double)local_ad8._0_8_ +
            local_308.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.
            array[6] * (double)local_ae8._8_8_ +
            local_308.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.
            array[0] * (double)local_ae8._0_8_;
  dStack_1230 = local_308.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.
                m_data.array[0x1f] * (double)local_ac8._8_8_ +
                local_308.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.
                m_data.array[0x19] * (double)local_ac8._0_8_ +
                local_308.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.
                m_data.array[0x13] * (double)local_ad8._8_8_ +
                local_308.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.
                m_data.array[0xd] * (double)local_ad8._0_8_ +
                local_308.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.
                m_data.array[7] * (double)local_ae8._8_8_ +
                local_308.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.
                m_data.array[1] * (double)local_ae8._0_8_;
  dVar223 = local_308.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.
            array[0x20] * (double)local_ac8._8_8_ +
            local_308.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.
            array[0x1a] * (double)local_ac8._0_8_ +
            local_308.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.
            array[0x14] * (double)local_ad8._8_8_ +
            local_308.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.
            array[0xe] * (double)local_ad8._0_8_ +
            local_308.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.
            array[8] * (double)local_ae8._8_8_ +
            local_308.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.
            array[2] * (double)local_ae8._0_8_;
  dStack_1320 = local_308.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.
                m_data.array[0x21] * (double)local_ac8._8_8_ +
                local_308.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.
                m_data.array[0x1b] * (double)local_ac8._0_8_ +
                local_308.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.
                m_data.array[0x15] * (double)local_ad8._8_8_ +
                local_308.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.
                m_data.array[0xf] * (double)local_ad8._0_8_ +
                local_308.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.
                m_data.array[9] * (double)local_ae8._8_8_ +
                local_308.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.
                m_data.array[3] * (double)local_ae8._0_8_;
  dVar181 = (double)local_ac8._8_8_ *
            local_308.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.
            array[0x22] +
            (double)local_ac8._0_8_ *
            local_308.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.
            array[0x1c] +
            (double)local_ad8._8_8_ *
            local_308.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.
            array[0x16] +
            (double)local_ad8._0_8_ *
            local_308.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.
            array[0x10] +
            (double)local_ae8._8_8_ *
            local_308.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.
            array[10] +
            (double)local_ae8._0_8_ *
            local_308.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.
            array[4];
  dStack_1360 = (double)local_ac8._8_8_ *
                local_308.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.
                m_data.array[0x23] +
                (double)local_ac8._0_8_ *
                local_308.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.
                m_data.array[0x1d] +
                (double)local_ad8._8_8_ *
                local_308.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.
                m_data.array[0x17] +
                (double)local_ad8._0_8_ *
                local_308.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.
                m_data.array[0x11] +
                (double)local_ae8._8_8_ *
                local_308.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.
                m_data.array[0xb] +
                (double)local_ae8._0_8_ *
                local_308.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.
                m_data.array[5];
  local_1788 = local_338 * (double)local_b58._8_8_ +
               local_368 * (double)local_b58._0_8_ +
               local_398 * (double)local_b68._8_8_ +
               local_3c8 * (double)local_b68._0_8_ +
               local_3f8 * (double)local_b78._8_8_ +
               (double)local_428._0_8_ * (double)local_b78._0_8_;
  dStack_1780 = dStack_330 * (double)local_b58._8_8_ +
                dStack_360 * (double)local_b58._0_8_ +
                dStack_390 * (double)local_b68._8_8_ +
                dStack_3c0 * (double)local_b68._0_8_ +
                dStack_3f0 * (double)local_b78._8_8_ +
                (double)local_428._8_8_ * (double)local_b78._0_8_;
  dVar233 = local_328 * (double)local_b58._8_8_ +
            local_358 * (double)local_b58._0_8_ +
            local_388 * (double)local_b68._8_8_ +
            local_3b8 * (double)local_b68._0_8_ +
            local_3e8 * (double)local_b78._8_8_ + (double)local_428._16_8_ * (double)local_b78._0_8_
  ;
  local_9b8 = dStack_320 * (double)local_b58._8_8_ +
              dStack_350 * (double)local_b58._0_8_ +
              dStack_380 * (double)local_b68._8_8_ +
              dStack_3b0 * (double)local_b68._0_8_ +
              dStack_3e0 * (double)local_b78._8_8_ +
              (double)local_428._24_8_ * (double)local_b78._0_8_;
  local_ec8 = (double)local_b58._8_8_ * local_318 +
              (double)local_b58._0_8_ * local_348 +
              (double)local_b68._8_8_ * local_378 +
              (double)local_b68._0_8_ * local_3a8 +
              (double)local_b78._8_8_ * local_3d8 + (double)local_b78._0_8_ * local_408;
  dStack_ec0 = (double)local_b58._8_8_ * dStack_310 +
               (double)local_b58._0_8_ * dStack_340 +
               (double)local_b68._8_8_ * dStack_370 +
               (double)local_b68._0_8_ * dStack_3a0 +
               (double)local_b78._8_8_ * dStack_3d0 + (double)local_b78._0_8_ * dStack_400;
  uVar174 = SUB84(dVar156,0);
  uVar176 = (undefined4)((ulong)dVar156 >> 0x20);
  dVar131 = dVar179 * 4.0;
  dVar31 = dVar131 * dVar180 * dVar223;
  dVar224 = dVar179 + dVar179;
  dVar171 = dVar224 * dVar180 * dVar223;
  auVar3._8_4_ = uVar174;
  auVar3._0_8_ = dVar156;
  auVar3._12_4_ = uVar176;
  dVar158 = dVar156 * dVar171 * local_1688;
  dVar132 = dVar210 * dVar130 * dVar171;
  local_578 = dVar131 * dVar208 * dVar223;
  dVar159 = dVar224 * dVar208;
  dVar160 = dVar159 * dVar223;
  dVar33 = dVar156 * dVar160 * local_1688;
  dVar161 = dVar131 * local_1678;
  auVar12._4_8_ = dVar156;
  auVar12._0_4_ = uStack_1e64;
  auVar125._0_8_ = auVar12._0_8_ << 0x20;
  auVar125._8_4_ = uStack_1e60;
  auVar125._12_4_ = uStack_1e5c;
  dVar128 = auVar125._8_8_;
  dVar34 = dVar179 * dVar180 * dVar223;
  dVar35 = dVar179 * dVar208;
  dVar170 = dVar179 * local_1678;
  dVar36 = dVar207 * dVar180;
  dVar162 = dVar207 * local_1678;
  dStack_10b0 = -dVar207;
  dVar37 = dVar211 * dVar180;
  dVar236 = dVar37 * dVar223;
  dVar38 = dVar211 * dVar208;
  local_1878 = dVar211 * local_1678;
  dStack_1870 = dVar219 * dVar209;
  dVar244 = dVar211 * dVar209;
  dStack_ea0 = -dVar219;
  dVar39 = dVar219 * local_1678;
  dVar29 = dVar207 * dVar208 * dVar223;
  dStack_1040 = -dVar207;
  dVar256 = dVar38 * dVar223;
  dVar257 = dVar211 * dVar238;
  auVar15._8_4_ = uStack_1e60;
  auVar15._0_8_ = dVar220;
  auVar15._12_4_ = uStack_1e5c;
  uStack_1090 = auVar15._8_8_;
  dVar113 = -(dVar220 * dVar180) * dVar223;
  auVar4._8_4_ = uStack_1e60;
  auVar4._0_8_ = dVar113;
  auVar4._12_4_ = uStack_1e5c ^ 0x80000000;
  dVar260 = dVar220 * local_1678;
  dVar40 = local_1878 * dVar223;
  local_1658 = dVar211 * dVar242;
  local_1698 = dVar128 * local_1678;
  dVar41 = dVar224 * local_1678;
  dVar234 = dVar211 + dVar211;
  dVar212 = dVar234 * dVar180;
  dVar163 = dVar234 * dVar209;
  dVar246 = dVar219 + dVar219;
  dVar42 = dVar246 * dVar180 * dVar223;
  dVar133 = dVar246 * local_1678;
  dVar149 = dVar207 + dVar207;
  dVar43 = dVar149 * dVar180;
  dVar44 = dVar43 * dVar223;
  dVar45 = dVar149 * dVar208 * dVar223;
  dVar46 = dVar149 * local_1678;
  dVar213 = dVar212 * dVar223;
  dVar47 = dVar234 * dVar208;
  local_b88 = dVar47 * dVar223;
  dVar48 = dVar234 * local_1678;
  dVar49 = dVar234 * dVar238;
  dVar247 = dVar246 * dVar208 * dVar223;
  dVar50 = dVar220 + dVar220;
  dVar134 = dVar50 * dVar180 * dVar223;
  dVar135 = dVar50 * dVar208 * dVar223;
  dVar51 = dVar50 * local_1678;
  dStack_f50 = -dVar207;
  dVar234 = dVar234 * dVar242;
  dVar240 = dVar128 + dVar128;
  dStack_560 = -dVar207;
  local_568 = -(dVar149 * dVar242) * dVar223;
  local_558 = dVar240 * dVar208 * dVar223;
  dVar225 = dVar207 * 4.0;
  dStack_b90 = -dVar207;
  local_b98 = -dVar225 * dVar180 * dVar223;
  dVar52 = dVar211 * 4.0;
  dVar252 = dVar219 * 4.0;
  dVar136 = dVar220 * 4.0;
  local_638 = dVar225 * dVar208 * dVar223;
  local_648 = dVar209 * dVar225 * dVar223;
  local_658 = dVar225 * dVar238 * dVar223;
  local_668 = dVar252 * dVar208 * dVar223;
  local_e18 = dVar136 * dVar208 * dVar223;
  dVar53 = dVar48 * dVar223;
  dStack_1210 = -dVar207;
  dVar54 = -dVar38;
  dStack_11d0 = -dVar219;
  dVar150 = dVar222 * dVar54;
  auVar5._8_4_ = SUB84(dStack_1230,0);
  auVar5._0_8_ = dVar150;
  auVar5._12_4_ = (int)((ulong)dStack_1230 >> 0x20);
  auVar6._8_4_ = SUB84(dStack_1320,0);
  auVar6._0_8_ = dStack_1320 * dVar54;
  auVar6._12_4_ = (int)((ulong)dStack_1320 >> 0x20);
  dVar112 = local_1878 * dStack_1320;
  auVar7._8_4_ = SUB84(dStack_1870,0);
  auVar7._0_8_ = dVar112;
  auVar7._12_4_ = (int)((ulong)dStack_1870 >> 0x20);
  dStack_17f0 = -dVar207;
  dStack_11a0 = -dVar207;
  local_ba8 = dVar47 * dVar181;
  dVar225 = dVar225 * local_1678;
  dVar182 = dVar52 * dVar180;
  dVar55 = dVar52 * dVar208;
  local_12f8 = dVar225 * dStack_1320;
  local_828 = dStack_1320 * dVar55;
  uVar177 = (undefined4)((ulong)dVar207 >> 0x20);
  dVar137 = local_1878 * dVar222;
  dVar138 = dVar207 * dVar208 * dVar222;
  dVar245 = dVar41 * dVar222;
  dVar111 = dVar159 * dVar222;
  auVar8._8_4_ = SUB84(dVar207,0);
  auVar8._0_8_ = dVar111;
  auVar8._12_4_ = uVar177;
  dVar28 = dVar149 * dVar208 * dVar222;
  dVar248 = dVar46 * dVar222;
  dVar253 = dVar47 * dVar222;
  local_c48 = dVar225 * dVar222;
  dStack_17c0 = -dVar219;
  local_17c8 = -dVar55 * dVar222;
  dVar157 = dVar179 * dVar180 * dStack_1230;
  dVar139 = dVar37 * dStack_1230;
  dVar183 = local_1878 * dStack_1230;
  dVar140 = dVar224 * dVar180 * dStack_1230;
  dVar141 = dVar41 * dStack_1230;
  dVar142 = dVar46 * dStack_1230;
  dVar143 = dVar212 * dStack_1230;
  dVar232 = -(dVar240 * local_1678);
  local_2048._4_4_ = (undefined4)((ulong)dVar237 >> 0x20);
  uStack_2040._0_4_ = SUB84(dStack_c30,0);
  uStack_2040._4_4_ = (undefined4)((ulong)dStack_c30 >> 0x20);
  auVar13._4_8_ = dStack_1230;
  auVar13._0_4_ = local_2048._4_4_;
  auVar126._0_8_ = auVar13._0_8_ << 0x20;
  auVar126._8_4_ = (undefined4)uStack_2040;
  auVar126._12_4_ = uStack_2040._4_4_;
  dVar129 = auVar126._8_8_;
  uStack_20c0 = auVar3._8_8_;
  local_628 = dVar130 * dVar157 * dVar210 * dVar233;
  local_1178 = dVar157 * dVar156 * local_1688 * dVar233;
  local_1168 = dVar35 * dVar222 * dVar156 * local_1688 * dVar233;
  local_608 = dVar156 * dVar170 * dVar222 * dVar231 * dVar233;
  uStack_600 = uStack_20c0;
  local_618 = dVar156 * -(dVar170 * dStack_1230) * dVar221 * dVar233;
  uStack_610 = uStack_20c0;
  local_1158 = dVar179 * dVar209 * dStack_1230 * dVar130 * dVar221 * dVar233;
  dVar261 = dVar36 * dVar222 * dVar130;
  local_1138 = dVar261 * dVar210 * dVar233;
  dVar241 = dVar130 * dVar162 * dVar222;
  dVar184 = dVar207 * dVar209 * dVar222 * dVar130 * dVar221 * dVar233;
  dVar214 = dVar37 * dVar222 * dVar127;
  dStack_1100 = -dVar219;
  local_1108 = -dVar214 * dVar210 * dVar233;
  local_5f8 = dVar32 * dVar139 * dVar210 * dVar233;
  uStack_f30 = auVar5._8_8_;
  dVar185 = -dVar244 * dVar222 * dVar127 * dVar221 * dVar233;
  dVar186 = dVar244 * dStack_1230 * dVar32 * dVar221 * dVar233;
  dVar187 = dVar219 * dVar180 * dStack_1230 * dVar32 * local_1688 * dVar233;
  dVar188 = dVar219 * dVar208 * dVar222 * dVar32 * local_1688 * dVar233;
  dVar189 = dVar39 * dVar222 * dVar32 * dVar231 * dVar233;
  dVar190 = -dVar39 * dStack_1230 * dVar32 * dVar221 * dVar233;
  dVar191 = dVar35 * dStack_1230 * dVar130;
  dVar192 = dVar191 * dVar239 * dVar233;
  dVar226 = -(dVar170 * dStack_1230) * dVar130;
  dVar193 = dVar179 * dVar238 * dStack_1230 * dVar130 * dVar231 * dVar233;
  dVar194 = dVar36 * dStack_1230 * dVar237 * local_1688 * dVar233;
  local_5e8 = dVar130 * dVar138 * dVar239 * dVar233;
  dVar195 = dVar138 * dVar237 * local_1688 * dVar233;
  local_1778 = dVar162 * dVar222 * dVar237 * dVar231 * dVar233;
  dVar196 = -(dVar162 * dStack_1230) * dVar237 * dVar221 * dVar233;
  dVar56 = dVar207 * dVar238 * dVar222 * dVar130 * dVar231 * dVar233;
  local_5d8 = dVar127 * dVar150 * dVar239 * dVar233;
  dVar197 = dVar38 * dStack_1230 * dVar32;
  local_5c8 = dVar239 * dVar197 * dVar233;
  dVar57 = -dVar257 * dVar222 * dVar127 * dVar231 * dVar233;
  dVar58 = dVar257 * dStack_1230 * dVar32 * dVar231 * dVar233;
  dVar59 = dVar220 * dVar180 * dStack_1230 * dVar127 * local_1688 * dVar233;
  dVar60 = dVar220 * dVar208 * dVar222 * dVar127 * local_1688 * dVar233;
  dVar61 = dVar260 * dVar222 * dVar127 * dVar231 * dVar233;
  dVar62 = -dVar260 * dStack_1230 * dVar127 * dVar221 * dVar233;
  dVar63 = dVar35 * dStack_1360 * dVar130 * local_1688 * dVar233;
  dVar227 = dVar226 * dVar243 * dVar233;
  dVar64 = dVar170 * dStack_1360 * dVar130 * dVar231 * dVar233;
  dVar65 = -(dVar179 * dVar242) * dStack_1230 * dVar130 * local_1688 * dVar233;
  dVar66 = -dVar36 * dStack_1360 * dVar130 * local_1688 * dVar233;
  local_5b8 = dVar241 * dVar243 * dVar233;
  dVar67 = dVar162 * dStack_1360 * dVar130 * dVar221 * dVar233;
  dVar68 = dVar207 * dVar242 * dVar222 * dVar130 * local_1688 * dVar233;
  dVar69 = dVar139 * dVar129 * local_1688 * dVar233;
  dVar70 = dVar37 * dStack_1360 * dVar127 * local_1688 * dVar233;
  local_f38 = dVar150 * dVar129 * local_1688 * dVar233;
  dVar71 = dVar38 * dStack_1360 * dVar32 * local_1688 * dVar233;
  local_5a8 = dVar127 * dVar137 * dVar243 * dVar233;
  local_1738 = dVar137 * dVar129 * dVar231 * dVar233;
  local_598 = dVar32 * dVar183 * dVar243 * dVar233;
  local_f28 = dVar183 * dVar129 * dVar221 * dVar233;
  local_588 = dVar32 * local_1878 * dStack_1360 * dVar231 * dVar233;
  dStack_f00 = -dStack_1870;
  local_f08 = -(local_1878 * dStack_1360) * dVar127 * dVar221 * dVar233;
  local_f18 = local_1658 * dVar222 * dVar127 * local_1688 * dVar233;
  local_ef8 = local_1658 * dStack_1230 * dVar32 * local_1688 * dVar233;
  dVar72 = dVar128 * dVar180 * dStack_1230 * dVar130 * local_1688 * dVar233;
  dVar73 = -(dVar128 * dVar208) * dVar222 * dVar130 * local_1688 * dVar233;
  local_ed8 = local_1698 * dVar222 * dVar130 * dVar231 * dVar233;
  local_ee8 = local_1698 * dStack_1230 * dVar130 * dVar221 * dVar233;
  local_c18 = dVar221 * dVar156 * dVar245 * dVar233;
  dVar74 = dVar32 * dVar212 * dVar222;
  local_be8 = dVar74 * dVar210 * dVar233;
  local_bf8 = dVar32 * dVar163 * dVar222 * dVar221 * dVar233;
  dVar157 = dVar32 * dVar133 * dVar222;
  local_c08 = dVar221 * dVar157 * dVar233;
  dVar75 = -dVar140 * dVar130 * dVar239 * dVar233;
  local_c38 = dVar237 * dVar140 * local_1688 * dVar233;
  uStack_17b0 = auVar8._8_8_;
  local_17b8 = -dVar111 * dVar237 * local_1688 * dVar233;
  uStack_17b0 = uStack_17b0 ^ 0x8000000000000000;
  dVar76 = dVar159 * dStack_1230 * dVar130;
  local_c28 = dVar210 * dVar76 * dVar233;
  local_17d8 = dVar245 * dVar237 * dVar231 * dVar233;
  dVar249 = dVar130 * dVar141;
  local_8c8 = dVar231 * dVar249;
  local_bd8 = dVar231 * dVar156 * dVar141 * dVar233;
  dVar77 = dVar141 * dVar237 * dVar221 * dVar233;
  dVar78 = -(dVar224 * dVar209) * dStack_1230 * dVar130 * dVar231 * dVar233;
  dVar79 = dVar224 * dVar238 * dStack_1230 * dVar130 * dVar221 * dVar233;
  dVar215 = dVar43 * dVar222 * dVar130;
  local_bc8 = dVar239 * dVar215 * dVar233;
  dVar80 = -(dVar43 * dStack_1230) * dVar156 * local_1688 * dVar233;
  dVar81 = -dVar28 * dVar130 * dVar210 * dVar233;
  local_bb8 = dVar156 * dVar28 * local_1688 * dVar233;
  dVar250 = dVar130 * dVar248;
  local_7f8 = dVar156 * dVar248 * dVar231 * dVar233;
  local_818 = dVar221 * dVar248 * dVar237 * dVar233;
  local_808 = dVar156 * dVar142 * dVar221 * dVar233;
  dVar82 = dVar149 * dVar209 * dVar222 * dVar130 * dVar231 * dVar233;
  dVar83 = -(dVar149 * dVar238) * dVar222 * dVar130 * dVar221 * dVar233;
  dVar144 = dVar212 * dVar222 * dVar127;
  local_7c8 = dVar239 * dVar144 * dVar233;
  dVar145 = dVar32 * dVar143;
  local_7e8 = dVar239 * dVar145 * dVar233;
  local_908 = local_1688 * dVar127 * dVar143;
  local_7d8 = dVar127 * dVar143 * dVar210 * dVar233;
  dVar216 = local_1688 * dVar32 * dVar253;
  local_788 = dVar32 * dVar253 * dVar239 * dVar233;
  dVar198 = dVar127 * dVar253;
  local_798 = dVar210 * dVar198 * dVar233;
  uVar175 = SUB84(dVar127,0);
  uVar178 = (undefined4)((ulong)dVar127 >> 0x20);
  dVar38 = dVar32 * dVar47 * dStack_1230;
  auVar9._8_4_ = uVar175;
  auVar9._0_8_ = dVar38;
  auVar9._12_4_ = uVar178;
  local_918 = local_1688 * dVar38;
  local_7a8 = dVar210 * dVar38 * dVar233;
  dVar254 = dVar32 * dVar48 * dVar222;
  dVar199 = -(dVar48 * dVar222);
  dVar217 = dVar127 * dVar48 * dStack_1230;
  dVar200 = -(dVar48 * dStack_1230);
  dVar84 = dVar163 * dVar222 * dVar127;
  local_758 = dVar231 * dVar84 * dVar233;
  dVar138 = dVar32 * dVar163 * dStack_1230;
  local_768 = dVar231 * dVar138 * dVar233;
  dVar85 = dVar163 * dStack_1230 * dVar127 * dVar221 * dVar233;
  local_728 = dVar32 * dVar49 * dVar222 * dVar231 * dVar233;
  dVar86 = dVar49 * dVar222 * dVar127;
  local_738 = dVar221 * dVar86 * dVar233;
  dVar30 = dVar32 * dVar49 * dStack_1230;
  local_748 = dVar221 * dVar30 * dVar233;
  dVar87 = dVar246 * dVar180 * dStack_1230 * dVar127 * local_1688 * dVar233;
  dVar246 = -(dVar246 * dVar208) * dVar222 * dVar127 * local_1688 * dVar233;
  dVar88 = dVar133 * dVar222 * dVar127 * dVar231 * dVar233;
  dVar228 = dVar32 * dVar133 * dStack_1230;
  local_708 = dVar231 * dVar228 * dVar233;
  dVar89 = dVar133 * dStack_1230 * dVar127 * dVar221 * dVar233;
  dVar90 = -(dVar50 * dVar180) * dStack_1230 * dVar32 * local_1688 * dVar233;
  dVar91 = dVar50 * dVar208 * dVar222 * dVar32 * local_1688 * dVar233;
  local_6d8 = dVar32 * dVar51 * dVar222 * dVar231 * dVar233;
  dVar92 = dVar51 * dVar222 * dVar127;
  local_6e8 = dVar221 * dVar92 * dVar233;
  local_6f8 = dVar32 * dVar51 * dStack_1230 * dVar221 * dVar233;
  dVar93 = dVar41 * dStack_1360 * dVar130 * dVar221 * dVar233;
  local_6c8 = dVar231 * dVar142 * dVar237 * dVar233;
  dVar94 = -dVar212 * dStack_1360 * dVar32 * local_1688 * dVar233;
  dVar95 = dVar47 * dStack_1230 * dVar127;
  dVar96 = dVar95 * dVar239 * dVar233;
  local_6b8 = dVar254 * dVar243 * dVar233;
  dVar97 = dVar199 * dVar129 * dVar221 * dVar233;
  dVar98 = dVar49 * dStack_1230 * dVar127 * dVar231 * dVar233;
  dVar99 = dVar234 * dVar222 * dVar32 * local_1688 * dVar233;
  dVar100 = dVar51 * dStack_1230 * dVar127;
  local_6a8 = dVar231 * dVar100 * dVar233;
  local_1238 = dVar222 * dVar232 * dVar130 * dVar221 * dVar233;
  dVar101 = dVar46 * dStack_1360 * dVar130 * dVar231 * dVar233;
  dVar102 = -dVar47 * dStack_1360 * dVar127 * local_1688 * dVar233;
  local_698 = dVar217 * dVar243 * dVar233;
  dVar103 = dVar200 * dVar129 * dVar231 * dVar233;
  dVar104 = dVar234 * dStack_1230 * dVar127 * local_1688 * dVar233;
  local_160.super_PlainObjectBase<Eigen::Matrix<double,_5,_1,_0,_5,_1>_>.m_storage.m_data.array[3] =
       dVar232 * dStack_1230 * dVar130 * dVar231 * dVar233;
  dVar201 = dVar182 * dVar222 * dVar32;
  dVar50 = dVar138 * dVar221 * dVar233;
  local_1608._8_4_ = uVar175;
  local_1608._0_8_ = dVar50;
  local_1608._12_4_ = uVar178;
  dVar138 = -dVar52 * dVar238 * dVar222 * dVar32 * dVar221 * dVar233;
  local_1598._8_4_ = SUB84(dVar219,0);
  local_1598._0_8_ = dVar138;
  local_1598._12_4_ = (int)((ulong)-dVar219 >> 0x20);
  dVar28 = dVar157 * dVar231 * dVar233;
  local_15f8._8_4_ = uVar175;
  local_15f8._0_8_ = dVar28;
  local_15f8._12_4_ = uVar178;
  dVar140 = -dVar252 * local_1678 * dVar222 * dVar127 * dVar221 * dVar233;
  local_1588._8_4_ = SUB84(dVar219,0);
  local_1588._0_8_ = dVar140;
  local_1588._12_4_ = (uint)((ulong)dVar219 >> 0x20) ^ 0x80000000;
  dVar232 = dVar228 * dVar221 * dVar233;
  local_1628._8_4_ = uVar175;
  local_1628._0_8_ = dVar232;
  local_1628._12_4_ = uVar178;
  dVar157 = dVar130 * dVar225 * dStack_1230;
  local_998._8_4_ = uVar174;
  local_998._0_8_ = dVar157;
  local_998._12_4_ = uVar176;
  local_1568 = dVar198 * dVar239 * dVar233;
  uStack_1550 = auVar9._8_8_;
  local_1558 = dVar38 * dVar239 * dVar233;
  dVar202 = dVar55 * dStack_1230 * dVar127;
  local_988 = local_1688 * dVar202;
  local_1538 = dVar52 * dVar209 * dStack_1230 * dVar127 * dVar231 * dVar233;
  local_1548 = dVar30 * dVar231 * dVar233;
  local_1508 = dVar249 * dVar243 * dVar233;
  local_14f8 = dVar250 * dVar243 * dVar233;
  local_1858 = dVar253 * dVar129 * local_1688 * dVar233;
  local_978 = dVar32 * dVar48 * dStack_1360 * dVar231 * dVar233;
  dVar146 = dVar130 * dVar245 * dVar231;
  dVar203 = dVar41 * dStack_1320 * dVar130;
  dVar204 = dVar203 * dVar231;
  dVar147 = dVar224 * dVar209 * dVar223 * dVar130;
  dVar228 = dVar221 * dVar147;
  dVar38 = dVar130 * dVar44;
  local_ce8._8_4_ = uVar174;
  local_ce8._0_8_ = dVar38;
  local_ce8._12_4_ = uVar176;
  dVar30 = dVar46 * dStack_1320 * dVar130;
  dVar253 = dVar221 * dVar30;
  dVar172 = dVar149 * dVar209 * dVar223 * dVar130;
  dVar105 = dVar221 * dVar172;
  dVar106 = dVar212 * dStack_1320 * dVar127 * local_1688;
  dVar107 = dVar32 * dVar47 * dStack_1320 * local_1688;
  local_878 = dVar156 * dVar35 * dVar223 * local_1688 * local_1788;
  uStack_870 = uStack_20c0;
  local_1338 = dVar35 * dStack_1320 * dVar130 * local_1688 * local_1788;
  dVar148 = dVar156 * dVar170 * dVar223;
  local_868 = dVar148 * dVar231 * local_1788;
  uStack_860 = uStack_20c0;
  local_1328 = dStack_1320 * -dVar170 * dVar130 * dVar231 * local_1788;
  dVar205 = dVar130 * -(dVar36 * dVar223);
  local_858 = dVar210 * dVar205 * local_1788;
  local_1318 = dVar36 * dStack_1320 * dVar130 * local_1688 * local_1788;
  local_1308 = dVar162 * dStack_1320 * dVar130 * dVar221 * local_1788;
  local_10b8 = -(dVar207 * dVar209) * dVar223 * dVar130 * dVar221 * local_1788;
  local_848 = dVar210 * dVar127 * dVar236 * local_1788;
  local_12e8 = dVar37 * dStack_1320 * dVar127 * local_1688 * local_1788;
  uStack_12d0 = auVar6._8_8_;
  local_12d8 = dStack_1320 * dVar54 * dVar32 * local_1688 * local_1788;
  uStack_12b0 = auVar7._8_8_;
  local_838 = dVar32 * dVar112 * dVar231 * local_1788;
  local_12b8 = dVar112 * dVar127 * dVar221 * local_1788;
  local_ff8 = dVar244 * dVar223 * dVar127 * dVar221 * local_1788;
  local_1058 = dVar219 * dVar208 * dVar223 * dVar32 * local_1688 * local_1788;
  dVar164 = dVar39 * dVar223 * dVar32;
  local_1088 = dVar164 * dVar231 * local_1788;
  dStack_10a0 = -dVar207;
  local_10a8 = -dVar29 * dVar130 * dVar239 * local_1788;
  local_7b8 = dVar237 * dVar29 * local_1688 * local_1788;
  dVar108 = dVar237 * dVar162 * dVar223;
  local_778 = dVar108 * dVar231 * local_1788;
  local_1048 = -(dVar207 * dVar238) * dVar223 * dVar130 * dVar231 * local_1788;
  local_718 = dVar127 * dVar256 * dVar239 * local_1788;
  dVar112 = dVar32 * dVar257 * dVar223;
  auVar10._8_4_ = uVar175;
  auVar10._0_8_ = dVar112;
  auVar10._12_4_ = uVar178;
  local_1028 = dVar257 * dVar223 * dVar127 * dVar231 * local_1788;
  local_1098 = dVar220 * dVar208 * dVar223 * dVar127 * local_1688 * local_1788;
  dVar39 = dVar260 * dVar223 * dVar127;
  dVar29 = dVar39 * dVar231 * local_1788;
  local_10c8._8_4_ = uStack_1e60;
  local_10c8._0_8_ = dVar29;
  local_10c8._12_4_ = uStack_1e5c;
  dVar173 = dVar162 * dVar223 * dVar130;
  local_1038 = dVar173 * dVar243 * local_1788;
  local_1068 = dVar207 * dVar242 * dVar223 * dVar130 * local_1688 * local_1788;
  local_1018 = dVar256 * dVar129 * local_1688 * local_1788;
  local_688 = dVar243 * dVar127 * dVar40 * local_1788;
  dStack_1000 = -dStack_1870;
  local_1008 = -(dVar40 * dVar129) * dVar231 * local_1788;
  local_678 = dVar127 * local_1658 * dVar223 * local_1688 * local_1788;
  local_fd8 = dVar128 * dVar208 * dVar223 * dVar130 * local_1688 * local_1788;
  dVar165 = local_1698 * dVar223 * dVar130;
  dStack_fe0 = -dVar128;
  local_fe8 = -dVar165 * dVar231 * local_1788;
  local_16a8 = dVar132 * local_1788;
  local_1868 = dVar158 * local_1788;
  dVar257 = dVar221 * dVar203 * local_1788;
  dVar260 = dVar228 * local_1788;
  dVar258 = dVar32 * dVar212 * dStack_1320 * local_1688 * local_1788;
  local_9e8 = dVar32 * dVar42 * local_1688;
  local_cd8 = local_9e8 * local_1788;
  local_9c8 = dVar130 * dVar160;
  local_9f8 = dVar239 * local_9c8;
  local_cc8 = local_9f8 * local_1788;
  local_1718 = dVar160 * dVar237 * local_1688 * local_1788;
  local_17f8 = -dVar159 * dVar181 * dVar130 * local_1688 * local_1788;
  dVar160 = dVar237 * dVar41 * dVar223;
  dStack_ca0 = -dStack_c30;
  local_ca8 = -dVar160 * dVar231 * local_1788;
  dVar203 = dVar41 * dVar181 * dVar130;
  local_13e8 = dVar203 * dVar231;
  local_cb8 = local_13e8 * local_1788;
  dVar109 = dVar224 * dVar238 * dVar223 * dVar130;
  local_fc8 = dVar109 * dVar231;
  local_c98 = local_fc8 * local_1788;
  local_c68 = dVar239 * dVar38 * local_1788;
  local_1768 = dVar44 * dVar237 * local_1688;
  local_c78 = local_1768 * local_1788;
  local_17e8 = dVar43 * dVar181 * dVar130 * local_1688 * local_1788;
  local_c58 = dVar210 * dVar130 * dVar45 * local_1788;
  local_c88 = dVar156 * dVar45 * local_1688 * local_1788;
  uStack_c80 = uStack_20c0;
  dVar166 = dVar156 * dVar46 * dVar223;
  local_968 = dVar231 * dVar166 * local_1788;
  dVar110 = dVar30 * dVar231 * local_1788;
  local_13c8 = dVar46 * dVar181 * dVar130;
  local_a48 = dVar221 * local_13c8;
  local_958 = local_a48 * local_1788;
  dVar172 = dVar172 * dVar231 * local_1788;
  dVar30 = dVar149 * dVar238 * dVar223 * dVar130;
  local_948 = dVar221 * dVar30 * local_1788;
  local_938 = dVar127 * dVar213 * dVar239 * local_1788;
  local_13b8 = dVar212 * dVar181 * dVar127 * local_1688;
  local_928 = local_13b8 * local_1788;
  dStack_1510 = -dVar219;
  local_8f8 = dVar210 * -local_b88 * dVar127 * local_1788;
  local_1838 = dVar47 * dStack_1320 * dVar127 * local_1688 * local_1788;
  local_a58 = dVar32 * local_ba8 * local_1688;
  local_8e8 = local_a58 * local_1788;
  dStack_13a0 = -dVar219;
  local_13a8 = -(dVar48 * dVar181) * dVar32 * dVar231 * local_1788;
  local_8d8 = dVar127 * dVar48 * dVar181 * dVar221 * local_1788;
  local_8b8 = dVar127 * dVar163 * dVar223 * dVar231 * local_1788;
  dStack_f90 = -dVar219;
  local_f98 = -(dVar49 * dVar223) * dVar127 * dVar221 * local_1788;
  local_f88 = dVar247 * dVar127 * local_1688 * local_1788;
  dVar167 = dVar133 * dVar223 * dVar127;
  dStack_f70 = -dVar219;
  local_f78 = -dVar167 * dVar231 * local_1788;
  local_f68 = dVar134 * dVar127 * local_1688;
  local_8a8 = local_f68 * local_1788;
  local_898 = dVar32 * dVar135 * local_1688 * local_1788;
  dVar47 = dVar51 * dVar223 * dVar32;
  local_888 = dVar231 * dVar47 * local_1788;
  dVar168 = dVar41 * dVar223 * dVar130;
  dStack_1720 = -dVar207;
  local_1728 = -dVar168 * dVar243 * local_1788;
  local_f58 = -dVar224 * dVar242 * dVar223 * dVar130 * local_1688 * local_1788;
  local_fa8 = dVar213 * dVar129 * local_1688 * local_1788;
  local_f48 = dVar240 * dVar180 * dVar223 * dVar130 * local_1688 * local_1788;
  dVar259 = dVar32 * dVar247 * local_1688;
  local_1188 = dVar180 * dVar136 * dVar223 * dVar32 * local_1688 * local_1788;
  dVar235 = dVar130 * dVar45 * dVar239;
  local_1468 = dVar45 * dVar237 * local_1688;
  local_1758 = local_1468 * local_1788;
  local_1368 = dVar181 * dVar225 * dVar130 * dVar231 * local_1788;
  dVar30 = dVar30 * dVar231;
  auVar11._8_4_ = SUB84(dVar207,0);
  auVar11._0_8_ = dVar30;
  auVar11._12_4_ = uVar177;
  local_1358 = dVar55 * dVar181 * dVar127 * local_1688 * local_1788;
  dVar247 = dVar135 * dVar127 * local_1688;
  local_1748 = dVar247 * local_1788;
  local_a08 = dVar221 * dVar127 * dVar53;
  local_a18 = dVar127 * dVar53 * dVar243 * local_1788;
  local_a38 = dVar32 * dVar53;
  local_a28 = dVar221 * dVar53 * dVar129;
  local_1258 = dVar53 * dVar129 * dVar231 * local_1788;
  local_9d8 = dVar32 * dVar234 * dVar223;
  local_12a8 = dVar234 * dVar223 * dVar127 * local_1688 * local_1788;
  dVar41 = dVar240 * local_1678 * dVar223 * dVar130;
  local_9a8 = dVar221 * dVar41;
  local_12c8 = dVar41 * dVar231 * local_1788;
  dVar41 = dVar221 * dVar130 * dVar142;
  local_10d8 = local_1688 * dVar191 * local_ec8;
  local_1078 = dVar231 * dVar226 * local_ec8;
  local_13d8 = dVar130 * dVar36 * dStack_1230 * local_1688 * local_ec8;
  local_13f8 = dVar130 * dVar162 * dStack_1230 * dVar221 * local_ec8;
  local_1408 = dVar127 * dVar139 * local_1688 * local_ec8;
  dVar45 = -dVar197 * local_1688 * local_ec8;
  local_fb8 = dVar231 * dVar32 * dVar183 * local_ec8;
  local_1418 = dVar127 * dVar183 * dVar221 * local_ec8;
  local_1828 = dVar130 * dVar111 * local_1688 * local_ec8;
  dVar51 = dVar146 * local_ec8;
  local_17a8 = dVar221 * dVar249 * local_ec8;
  dVar53 = -dVar215 * local_1688 * local_ec8;
  dVar55 = dVar221 * dVar250 * local_ec8;
  dVar133 = local_1688 * dVar144 * local_ec8;
  local_1298 = local_1688 * dVar145 * local_ec8;
  dVar135 = dVar216 * local_ec8;
  local_1268 = dVar231 * dVar254 * local_ec8;
  local_1498 = dVar127 * dVar199 * dVar221 * local_ec8;
  local_1848 = dVar130 * dVar142 * dVar231 * local_ec8;
  local_1248 = local_1688 * dVar95 * local_ec8;
  local_1348 = dVar130 * dVar35 * dVar222 * local_1688 * local_9b8;
  dStack_1790 = -dVar207;
  local_1798 = -(dVar170 * dVar222) * dVar130 * dVar231 * local_9b8;
  local_1148 = local_1688 * dVar261 * local_9b8;
  local_1128 = dVar221 * dVar241 * local_9b8;
  local_1118 = local_1688 * dVar214 * local_9b8;
  local_1388 = dVar32 * dVar150 * local_1688 * local_9b8;
  local_1378 = dVar32 * dVar137 * dVar231 * local_9b8;
  local_10e8 = dVar221 * dVar127 * dVar137 * local_9b8;
  dVar150 = dVar221 * dVar130 * dVar245 * local_9b8;
  local_1528._8_4_ = SUB84(dVar231,0);
  local_1528._0_8_ = dVar150;
  local_1528._12_4_ = (int)((ulong)dVar231 >> 0x20);
  local_1808 = local_1688 * dVar74 * local_9b8;
  dVar74 = -dVar76 * local_1688 * local_9b8;
  local_1818 = dVar130 * dVar43 * dStack_1230 * local_1688 * local_9b8;
  local_1398 = dVar231 * dVar250 * local_9b8;
  dVar76 = dVar41 * local_9b8;
  local_1288 = local_1688 * dVar198 * local_9b8;
  local_1448 = dVar32 * dVar200 * dVar231 * local_9b8;
  local_1278 = dVar221 * dVar217 * local_9b8;
  dVar111 = dVar35 * dVar223 * dVar130;
  local_16f8 = dVar111 * local_1688 * dStack_ec0;
  dVar95 = dVar170 * dVar223 * dVar130;
  dVar198 = dVar231 * dVar95 * dStack_ec0;
  dVar137 = dVar205 * local_1688 * dStack_ec0;
  dVar139 = dVar221 * dVar173 * dStack_ec0;
  dVar173 = dVar127 * dVar236 * local_1688 * dStack_ec0;
  dVar183 = dVar32 * dVar256 * local_1688 * dStack_ec0;
  dVar191 = dVar231 * dVar32 * dVar40 * dStack_ec0;
  dVar197 = -(dVar127 * dVar40) * dVar221 * dStack_ec0;
  dStack_1570 = -dVar219;
  dVar199 = dVar221 * dVar168 * dStack_ec0;
  local_1578 = -dVar213 * dVar32 * local_1688 * dStack_ec0;
  local_1708 = dVar46 * dVar223 * dVar130;
  dVar200 = dVar231 * local_1708 * dStack_ec0;
  local_1518 = -local_b88 * dVar127 * local_1688 * dStack_ec0;
  dVar168 = dVar130 * dVar34 * dVar210 * dStack_1780;
  dStack_e60 = -dVar207;
  local_e68 = -dVar34 * dVar156 * local_1688 * dStack_1780;
  dVar46 = dVar221 * dVar148 * dStack_1780;
  local_e78 = dVar179 * dVar209 * dVar223 * dVar130 * dVar221 * dStack_1780;
  dVar148 = dVar32 * dVar236 * dVar210 * dStack_1780;
  local_14e8 = dVar32 * dVar244 * dVar223 * dVar221 * dStack_1780;
  local_ea8 = -(dVar219 * dVar180) * dVar223 * dVar32 * local_1688 * dStack_1780;
  dVar244 = dVar221 * dVar164 * dStack_1780;
  dVar205 = dVar239 * dVar111 * dStack_1780;
  local_1228 = dVar35 * dVar181 * dVar130 * local_1688 * dStack_1780;
  local_1218 = -dVar170 * dVar181 * dVar130 * dVar231 * dStack_1780;
  local_eb8 = dVar179 * dVar238 * dVar223 * dVar130 * dVar231 * dStack_1780;
  dVar164 = -(dVar36 * dVar223) * dVar237 * local_1688 * dStack_1780;
  local_1208 = dVar36 * dVar181 * dVar130 * local_1688 * dStack_1780;
  dVar108 = dVar221 * dVar108 * dStack_1780;
  local_11f8 = dVar162 * dVar181 * dVar130 * dVar221 * dStack_1780;
  local_11e8 = dVar37 * dVar181 * dVar127 * local_1688 * dStack_1780;
  dVar256 = dVar239 * dVar32 * dVar256 * dStack_1780;
  local_11d8 = dVar54 * dVar181 * dVar32 * local_1688 * dStack_1780;
  dVar111 = dVar32 * local_1878 * dVar181 * dVar231 * dStack_1780;
  local_e38 = dVar130 * dVar171 * dVar239 * dStack_1780;
  local_e28 = dVar171 * dVar237 * local_1688 * dStack_1780;
  local_11c8 = local_1878 * dVar181 * dVar127 * dVar221 * dStack_1780;
  uStack_14a0 = auVar10._8_8_;
  local_14a8 = dVar112 * dVar231 * dStack_1780;
  uStack_e80 = auVar4._8_8_;
  local_e88 = dVar113 * dVar127 * local_1688 * dStack_1780;
  dVar54 = dVar221 * dVar39 * dStack_1780;
  dVar95 = dVar95 * dVar243 * dStack_1780;
  local_e98 = dVar179 * dVar242 * dVar223 * dVar130 * local_1688 * dStack_1780;
  dVar162 = dVar210 * local_9c8 * dStack_1780;
  local_16e8 = dVar236 * dVar129 * local_1688 * dStack_1780;
  local_e48 = dVar33 * dStack_1780;
  local_11b8 = dVar159 * dStack_1320 * dVar130 * local_1688 * dStack_1780;
  dVar171 = -(dVar32 * dVar40) * dVar243 * dStack_1780;
  dVar112 = dVar221 * dVar40 * dVar129 * dStack_1780;
  dStack_16d0 = -dVar219;
  local_16d8 = -(local_1658 * dVar223) * dVar32 * local_1688 * dStack_1780;
  local_e58 = dVar128 * dVar180 * dVar223 * dVar130 * local_1688 * dStack_1780;
  dVar39 = dVar221 * dVar165 * dStack_1780;
  local_15c8 = dVar221 * dVar160 * dStack_1780;
  local_14b8 = dVar204 * dStack_1780;
  local_15d8 = dVar221 * dVar203 * dStack_1780;
  dVar34 = dVar147 * dVar231 * dStack_1780;
  local_15b8 = dVar221 * dVar109 * dStack_1780;
  local_14d8 = dVar210 * dVar38 * dStack_1780;
  local_15a8 = dVar156 * dVar44 * local_1688 * dStack_1780;
  uStack_15a0 = uStack_20c0;
  local_11a8 = -dVar43 * dStack_1320 * dVar130 * local_1688 * dStack_1780;
  uStack_15e0 = uStack_20c0 ^ 0x8000000000000000;
  local_15e8 = -dVar166 * dVar221 * dStack_1780;
  local_1438 = dVar253 * dStack_1780;
  local_1428 = dVar105 * dStack_1780;
  dVar35 = dVar239 * -dVar213 * dVar32 * dStack_1780;
  dVar170 = dVar106 * dStack_1780;
  local_1618 = dVar32 * dVar212 * dVar181 * local_1688 * dStack_1780;
  dVar40 = dVar32 * local_b88 * dVar210 * dStack_1780;
  dVar36 = dVar107 * dStack_1780;
  dVar160 = dVar32 * dVar48 * dStack_1320 * dVar231 * dStack_1780;
  dStack_1190 = -dVar219;
  local_1198 = -(dVar48 * dStack_1320) * dVar127 * dVar221 * dStack_1780;
  dStack_16c0 = -dVar219;
  local_16c8 = -(dVar163 * dVar223) * dVar32 * dVar231 * dStack_1780;
  local_1638 = dVar32 * dVar49 * dVar223 * dVar221 * dStack_1780;
  local_16b8 = dVar42 * dVar127 * local_1688 * dStack_1780;
  local_14c8 = dVar259 * dStack_1780;
  local_1488 = dVar221 * dVar167 * dStack_1780;
  local_1648 = dVar32 * dVar134 * local_1688 * dStack_1780;
  dVar37 = -dVar47 * dVar221 * dStack_1780;
  local_1458 = dVar235 * dStack_1780;
  local_1468 = local_1468 * dStack_1780;
  dVar236 = local_13c8 * dVar231 * dStack_1780;
  uStack_1470 = auVar11._8_8_;
  local_1478 = dVar30 * dStack_1780;
  dVar42 = local_ba8 * dVar127 * local_1688 * dStack_1780;
  dVar247 = dVar247 * dStack_1780;
  dVar44 = -local_1708 * dVar243 * dStack_1780;
  dVar49 = local_568 * dVar130 * local_1688 * dStack_1780;
  dVar47 = local_b88 * dVar129 * local_1688 * dStack_1780;
  dVar113 = local_558 * dVar130 * local_1688 * dStack_1780;
  local_160.super_PlainObjectBase<Eigen::Matrix<double,_5,_1,_0,_5,_1>_>.m_storage.m_data.array[2] =
       (local_9a8 * dStack_1780 +
       ((dVar240 * dVar180 * dStack_1230 * dVar130 * local_1688 * dVar233 +
        local_12a8 +
        (((local_978 +
          ((local_a28 * dStack_1780 +
           local_a18 +
           (((dVar231 * local_a38 * dStack_ec0 +
             ((dVar143 * dVar129 * local_1688 * dVar233 +
              dVar149 * dVar242 * dVar222 * dVar130 * local_1688 * dVar233 +
              local_14f8 +
              (((-dVar224 * dVar242 * dStack_1230 * dVar130 * local_1688 * dVar233 +
                ((dVar159 * dStack_1360 * dVar130 * local_1688 * dVar233 +
                 local_9c8 * local_1688 * dStack_ec0 +
                 dVar100 * dVar221 * dVar233 +
                 dVar136 * local_1678 * dStack_1230 * dVar32 * dVar231 * dVar233 +
                 ((((local_f68 * dStack_1780 +
                    -dVar252 * local_1678 * dStack_1230 * dVar127 * dVar231 * dVar233 +
                    local_668 * dVar127 * local_1688 * dStack_1780 +
                    -dVar52 * dVar238 * dStack_1230 * dVar127 * dVar221 * dVar233 +
                    ((dVar86 * dVar231 * dVar233 +
                     local_1538 +
                     local_1358 +
                     local_a58 * dStack_1780 +
                     (((local_988 * local_9b8 +
                       ((local_918 * local_ec8 +
                        local_1568 +
                        local_17c8 * dVar127 * local_1688 * local_ec8 +
                        ((dVar182 * dStack_1230 * dVar127 * dVar239 * dVar233 +
                         ((dVar30 * local_1788 +
                          local_658 * dVar130 * dVar221 * dStack_1780 +
                          ((((local_12f8 * dVar130 * dVar231 * dStack_1780 +
                             dVar142 * dVar237 * dVar221 * dVar233 +
                             dVar225 * dStack_1230 * dVar156 * dVar231 * dVar233 +
                             ((((local_c48 * dVar130 * dVar231 * local_ec8 +
                                (((dVar235 * local_1788 +
                                  dVar130 * local_638 * dVar210 * dStack_1780 +
                                  local_1768 * dStack_1780 +
                                  local_b98 * dVar130 * dVar239 * dStack_1780 +
                                  ((local_13e8 * dStack_1780 +
                                   -dVar161 * dStack_1230 * dVar237 * dVar231 * dVar233 +
                                   local_8c8 * local_ec8 +
                                   local_578 * dVar237 * local_1688 * dStack_1780 +
                                   ((dVar136 * local_1678 * dVar222 * dVar32 * dVar221 * dVar233 +
                                    ((dVar232 +
                                     dVar140 + (((dVar252 * dVar180 * dVar223 * dVar127 * local_1688
                                                  * local_1788 +
                                                 local_9e8 * dStack_1780 +
                                                 dVar138 + ((dVar84 * dVar221 * dVar233 +
                                                            dVar52 * dVar209 * dVar222 * dVar32 *
                                                            dVar231 * dVar233 +
                                                            dVar107 * local_1788 +
                                                            dVar32 * local_17c8 * dVar210 * dVar233
                                                            + dVar216 * local_9b8 +
                                                              dVar182 * dVar181 * dVar32 *
                                                              local_1688 * local_1788 +
                                                              ((((dVar32 * dVar182 * dStack_1230 *
                                                                  local_1688 * local_9b8 +
                                                                 dVar144 * dVar210 * dVar233 +
                                                                 ((dVar201 * dVar239 * dVar233 +
                                                                  ((dVar105 * local_1788 +
                                                                   ((dVar156 * local_c48 * dVar221 *
                                                                     dVar233 +
                                                                    ((dVar156 * local_b98 *
                                                                      local_1688 * local_1788 +
                                                                     dVar210 * dVar38 * local_1788 +
                                                                     dVar131 * dVar238 * dVar223 *
                                                                     dVar130 * dVar221 * local_1788
                                                                     + ((((dVar204 * local_1788 +
                                                                          dVar161 * dStack_1320 *
                                                                          dVar130 * dVar221 *
                                                                          dStack_1780 +
                                                                          dVar156 * dVar141 *
                                                                          dVar221 * dVar233 +
                                                                          dVar130 * -dVar161 *
                                                                                    dStack_1230 *
                                                                          dVar221 * local_9b8 +
                                                                          (((dVar146 * local_9b8 +
                                                                            dVar130 * dVar161 * 
                                                  dVar222 * dVar221 * local_ec8 +
                                                  ((dVar130 * local_578 * dVar210 * local_1788 +
                                                   dVar31 * dVar237 * local_1688 * local_1788 +
                                                   ((dVar158 * dStack_1780 -
                                                    dVar130 * dVar31 * dVar239 * local_1788) -
                                                   dVar132 * dStack_1780)) - dVar33 * local_1788)) -
                                                  dVar156 * dVar245 * dVar231 * dVar233) -
                                                  dVar161 * dVar222 * dVar237 * dVar221 * dVar233))
                                                  - dVar181 * dVar161 * dVar130 * dVar221 *
                                                    local_1788) - dVar228 * dStack_1780) -
                                                  dVar209 * dVar131 * dVar223 * dVar130 * dVar231 *
                                                  local_1788)) - dVar221 * dVar250 * local_9b8)) -
                                                  dVar253 * local_1788)) -
                                                  local_1688 * dVar201 * local_ec8)) -
                                                  local_1688 * dVar144 * local_9b8)) -
                                                  dVar145 * dVar210 * dVar233) -
                                                  dStack_1320 * dVar182 * dVar32 * local_1688 *
                                                  dStack_1780) - dVar106 * local_1788)) - dVar50)) -
                                                dVar259 * local_1788) - dVar28)) - local_1188)) -
                                   local_9f8 * dStack_1780)) - local_fc8 * dStack_1780)) -
                                 local_638 * dVar156 * local_1688 * dStack_1780) - local_1758)) -
                               dVar248 * dVar237 * dVar231 * dVar233) - dVar41 * local_ec8) -
                             dVar157 * dVar231 * local_9b8)) - local_a48 * dStack_1780) - local_1368
                           ) - local_648 * dVar130 * dVar231 * dStack_1780)) - local_908 * local_ec8
                         )) - local_13b8 * dStack_1780)) - local_1558)) -
                      dVar202 * dVar210 * dVar233) - local_828 * dVar127 * local_1688 * dStack_1780)
                     ) - local_1548)) - local_e18 * dVar32 * local_1688 * dStack_1780) - local_1748)
                 - dVar92 * dVar231 * dVar233)) - local_1508)) - dVar38 * local_1688 * dStack_ec0) -
              dVar43 * dStack_1360 * dVar130 * local_1688 * dVar233)) - local_1858)) -
            local_a38 * dVar243 * dStack_1780) - local_a08 * dStack_ec0)) - local_1258)) -
         dVar48 * dStack_1360 * dVar127 * dVar221 * dVar233) - local_9d8 * local_1688 * dStack_1780)
        ) - dVar240 * dVar208 * dVar222 * dVar130 * local_1688 * dVar233)) - local_12c8;
  local_160.super_PlainObjectBase<Eigen::Matrix<double,_5,_1,_0,_5,_1>_>.m_storage.m_data.array[1] =
       ((((((((((((((((((((((((((((((((((((((((((((((((((((((((((((((((((((((((((((((local_16a8 -
                                                                                    local_1868) -
                                                                                   dVar150) +
                                                                                  local_c18) -
                                                                                 dVar257) + dVar260
                                                                                + local_1808) -
                                                                               local_be8) + dVar258)
                                                                             - local_bf8) -
                                                                            local_cd8) + local_c08 +
                                                                            dVar75 + local_c38) -
                                                                          local_e38) + local_e28 +
                                                                          local_1828 + local_17b8 +
                                                                          dVar74 + local_c28 +
                                                                          dVar162 + local_cc8) -
                                                                        local_e48) - local_1718) +
                                                                       local_11b8 + local_17f8 +
                                                                      dVar51) - local_17d8) -
                                                                    local_17a8) -
                                                                   local_8c8 * local_9b8) +
                                                                   local_bd8 + dVar77 + local_15c8 +
                                                                   local_ca8 + local_14b8) -
                                                                 local_15d8) - local_cb8) + dVar78)
                                                              - dVar34) + dVar79 + local_15b8 +
                                                              local_c98 + dVar53 + local_bc8 +
                                                              local_1818 + dVar80 + local_14d8 +
                                                             local_c68) - local_15a8) - local_c78) +
                                                           local_11a8 + local_17e8 + dVar81 +
                                                          local_bb8) - local_c58) + local_c88) -
                                                       dVar55) - local_1398) + local_7f8 + local_818
                                                     + dVar76) - local_808) + local_15e8 + local_968
                                                   ) - local_1438) - dVar110) + local_958 + dVar82 +
                                                 local_1428 + dVar172 + dVar83) - local_948) -
                                              dVar133) + local_7c8 + local_1298) - local_7e8) +
                                           local_908 * local_9b8) - local_7d8) + dVar35 + local_938)
                                        - dVar170) + local_1618 + local_928 + dVar135) - local_788)
                                     + local_1288) - local_798) - local_918 * local_9b8) + local_7a8
                                   + dVar40 + local_8f8 + dVar36 + local_1838) - local_8e8) +
                                 local_1268 + local_1498 + local_1448 + local_1278 + dVar160 +
                                 local_1198 + local_13a8 + local_8d8 + local_758) - local_768) -
                              dVar85) + local_16c8 + local_8b8) - local_728) - local_738) +
                           local_748 + local_1638 + local_f98 + dVar87 + local_16b8 + dVar246) -
                         local_14c8) - local_f88) - dVar88) + local_708 + dVar89 + local_1488 +
                       local_f78 + dVar90) - local_1648) - local_8a8) + dVar91 + local_898 +
                    local_6d8 + local_6e8) - local_6f8) + dVar37 + local_888 + dVar199 + local_1728
                  + dVar93 + local_f58 + local_1458) - local_1468) - local_1848) + local_6c8) -
             dVar236) + local_1478 + local_1578 + local_fa8 + dVar94 + local_1248) - dVar96) +
           dVar42 + local_6b8 + dVar97) - dVar98) + dVar99) - dVar247) + local_6a8 + local_f48 +
       local_1238 + dVar200 + dVar44 + dVar101 + dVar49 + local_1518 + dVar47 + dVar102 + local_698
       + dVar103 + dVar104 + dVar113 +
       local_160.super_PlainObjectBase<Eigen::Matrix<double,_5,_1,_0,_5,_1>_>.m_storage.m_data.array
       [3];
  local_160.super_PlainObjectBase<Eigen::Matrix<double,_5,_1,_0,_5,_1>_>.m_storage.m_data.array[3] =
       ((((((((((((((((((((((((((((((((((((((((((((((((((((((((((((((((((((((((((((((((local_1868 -
                                                                                      local_16a8) +
                                                                                     dVar150) -
                                                                                    local_c18) +
                                                                                   dVar257) -
                                                                                  dVar260) -
                                                                                 local_1808) +
                                                                                local_be8) - dVar258
                                                                               ) + local_bf8 +
                                                                              local_cd8) - local_c08
                                                                             ) + dVar75 + local_c38
                                                                            + local_e38) - local_e28
                                                                           ) + local_1828 +
                                                                           local_17b8 + dVar74 +
                                                                          local_c28) - dVar162) -
                                                                        local_cc8) + local_e48 +
                                                                        local_1718 + local_11b8 +
                                                                       local_17f8) - dVar51) +
                                                                      local_17d8 + local_17a8 +
                                                                     local_8c8 * local_9b8) -
                                                                    local_bd8) - dVar77) +
                                                                   local_15c8 + local_ca8) -
                                                                 local_14b8) + local_15d8 +
                                                                 local_cb8 + dVar78 + dVar34 +
                                                                dVar79) - local_15b8) - local_c98) +
                                                              dVar53 + local_bc8 + local_1818 +
                                                             dVar80) - local_14d8) - local_c68) +
                                                           local_15a8 + local_c78 + local_11a8 +
                                                           local_17e8 + dVar81 + local_bb8 +
                                                          local_c58) - local_c88) + dVar55 +
                                                        local_1398) - local_7f8) - local_818) -
                                                     dVar76) + local_808 + local_15e8 + local_968 +
                                                     local_1438 + dVar110) - local_958) + dVar82) -
                                                 local_1428) - dVar172) + dVar83 + local_948 +
                                               dVar133) - local_7c8) - local_1298) + local_7e8) -
                                           local_908 * local_9b8) + local_7d8 + dVar35 + local_938 +
                                          dVar170) - local_1618) - local_928) - dVar135) + local_788
                                      ) - local_1288) + local_798 + local_918 * local_9b8) -
                                   local_7a8) + dVar40 + local_8f8) - dVar36) - local_1838) +
                                local_8e8 + local_1268 + local_1498 + local_1448 + local_1278 +
                                dVar160 + local_1198 + local_13a8 + local_8d8) - local_758) +
                              local_768 + dVar85 + local_16c8 + local_8b8 + local_728 + local_738) -
                            local_748) + local_1638 + local_f98 + dVar87) - local_16b8) + dVar246 +
                          local_14c8 + local_f88 + dVar88) - local_708) - dVar89) + local_1488 +
                       local_f78 + dVar90 + local_1648 + local_8a8 + dVar91) - local_898) -
                    local_6d8) - local_6e8) + local_6f8 + dVar37 + local_888 + dVar199 + local_1728
                   + dVar93 + local_f58) - local_1458) + local_1468 + local_1848) - local_6c8) +
              dVar236) - local_1478) + local_1578 + local_fa8 + dVar94) - local_1248) + dVar96) -
         dVar42) + local_6b8 + dVar97 + dVar98 + dVar99 + dVar247) - local_6a8) + local_f48 +
       local_1238 + dVar200 + dVar44 + dVar101 + dVar49 + local_1518 + dVar47 + dVar102 + local_698
       + dVar103 + dVar104 + dVar113 +
       local_160.super_PlainObjectBase<Eigen::Matrix<double,_5,_1,_0,_5,_1>_>.m_storage.m_data.array
       [3];
  local_160.super_PlainObjectBase<Eigen::Matrix<double,_5,_1,_0,_5,_1>_>.m_storage.m_data.array[0] =
       (((((((((((((((((((((((((((((((((((((((((((((((((((((((((((((((((((local_628 - local_1178) +
                                                                         dVar168 + local_e68) -
                                                                       local_1348) + local_1168 +
                                                                      local_878) - local_1338) +
                                                                     local_1798 + local_608 +
                                                                    local_618) - dVar46) + local_868
                                                                   + local_1328 + local_1158 +
                                                                   local_e78 + local_1148) -
                                                                 local_1138) + local_858 +
                                                                 local_1318 + local_1128 +
                                                                local_1308) - dVar184) + local_10b8
                                                               + local_1118 + local_1108 + local_5f8
                                                              + dVar148) - local_848) + local_12e8 +
                                                             local_1388 + local_12d8) - local_1378)
                                                          + local_10e8) - local_838) + local_12b8 +
                                                         dVar185 + dVar186 + local_14e8) - local_ff8
                                                       ) - dVar187) + local_ea8 + dVar188 +
                                                      local_1058 + dVar189 + dVar190) - dVar244) +
                                                   local_1088) - local_10d8) + dVar192 + dVar205) -
                                                local_1228) + local_1078 + local_1218 + dVar193 +
                                                local_eb8 + local_13d8) - dVar194) + dVar164 +
                                             local_1208) - local_5e8) + dVar195 + local_10a8 +
                                            local_7b8 + local_1778 + local_13f8 + dVar196) - dVar108
                                          ) + local_778 + local_11f8) - dVar56) + local_1048 +
                                        local_1408 + local_11e8 + local_5d8 + dVar45 + local_5c8 +
                                       dVar256) - local_718) + local_11d8) - local_fb8) + local_1418
                                   ) - dVar111) + local_11c8 + dVar57 + dVar58 + local_14a8) -
                                local_1028) - dVar59) + local_e88 + dVar60 + local_1098 + dVar61 +
                              dVar62) - dVar54) + dVar29 + local_16f8 + dVar63 + dVar227 + dVar198)
                           - dVar95) + dVar64 + dVar65) - local_e98) + dVar137 + dVar66 + local_5b8)
                       - dVar139) + local_1038) - dVar67) + dVar68 + local_1068 + dVar69) - dVar173)
                  + local_16e8) - dVar70) + local_f38 + dVar183) - local_1018) + dVar71 + local_5a8)
             - local_1738) - local_598) + local_f28 + dVar191 + dVar171 + dVar197 + local_688 +
            dVar112 + local_1008 + local_588 + local_f08 + local_f18) - local_ef8) + local_16d8 +
          local_678 + dVar72 + local_e58 + dVar73) - local_fd8) - local_ed8) + local_ee8 + dVar39 +
       local_fe8;
  local_160.super_PlainObjectBase<Eigen::Matrix<double,_5,_1,_0,_5,_1>_>.m_storage.m_data.array[4] =
       ((((((((((((((((((((((((((((((((((((((((((((((((((((((((((((((((((((((local_1178 - local_628)
                                                                            + dVar168 + local_e68 +
                                                                           local_1348) - local_1168)
                                                                          + local_878 + local_1338 +
                                                                          local_1798 + local_608 +
                                                                          local_618 + dVar46) -
                                                                        local_868) + local_1328) -
                                                                      local_1158) + local_e78) -
                                                                    local_1148) + local_1138 +
                                                                   local_858) - local_1318) +
                                                                  local_1128 + local_1308 + dVar184
                                                                  + local_10b8 + local_1118 +
                                                                  local_1108 + local_5f8) - dVar148)
                                                                + local_848 + local_12e8 +
                                                                local_1388 + local_12d8 + local_1378
                                                               ) - local_10e8) + local_838) -
                                                            local_12b8) + dVar185 + dVar186) -
                                                          local_14e8) + local_ff8 + dVar187 +
                                                         local_ea8) - dVar188) + local_1058 +
                                                        dVar189 + dVar190 + dVar244) - local_1088) +
                                                     local_10d8) - dVar192) + dVar205 + local_1228 +
                                                    local_1078 + local_1218) - dVar193) + local_eb8)
                                                - local_13d8) + dVar194 + dVar164) - local_1208) +
                                             local_5e8) - dVar195) + local_10a8 + local_7b8 +
                                            local_1778 + local_13f8 + dVar196 + dVar108) - local_778
                                          ) + local_11f8 + dVar56 + local_1048 + local_1408 +
                                          local_11e8 + local_5d8 + dVar45 + local_5c8) - dVar256) +
                                        local_718 + local_11d8 + local_fb8) - local_1418) + dVar111)
                                    - local_11c8) + dVar57 + dVar58) - local_14a8) + local_1028 +
                                  dVar59 + local_e88) - dVar60) + local_1098 + dVar61 + dVar62 +
                               dVar54) - dVar29) + local_16f8 + dVar63 + dVar227) - dVar198) +
                           dVar95) - dVar64) + dVar65 + local_e98 + dVar137 + dVar66 + local_5b8 +
                         dVar139) - local_1038) + dVar67 + dVar68) - local_1068) + dVar69 + dVar173)
                    - local_16e8) + dVar70 + local_f38) - dVar183) + local_1018) - dVar71) -
               local_5a8) + local_1738 + local_598) - local_f28) + dVar191 + dVar171 + dVar197 +
             local_688 + dVar112 + local_1008 + local_588 + local_f08) - local_f18) + local_ef8 +
           local_16d8 + local_678 + dVar72) - local_e58) + dVar73 + local_fd8 + local_ed8) -
       local_ee8) + dVar39 + local_fe8;
  dStack_1860 = dVar156;
  dStack_1850 = dVar219;
  dStack_1840 = dVar156;
  dStack_1830 = dVar219;
  dStack_1820 = dVar156;
  dStack_1810 = dVar156;
  dStack_1800 = dVar210;
  dStack_17e0 = dVar207;
  dStack_17d0 = dVar207;
  dStack_17a0 = dVar231;
  dStack_1770 = dVar207;
  dStack_1760 = dVar207;
  dStack_1750 = dVar207;
  dStack_1730 = dStack_1870;
  dStack_1710 = dVar207;
  dStack_1700 = dVar207;
  dStack_16f0 = dVar207;
  dStack_16e0 = dVar219;
  dStack_16b0 = dVar219;
  dStack_16a0 = dVar210;
  dStack_1690 = dVar128;
  dStack_1680 = dVar210;
  dStack_1670 = dVar209;
  dStack_1650 = dVar219;
  dStack_1640 = dVar127;
  dStack_1630 = dVar127;
  dStack_1610 = dVar127;
  dStack_15d0 = dVar231;
  dStack_15c0 = dVar231;
  dStack_15b0 = dVar231;
  dStack_1560 = dVar127;
  dStack_1540 = dVar127;
  dStack_1530 = dVar219;
  dStack_1500 = dVar156;
  dStack_14f0 = dVar156;
  dStack_14e0 = dVar127;
  dStack_14d0 = dVar210;
  dStack_14c0 = dVar127;
  dStack_14b0 = dVar207;
  dStack_1490 = dVar127;
  dStack_1480 = dVar231;
  dStack_1460 = dVar207;
  dStack_1450 = dVar156;
  dStack_1440 = dVar127;
  dStack_1430 = dVar231;
  dStack_1420 = dVar231;
  dStack_1410 = dVar127;
  dStack_1400 = dVar127;
  dStack_13f0 = dVar156;
  dStack_13e0 = dVar207;
  dStack_13d0 = dVar156;
  dStack_13c0 = dVar207;
  dStack_13b0 = dVar219;
  dStack_1390 = dVar231;
  dStack_1380 = dVar127;
  dStack_1370 = dVar127;
  dStack_1350 = dVar219;
  dStack_1340 = dVar156;
  dStack_1330 = dVar207;
  dStack_1310 = dVar207;
  dStack_1300 = dVar207;
  dStack_12f0 = dVar207;
  dStack_12e0 = dVar219;
  dStack_12c0 = dVar128;
  dStack_12a0 = dVar219;
  dStack_1290 = dVar210;
  dStack_1280 = dVar210;
  dStack_1270 = dVar231;
  dStack_1260 = dVar231;
  dStack_1250 = dVar219;
  dStack_1240 = dVar210;
  dStack_1220 = dVar207;
  dStack_1200 = dVar207;
  dStack_11f0 = dVar207;
  dStack_11e0 = dVar219;
  dStack_11c0 = dStack_1870;
  dStack_11b0 = dVar207;
  dStack_1180 = dVar208;
  dStack_1170 = dVar207;
  dStack_1160 = dVar207;
  dStack_1150 = dVar207;
  dStack_1140 = dVar210;
  dStack_1130 = dVar207;
  dStack_1120 = dVar231;
  dStack_1110 = dVar210;
  local_10f8 = dStack_1780;
  dStack_10f0 = dStack_1780;
  dStack_10e0 = dVar231;
  dStack_10d0 = dVar210;
  dStack_1080 = dVar219;
  dStack_1070 = dVar231;
  dStack_1060 = dVar207;
  dStack_1050 = dVar219;
  dStack_1030 = dVar207;
  dStack_1020 = dVar219;
  dStack_1010 = dVar219;
  dStack_ff0 = dVar219;
  dStack_fd0 = dVar128;
  dStack_fc0 = dVar207;
  dStack_fb0 = dVar231;
  dStack_fa0 = dVar219;
  dStack_f80 = dVar219;
  dStack_f60 = dStack_1740;
  dStack_f40 = dVar128;
  dStack_f20 = dStack_1870;
  dStack_f10 = dVar219;
  dStack_ef0 = dVar219;
  dStack_ee0 = dVar128;
  dStack_ed0 = dVar128;
  dStack_eb0 = dVar207;
  dStack_e90 = dVar207;
  dStack_e70 = dVar207;
  dStack_e50 = dVar128;
  dStack_e40 = dVar156;
  dStack_e30 = dVar156;
  dStack_e20 = dVar207;
  dStack_cd0 = dVar127;
  dStack_cc0 = dVar243;
  dStack_cb0 = dVar207;
  dStack_c90 = dVar207;
  dStack_c70 = dVar207;
  dStack_c60 = dVar243;
  dStack_c50 = dVar210;
  dStack_c40 = dVar207;
  dStack_c20 = dVar210;
  dStack_c10 = dVar231;
  dStack_c00 = dVar231;
  dStack_bf0 = dVar127;
  dStack_be0 = dVar127;
  dStack_bd0 = dVar231;
  dStack_bc0 = dVar243;
  uStack_bb0 = uStack_20c0;
  dStack_ba0 = dVar219;
  dStack_b80 = dVar219;
  dStack_a50 = dVar127;
  dStack_a40 = dVar231;
  dStack_a30 = dVar127;
  dStack_a20 = dVar231;
  dStack_a10 = dVar127;
  dStack_a00 = dVar231;
  dStack_9f0 = dVar243;
  dStack_9e0 = dVar127;
  dStack_9d0 = dVar127;
  dStack_9c0 = dVar156;
  dStack_9b0 = local_9b8;
  dStack_9a0 = dVar231;
  dStack_980 = dVar210;
  dStack_970 = dVar127;
  dStack_960 = dVar231;
  dStack_950 = dVar231;
  dStack_940 = dVar231;
  dStack_930 = dVar127;
  dStack_920 = dVar219;
  dStack_910 = dVar210;
  dStack_900 = dVar210;
  dStack_8f0 = dVar210;
  dStack_8e0 = dVar127;
  dStack_8d0 = dVar127;
  dStack_8c0 = dVar231;
  dStack_8b0 = dVar127;
  dStack_8a0 = dStack_1740;
  dStack_890 = dVar127;
  dStack_880 = dVar231;
  dStack_850 = dVar210;
  dStack_840 = dVar210;
  dStack_830 = dVar127;
  dStack_820 = dStack_1320;
  dStack_810 = dVar231;
  uStack_800 = uStack_20c0;
  uStack_7f0 = uStack_20c0;
  dStack_7e0 = dVar243;
  dStack_7d0 = dVar127;
  dStack_7c0 = dVar243;
  dStack_7b0 = dStack_c30;
  dStack_7a0 = dVar210;
  dStack_790 = dVar210;
  dStack_780 = dVar127;
  dStack_770 = dStack_c30;
  dStack_760 = dVar231;
  dStack_750 = dVar231;
  dStack_740 = dVar231;
  dStack_730 = dVar231;
  dStack_720 = dVar127;
  dStack_710 = dVar127;
  dStack_700 = dVar231;
  dStack_6f0 = dVar127;
  dStack_6e0 = dVar231;
  dStack_6d0 = dVar127;
  dStack_6c0 = dVar231;
  dStack_6b0 = dVar127;
  dStack_6a0 = dVar231;
  dStack_690 = dVar127;
  dStack_680 = dVar243;
  dStack_670 = dVar127;
  dStack_660 = dVar219;
  dStack_650 = dVar207;
  dStack_640 = dVar209;
  dStack_630 = dVar207;
  dStack_620 = dVar156;
  dStack_5f0 = dVar127;
  dStack_5e0 = dVar156;
  dStack_5d0 = dVar127;
  dStack_5c0 = dVar243;
  dStack_5b0 = dVar156;
  dStack_5a0 = dVar127;
  dStack_590 = dVar127;
  dStack_580 = dVar127;
  dStack_570 = dVar207;
  dStack_550 = dVar128;
  o4_roots<double>(&local_1890,&local_160);
  (__return_storage_ptr__->
  super__Vector_base<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  iVar26 = (int)((ulong)((long)local_1890.super__Vector_base<double,_std::allocator<double>_>.
                               _M_impl.super__Vector_impl_data._M_finish -
                        (long)local_1890.super__Vector_base<double,_std::allocator<double>_>._M_impl
                              .super__Vector_impl_data._M_start) >> 3);
  if (iVar26 != 0) {
    dVar111 = dVar32 * local_1878;
    dVar113 = -local_1878;
    dVar149 = dVar32 * local_1658 * local_1688;
    dVar112 = -local_1698;
    dStack_1690 = -dStack_1690;
    dVar150 = dVar127 * local_1878;
    local_1698 = dVar112 * dVar130 * dVar231 +
                 local_1658 * dVar127 * local_1688 + dVar150 * dVar243 + dVar113 * dVar129 * dVar231
    ;
    iVar21 = 0;
    do {
      dVar38 = local_1890.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_finish[-1];
      local_dc8 = dVar38 * dVar38 + 1.0;
      local_dc0 = (PointerType)((1.0 - dVar38 * dVar38) / local_dc8);
      local_dc8 = (dVar38 + dVar38) / local_dc8;
      dVar34 = -(dVar179 * (double)local_dc0) * local_1678;
      dVar257 = dVar156 * dVar34;
      dVar38 = dVar211 * (double)local_dc0;
      dVar42 = dVar180 * dVar38;
      dVar260 = dVar219 * -(double)local_dc0 * local_1678 * dVar32;
      dVar37 = local_1678 * dVar207 * (double)local_dc0;
      dVar53 = -dVar37 * dVar237;
      dVar40 = dVar208 * dVar38;
      dVar41 = -(double)local_dc0 * dVar220 * local_1678 * dVar127;
      dVar34 = dVar34 * dVar130;
      dVar236 = local_1678 * dVar179 * local_dc8;
      dVar140 = -dVar236 * dVar237;
      dVar49 = local_1678 * dVar207 * local_dc8;
      dVar35 = dVar156 * dVar49;
      dVar57 = dVar211 * local_dc8;
      dVar43 = dVar180 * dVar57;
      dVar232 = dVar208 * -dVar57;
      dVar58 = -dVar57 * dVar238;
      local_548.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
      [0] = -local_dc8;
      dVar44 = dVar219 * local_548.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
                         m_storage.m_data.array[0] * local_1678 * dVar127;
      dVar170 = dVar220 * local_dc8 * local_1678 * dVar32;
      dVar49 = dVar49 * dVar130;
      dVar28 = local_dc8 * (double)local_dc0;
      dVar62 = (double)local_dc0 * (double)local_dc0;
      dVar157 = dVar179 * dVar62;
      dVar45 = dVar130 * dVar208 * dVar157;
      dVar30 = dVar207 * dVar62;
      dVar52 = local_dc8 * local_dc8;
      dVar39 = dVar179 * dVar52;
      dVar29 = dVar207 * dVar52;
      dVar46 = dVar130 * dVar180 * dVar29;
      dVar138 = dVar179 * dVar28;
      dVar47 = dVar180 * dVar138;
      dVar50 = dVar208 * dVar138;
      dVar59 = -dVar138 * dVar209 * dVar130;
      dVar60 = dVar238 * dVar138 * dVar130;
      dVar31 = dVar207 * dVar28;
      dVar138 = dVar180 * dVar31;
      dVar36 = dVar209 * dVar31 * dVar130;
      dVar51 = dVar180 * dVar219 * dVar28;
      dVar54 = dVar219 * dVar28 * dVar208;
      dVar55 = dVar180 * dVar28 * dVar220;
      dVar48 = dVar208 * dVar31;
      dVar61 = dVar31 * dVar238 * dVar130;
      dVar31 = -(dVar28 * dVar220) * dVar208;
      dVar37 = dVar37 * dVar130;
      dVar236 = dVar236 * dVar130;
      dVar33 = ((((dVar42 * dVar127 * local_1688 +
                  dVar37 * dVar221 + dVar34 * dVar231 + (dVar111 * dVar231 - dVar221 * dVar150)) -
                 dVar32 * dVar40 * local_1688) + dVar236 * dVar221) - dVar32 * dVar43 * local_1688)
               + dVar49 * dVar231 + dVar232 * dVar127 * local_1688 + dVar45 * local_1688;
      dVar56 = -dVar30 * dVar180 * dVar130;
      dVar244 = dVar208 * dVar39 * dVar130;
      dVar28 = dVar244 * local_1688;
      dVar256 = dVar46 * local_1688;
      local_db0 = -(dVar127 * dVar31 * local_1688 +
                   dVar61 * dVar231 +
                   ((dVar130 * dVar48 * dVar239 +
                    (((dVar127 * dVar51 * local_1688 +
                      dVar36 * dVar221 +
                      ((dVar130 * dVar138 * dVar210 +
                       dVar60 * dVar221 +
                       dVar59 * dVar231 +
                       ((dVar130 * dVar50 * dVar210 +
                        dVar237 * dVar47 * local_1688 +
                        -dVar47 * dVar130 * dVar239 +
                        dVar208 * dVar52 * dVar220 * dVar32 * local_1688 +
                        (((dVar209 * dVar29 * dVar130 * dVar231 +
                          dVar208 * dVar29 * dVar156 * local_1688 +
                          ((dVar46 * dVar239 +
                           ((dVar180 * dVar62 * dVar220 * dVar127 * local_1688 +
                            dVar237 * dVar180 * dVar30 * local_1688 +
                            (((dVar180 * dVar219 * dVar62 * dVar32 * local_1688 +
                              ((dVar180 * dVar157 * dVar156 * local_1688 +
                               (((dVar129 * dVar232 * local_1688 +
                                 dVar207 * local_dc8 * dVar242 * dVar130 * local_1688 +
                                 dVar49 * dVar243 +
                                 dVar170 * dVar221 +
                                 dVar44 * dVar221 +
                                 dVar32 * dVar58 * dVar221 +
                                 dVar32 * dVar209 * dVar57 * dVar231 +
                                 dVar32 * dVar232 * dVar210 +
                                 dVar32 * dVar43 * dVar239 +
                                 dVar35 * dVar221 +
                                 dVar140 * dVar221 +
                                 dVar180 * dVar128 * (double)local_dc0 * dVar130 * local_1688 +
                                 dVar129 * dVar42 * local_1688 +
                                 ((dVar34 * dVar243 +
                                  dVar41 * dVar221 +
                                  dVar32 * dVar38 * dVar238 * dVar231 +
                                  dVar32 * dVar40 * dVar239 +
                                  dVar53 * dVar221 +
                                  dVar260 * dVar221 +
                                  dVar32 * dVar209 * dVar38 * dVar221 +
                                  dVar32 * dVar42 * dVar210 +
                                  dVar257 * dVar221 +
                                  dVar112 * dVar130 * dVar221 +
                                  dVar149 + dVar111 * dVar243 + dVar113 * dVar129 * dVar221) -
                                 dVar179 * (double)local_dc0 * dVar242 * dVar130 * local_1688)) -
                                dVar208 * dVar128 * local_dc8 * dVar130 * local_1688) -
                               dVar130 * dVar180 * dVar157 * dVar210)) -
                              dVar209 * dVar157 * dVar130 * dVar221)) - dVar45 * dVar239) -
                            dVar157 * dVar238 * dVar130 * dVar231)) -
                           dVar237 * dVar208 * dVar39 * local_1688)) -
                          dVar130 * dVar208 * dVar29 * dVar210)) -
                         dVar29 * dVar238 * dVar130 * dVar221) -
                        dVar208 * dVar219 * dVar52 * dVar127 * local_1688)) -
                       dVar156 * dVar50 * local_1688)) - dVar156 * dVar138 * local_1688)) -
                     dVar32 * dVar54 * local_1688) - dVar32 * dVar55 * local_1688)) -
                   dVar237 * dVar48 * local_1688)) /
                  (((dVar33 - dVar180 * dVar30 * dVar130 * local_1688) + dVar28) - dVar256);
      local_db8 = -(dVar31 * dVar32 * local_1688 +
                   dVar55 * dVar127 * local_1688 +
                   dVar54 * dVar127 * local_1688 +
                   dVar61 * dVar221 +
                   (((dVar130 * dVar48 * dVar210 +
                     dVar138 * dVar237 * local_1688 +
                     (((dVar50 * dVar237 * local_1688 +
                       ((dVar51 * dVar32 * local_1688 +
                        dVar59 * dVar221 +
                        dVar47 * dVar156 * local_1688 +
                        -dVar47 * dVar130 * dVar210 +
                        ((dVar219 * dVar52 * dVar180 * dVar127 * local_1688 +
                         ((dVar39 * dVar238 * dVar130 * dVar221 +
                          ((dVar244 * dVar210 +
                           dVar180 * dVar39 * dVar237 * local_1688 +
                           ((dVar62 * dVar220 * dVar208 * dVar127 * local_1688 +
                            ((dVar208 * dVar30 * dVar237 * local_1688 +
                             ((dVar219 * dVar62 * dVar208 * dVar32 * local_1688 +
                              ((dVar56 * dVar210 +
                               dVar208 * dVar157 * dVar156 * local_1688 +
                               dVar128 * local_dc8 * dVar180 * dVar130 * local_1688 +
                               dVar43 * dVar129 * local_1688 +
                               (((dVar170 * dVar231 +
                                 dVar44 * dVar231 +
                                 dVar58 * dVar127 * dVar221 +
                                 dVar209 * dVar57 * dVar127 * dVar231 +
                                 dVar232 * dVar127 * dVar210 +
                                 dVar127 * dVar43 * dVar239 +
                                 dVar35 * dVar231 +
                                 dVar140 * dVar231 +
                                 dVar128 * (double)local_dc0 * dVar208 * dVar130 * local_1688 +
                                 dVar40 * dVar129 * local_1688 +
                                 (((dVar41 * dVar231 +
                                   dVar38 * dVar238 * dVar127 * dVar231 +
                                   dVar127 * dVar40 * dVar239 +
                                   dVar53 * dVar231 +
                                   dVar260 * dVar231 +
                                   dVar209 * dVar38 * dVar127 * dVar221 +
                                   dVar42 * dVar127 * dVar210 + dVar257 * dVar231 + local_1698) -
                                  dVar37 * dVar243) -
                                 dVar207 * (double)local_dc0 * dVar242 * dVar130 * local_1688)) -
                                dVar236 * dVar243) -
                               dVar179 * local_dc8 * dVar242 * dVar130 * local_1688)) -
                              dVar209 * dVar30 * dVar130 * dVar221)) -
                             dVar130 * dVar208 * dVar30 * dVar239)) -
                            dVar30 * dVar238 * dVar130 * dVar231)) -
                           dVar130 * dVar180 * dVar39 * dVar239)) -
                          dVar209 * dVar39 * dVar130 * dVar231)) -
                         dVar180 * dVar29 * dVar156 * local_1688)) -
                        dVar52 * dVar220 * dVar180 * dVar32 * local_1688)) -
                       dVar130 * dVar50 * dVar239)) - dVar60 * dVar231) -
                     dVar130 * dVar138 * dVar239)) - dVar48 * dVar156 * local_1688) -
                   dVar36 * dVar231)) / ((dVar56 * local_1688 + dVar33 + dVar28) - dVar256);
      local_1890.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
      ._M_finish = local_1890.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_finish + -1;
      local_da8.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array
      [1] = 0.0;
      local_da8.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array
      [2] = 4.94065645841247e-324;
      local_da8.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array
      [3] = 4.94065645841247e-324;
      local_da8.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array
      [0] = (double)&local_1e8;
      local_1e8.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array
      [0] = (double)local_dc0;
      pCVar17 = Eigen::CommaInitializer<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>::operator_
                          ((CommaInitializer<Eigen::Matrix<double,_4,_4,_0,_4,_4>_> *)&local_da8,
                           (Scalar *)&local_548);
      local_1668.m_xpr = (XprTypeNested)0x0;
      pCVar17 = Eigen::CommaInitializer<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>::operator_
                          (pCVar17,(Scalar *)&local_1668);
      pCVar17 = Eigen::CommaInitializer<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>::operator_
                          (pCVar17,&local_db0);
      pCVar17 = Eigen::CommaInitializer<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>::operator_
                          (pCVar17,&local_dc8);
      pCVar17 = Eigen::CommaInitializer<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>::operator_
                          (pCVar17,(Scalar *)&local_dc0);
      local_dd0 = 0.0;
      pCVar17 = Eigen::CommaInitializer<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>::operator_
                          (pCVar17,&local_dd0);
      pCVar17 = Eigen::CommaInitializer<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>::operator_
                          (pCVar17,&local_db8);
      local_dd8 = 0.0;
      pCVar17 = Eigen::CommaInitializer<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>::operator_
                          (pCVar17,&local_dd8);
      local_de0 = 0.0;
      pCVar17 = Eigen::CommaInitializer<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>::operator_
                          (pCVar17,&local_de0);
      local_de8 = 1.0;
      pCVar17 = Eigen::CommaInitializer<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>::operator_
                          (pCVar17,&local_de8);
      local_df0 = 0.0;
      pCVar17 = Eigen::CommaInitializer<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>::operator_
                          (pCVar17,&local_df0);
      local_df8 = 0.0;
      pCVar17 = Eigen::CommaInitializer<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>::operator_
                          (pCVar17,&local_df8);
      local_e00 = 0.0;
      pCVar17 = Eigen::CommaInitializer<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>::operator_
                          (pCVar17,&local_e00);
      local_e08 = 0.0;
      pCVar17 = Eigen::CommaInitializer<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>::operator_
                          (pCVar17,&local_e08);
      local_e10 = 1.0;
      Eigen::CommaInitializer<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>::operator_(pCVar17,&local_e10);
      if (((long)(((PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)
                  local_da8.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.
                  m_data.array[3])->m_storage).m_data.array +
           (long)local_da8.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.
                 m_data.array[1] != 4) ||
         (local_da8.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.
          array[2] != 1.97626258336499e-323)) {
        __assert_fail("((m_row+m_currentBlockRows) == m_xpr.rows() || m_xpr.cols() == 0) && m_col == m_xpr.cols() && \"Too few coefficients passed to comma initializer (operator<<)\""
                      ,"/usr/include/eigen3/Eigen/src/Core/CommaInitializer.h",0x7c,
                      "XprType &Eigen::CommaInitializer<Eigen::Matrix<double, 4, 4>>::finished() [MatrixType = Eigen::Matrix<double, 4, 4>]"
                     );
      }
      local_1668.m_xpr = &local_138;
      local_1660 = &local_1e8;
      Eigen::internal::
      Assignment<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_Eigen::Inverse<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>,_Eigen::internal::assign_op<double,_double>,_Eigen::internal::Dense2Dense,_void>
      ::run(&local_da8,&local_1668,(assign_op<double,_double> *)&local_548);
      local_d28 = local_1660;
      local_d18 = local_1660;
      local_d10 = 4;
      lVar19 = 0;
      do {
        dVar38 = *(double *)
                  ((long)(local_1660->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).
                         m_storage.m_data.array + lVar19);
        dVar50 = *(double *)
                  ((long)(local_1660->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).
                         m_storage.m_data.array + lVar19 + 8);
        dVar138 = *(double *)
                   ((long)(local_1660->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>)
                          .m_storage.m_data.array + lVar19 + 0x10);
        dVar28 = *(double *)
                  ((long)(local_1660->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).
                         m_storage.m_data.array + lVar19 + 0x18);
        *(double *)
         ((long)local_548.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                m_data.array + lVar19) =
             dVar28 * local_da8.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.
                      m_storage.m_data.array[0xc] +
             dVar138 * local_da8.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.
                       m_storage.m_data.array[8] +
             dVar50 * local_da8.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.
                      m_storage.m_data.array[4] +
             dVar38 * local_da8.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.
                      m_storage.m_data.array[0];
        *(double *)
         ((long)local_548.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                m_data.array + lVar19 + 8) =
             dVar28 * local_da8.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.
                      m_storage.m_data.array[0xd] +
             dVar138 * local_da8.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.
                       m_storage.m_data.array[9] +
             dVar50 * local_da8.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.
                      m_storage.m_data.array[5] +
             dVar38 * local_da8.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.
                      m_storage.m_data.array[1];
        dVar38 = *(double *)
                  ((long)(local_1660->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).
                         m_storage.m_data.array + lVar19);
        dVar50 = *(double *)
                  ((long)(local_1660->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).
                         m_storage.m_data.array + lVar19 + 8);
        dVar138 = *(double *)
                   ((long)(local_1660->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>)
                          .m_storage.m_data.array + lVar19 + 0x10);
        dVar28 = *(double *)
                  ((long)(local_1660->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).
                         m_storage.m_data.array + lVar19 + 0x18);
        *(double *)
         ((long)local_548.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                m_data.array + lVar19 + 0x10) =
             dVar28 * local_da8.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.
                      m_storage.m_data.array[0xe] +
             dVar138 * local_da8.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.
                       m_storage.m_data.array[10] +
             dVar50 * local_da8.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.
                      m_storage.m_data.array[6] +
             dVar38 * local_da8.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.
                      m_storage.m_data.array[2];
        *(double *)
         ((long)local_548.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                m_data.array + lVar19 + 0x18) =
             dVar28 * local_da8.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.
                      m_storage.m_data.array[0xf] +
             dVar138 * local_da8.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.
                       m_storage.m_data.array[0xb] +
             dVar50 * local_da8.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.
                      m_storage.m_data.array[7] +
             dVar38 * local_da8.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.
                      m_storage.m_data.array[3];
        lVar19 = lVar19 + 0x20;
      } while (lVar19 != 0x80);
      local_4c8 = &local_4a8;
      local_4c0 = &local_548;
      local_4b0 = 1.97626258336499e-323;
      lVar19 = 0;
      local_d20 = &local_da8;
      do {
        dVar38 = *(double *)
                  ((long)&local_4a8.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.
                          m_storage.m_data + lVar19);
        dVar50 = *(double *)
                  ((long)&local_4a8.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.
                          m_storage.m_data + lVar19 + 8);
        dVar138 = *(double *)
                   ((long)&local_4a8.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.
                           m_storage.m_data + lVar19 + 0x10);
        dVar28 = *(double *)
                  ((long)&local_4a8.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.
                          m_storage.m_data + lVar19 + 0x18);
        *(double *)
         ((long)local_da8.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.
                m_data.array + lVar19) =
             local_4e8 * dVar28 +
             local_548.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data
             .array[8] * dVar138 +
             local_548.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data
             .array[4] * dVar50 +
             local_548.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data
             .array[0] * dVar38;
        *(double *)
         ((long)local_da8.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.
                m_data.array + lVar19 + 8) =
             dStack_4e0 * dVar28 +
             dStack_500 * dVar138 +
             local_548.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data
             .array[5] * dVar50 +
             local_548.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data
             .array[1] * dVar38;
        *(double *)
         ((long)local_da8.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.
                m_data.array + lVar19 + 0x10) =
             dVar28 * local_4d8 +
             dVar138 * local_4f8 +
             dVar50 * local_548.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
                      m_storage.m_data.array[6] +
             dVar38 * local_548.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
                      m_storage.m_data.array[2];
        *(double *)
         ((long)local_da8.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.
                m_data.array + lVar19 + 0x18) =
             dVar28 * dStack_4d0 +
             dVar138 * dStack_4f0 +
             dVar50 * local_548.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
                      m_storage.m_data.array[7] +
             dVar38 * local_548.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
                      m_storage.m_data.array[3];
        lVar19 = lVar19 + 0x20;
      } while (lVar19 != 0x80);
      local_1e8.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array
      [0] = local_da8.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.
            array[0];
      local_1e8.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array
      [1] = local_da8.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.
            array[1];
      local_1e8.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array
      [2] = local_da8.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.
            array[2];
      local_1e8.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array
      [3] = local_da8.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.
            array[3];
      local_1e8.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array
      [4] = local_da8.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.
            array[4];
      local_1e8.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array
      [5] = local_da8.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.
            array[5];
      local_1e8.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array
      [6] = local_da8.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.
            array[6];
      local_1e8.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array
      [7] = local_da8.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.
            array[7];
      local_1e8.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array
      [8] = local_da8.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.
            array[8];
      local_1e8.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array
      [9] = local_da8.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.
            array[9];
      local_1e8.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array
      [10] = local_da8.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data
             .array[10];
      local_1e8.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array
      [0xb] = local_da8.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.
              m_data.array[0xb];
      local_1e8.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array
      [0xc] = local_da8.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.
              m_data.array[0xc];
      local_1e8.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array
      [0xd] = local_da8.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.
              m_data.array[0xd];
      local_1e8.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array
      [0xe] = local_da8.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.
              m_data.array[0xe];
      local_1e8.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array
      [0xf] = local_da8.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.
              m_data.array[0xf];
      __position._M_current =
           (__return_storage_ptr__->
           super__Vector_base<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
      local_4b8 = local_4c8;
      if (__position._M_current ==
          (__return_storage_ptr__->
          super__Vector_base<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>_>
          )._M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::vector<Eigen::Matrix<double,4,4,0,4,4>,std::allocator<Eigen::Matrix<double,4,4,0,4,4>>>
        ::_M_realloc_insert<Eigen::Matrix<double,4,4,0,4,4>const&>
                  ((vector<Eigen::Matrix<double,4,4,0,4,4>,std::allocator<Eigen::Matrix<double,4,4,0,4,4>>>
                    *)__return_storage_ptr__,__position,&local_1e8);
      }
      else {
        pMVar24 = &local_1e8;
        iVar25._M_current = __position._M_current;
        for (lVar19 = 0x10; lVar19 != 0; lVar19 = lVar19 + -1) {
          ((iVar25._M_current)->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).
          m_storage.m_data.array[0] =
               (pMVar24->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.
               m_data.array[0];
          pMVar24 = (Matrix<double,_4,_4,_0,_4,_4> *)((long)pMVar24 + ((ulong)bVar27 * -2 + 1) * 8);
          iVar25._M_current =
               (Matrix<double,_4,_4,_0,_4,_4> *)
               ((long)iVar25._M_current + ((ulong)bVar27 * -2 + 1) * 8);
        }
        (__return_storage_ptr__->
        super__Vector_base<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>_>
        )._M_impl.super__Vector_impl_data._M_finish = __position._M_current + 1;
      }
      iVar21 = iVar21 + 1;
    } while (iVar21 != iVar26);
  }
  if (local_1890.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
      ._M_start != (pointer)0x0) {
    operator_delete(local_1890.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_1890.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_1890.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_d00.
      super__Vector_base<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_d00.
                    super__Vector_base<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_d00.
                          super__Vector_base<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_d00.
                          super__Vector_base<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return __return_storage_ptr__;
}

Assistant:

vector<Matrix<floatPrec, 4, 4>> solver1P3L(
	std::vector<std::pair<Eigen::Matrix<floatPrec,4,1>, Eigen::Matrix<floatPrec,4,1>>> ptPair,
	std::vector<std::pair<Eigen::Matrix<floatPrec,4,1>, Eigen::Matrix<floatPrec,4,1>>> plPair,
	std::vector<std::pair<std::pair<Eigen::Matrix<floatPrec,4,1>, Eigen::Matrix<floatPrec,4,1>>,std::pair<Eigen::Matrix<floatPrec,4,1>, Eigen::Matrix<floatPrec,4,1>>>> lPair,
	std::vector<std::pair<std::pair<Eigen::Matrix<floatPrec,4,1>, Eigen::Matrix<floatPrec,4,1>>,std::pair<Eigen::Matrix<floatPrec,4,1>, Eigen::Matrix<floatPrec,4,1>>>> lCPair)
{

	// check input vectors size
	if(plPair.size() < 1 || lPair.size() < 3){
		std::cerr << "Solver 3L1Q requires at least 1 plane, and 3 line pairs!" << std::endl;
		exit(-1);
	}

	// parse inputs
	Eigen::Matrix<floatPrec, 4, 1> Pi, Nu, P11, P12, Q11, Q12, P21, P22, Q21, Q22, P31, P32, Q31, Q32;
	Pi = plPair[0].first; Nu = plPair[0].second;

	P11 = lPair[0].first.first; P12 = lPair[0].first.second;
	Q11 = lPair[0].second.first; Q12 = lPair[0].second.second;
	P21 = lPair[1].first.first; P22 = lPair[1].first.second;
	Q21 = lPair[1].second.first; Q22 = lPair[1].second.second;
	P31 = lPair[2].first.first; P32 = lPair[2].first.second;
	Q31 = lPair[2].second.first; Q32 = lPair[2].second.second;

	bool verbose = false;

	Matrix<floatPrec, 3, 1> tP11, tP12, tQ11, tQ12;
	Matrix<floatPrec, 3, 1> tP21, tP22, tQ21, tQ22;
	Matrix<floatPrec, 3, 1> tP31, tP32, tQ31, tQ32;
	tP11 = P11.head(3) / P11(3);
	tP12 = P12.head(3) / P12(3);
	tQ11 = Q11.head(3) / Q11(3);
	tQ12 = Q12.head(3) / Q12(3);
	tP21 = P21.head(3) / P21(3);
	tP22 = P22.head(3) / P22(3);
	tQ21 = Q21.head(3) / Q21(3);
	tQ22 = Q22.head(3) / Q22(3);
	tP31 = P31.head(3) / P31(3);
	tP32 = P32.head(3) / P32(3);
	tQ31 = Q31.head(3) / Q31(3);
	tQ32 = Q32.head(3) / Q32(3);

	// computing the plucker coordinates of the lines
	// starting from line 1
	Matrix<floatPrec, 3, 1> D1;
	Matrix<floatPrec, 6, 1> L11;
	Matrix<floatPrec, 6, 1> L21;
	Matrix<floatPrec, 6, 1> L31;

	D1 = tP12 - tP11;
	L11.head(3) = D1;
	L11.tail(3) = tP12.cross(tP11);
	L11 /= L11.head(3).norm();
	D1 = tP22 - tP21;
	L21.head(3) = D1;
	L21.tail(3) = tP22.cross(tP21);
	L21 /= L21.head(3).norm();
	D1 = tP32 - tP31;
	L31.head(3) = D1;
	L31.tail(3) = tP32.cross(tP31);
	L31 /= L31.head(3).norm();

	// starting from line 2
	Matrix<floatPrec, 6, 1> L12;
	Matrix<floatPrec, 6, 1> L22;
	Matrix<floatPrec, 6, 1> L32;
	D1 = tQ12 - tQ11;
	L12.head(3) = D1;
	L12.tail(3) = tQ12.cross(tQ11);
	L12 /= L12.head(3).norm();
	D1 = tQ22 - tQ21;
	L22.head(3) = D1;
	L22.tail(3) = tQ22.cross(tQ21);
	L22 /= L22.head(3).norm();
	D1 = tQ32 - tQ31;
	L32.head(3) = D1;
	L32.tail(3) = tQ32.cross(tQ31);
	L32 /= L32.head(3).norm();

	// get the predefined transformation matrices
	vector<Matrix<floatPrec, 4, 4>> predTrans = getPredefinedTransformations1Plane3Line<floatPrec>(Pi, Nu);
	Matrix<floatPrec, 4, 4> TV = predTrans.back();
	predTrans.pop_back();
	Matrix<floatPrec, 4, 4> TU = predTrans.back();
	predTrans.pop_back();

	if (verbose)
		cout << "[VERBOSE] Matrix TU" << endl
			 << TU << endl;
	if (verbose)
		cout << "[VERBOSE] Matrix TV" << endl
			 << TV << endl;

	// define the transformation to the lines
	Matrix<floatPrec, 6, 6> TL, TK;
	TL = Matrix<floatPrec, 6, 6>::Zero(6, 6);
	TL.topLeftCorner(3, 3) = TU.topLeftCorner(3, 3);
	TL.bottomRightCorner(3, 3) = TU.topLeftCorner(3, 3);
	TL.bottomLeftCorner(3, 3) = -1 * getSkew<floatPrec>(TU.col(3).head(3)) * TU.topLeftCorner(3, 3);
	if (verbose)
		cout << "[VERBOSE] Matrix TL" << endl
			 << TL << endl;

	TK = Matrix<floatPrec, 6, 6>::Zero(6, 6);
	TK.topLeftCorner(3, 3) = TV.topLeftCorner(3, 3);
	TK.bottomRightCorner(3, 3) = TV.topLeftCorner(3, 3);
	TK.bottomLeftCorner(3, 3) = -1 * getSkew<floatPrec>(TV.col(3).head(3)) * TV.topLeftCorner(3, 3);
	if (verbose)
		cout << "[VERBOSE] Matrix TK" << endl
			 << TK << endl;

	// apply predefined transformations to the lines
	// get the coefficients
	// get parameters of the first line correspondence
	Matrix<floatPrec, 6, 1> u1;
	floatPrec u11, u12, u13, u14, u15, u16;
	u1 = TL * L11;
	u11 = u1(0);
	u12 = u1(1);
	u13 = u1(2);
	u14 = u1(3);
	u15 = u1(4);
	u16 = u1(5);
	Matrix<floatPrec, 6, 1> v1;
	floatPrec v11, v12, v13, v14, v15, v16;
	v1 = TK * L12;
	v11 = v1(0);
	v12 = v1(1);
	v13 = v1(2);
	v14 = v1(3);
	v15 = v1(4);
	v16 = v1(5);

	// get the parameters of the secod line correspondence
	Matrix<floatPrec, 6, 1> u2;
	floatPrec u21, u22, u23, u24, u25, u26;
	u2 = TL * L21;
	u21 = u2(0);
	u22 = u2(1);
	u23 = u2(2);
	u24 = u2(3);
	u25 = u2(4);
	u26 = u2(5);

	Matrix<floatPrec, 6, 1> v2;
	floatPrec v21, v22, v23, v24, v25, v26;
	v2 = TK * L22;
	v21 = v2(0);
	v22 = v2(1);
	v23 = v2(2);
	v24 = v2(3);
	v25 = v2(4);
	v26 = v2(5);

	// get the parameters of the third line correspondence
	Matrix<floatPrec, 6, 1> u3;
	floatPrec u31, u32, u33, u34, u35, u36;
	u3 = TL * L31;
	u31 = u3(0);
	u32 = u3(1);
	u33 = u3(2);
	u34 = u3(3);
	u35 = u3(4);
	u36 = u3(5);

	Matrix<floatPrec, 6, 1> v3;
	floatPrec v31, v32, v33, v34, v35, v36;
	v3 = TK * L32;
	v31 = v3(0);
	v32 = v3(1);
	v33 = v3(2);
	v34 = v3(3);
	v35 = v3(4);
	v36 = v3(5);

	// compute the coefficients
	floatPrec c1, c2, c3, c4, c5;
	c1 = u11*u21*u32*v13*v24*v33 - u11*u21*u32*v14*v23*v33 + u11*u21*u33*v13*v24*v32 - u11*u21*u33*v14*v23*v32 - u11*u22*u31*v13*v23*v34 + u11*u22*u31*v14*v23*v33 + u11*u22*u33*v14*v23*v31 - u11*u22*u34*v13*v23*v31 - u11*u23*u31*v13*v22*v34 + u11*u23*u31*v14*v22*v33 - u11*u23*u32*v14*v21*v33 - u11*u23*u33*v14*v21*v32 + u11*u23*u33*v14*v22*v31 - u11*u23*u34*v13*v22*v31 + u11*u24*u32*v13*v21*v33 + u11*u24*u33*v13*v21*v32 + u12*u21*u31*v13*v23*v34 - u12*u21*u31*v13*v24*v33 - u12*u21*u33*v13*v24*v31 + u12*u21*u34*v13*v23*v31 + u12*u23*u31*v13*v21*v34 + u12*u23*u34*v13*v21*v31 - u12*u24*u31*v13*v21*v33 - u12*u24*u33*v13*v21*v31 + u13*u21*u31*v12*v23*v34 - u13*u21*u31*v12*v24*v33 + u13*u21*u32*v11*v24*v33 + u13*u21*u33*v11*v24*v32 - u13*u21*u33*v12*v24*v31 + u13*u21*u34*v12*v23*v31 - u13*u22*u31*v11*v23*v34 - u13*u22*u34*v11*v23*v31 - u13*u23*u31*v11*v22*v34 + u13*u23*u31*v12*v21*v34 - u13*u23*u34*v11*v22*v31 + u13*u23*u34*v12*v21*v31 - u13*u24*u31*v12*v21*v33 + u13*u24*u32*v11*v21*v33 + u13*u24*u33*v11*v21*v32 - u13*u24*u33*v12*v21*v31 - u14*u21*u32*v11*v23*v33 - u14*u21*u33*v11*v23*v32 + u14*u22*u31*v11*v23*v33 + u14*u22*u33*v11*v23*v31 + u14*u23*u31*v11*v22*v33 - u14*u23*u32*v11*v21*v33 - u14*u23*u33*v11*v21*v32 + u14*u23*u33*v11*v22*v31 - u11*u22*u32*v13*v23*v35 + u11*u22*u32*v13*v25*v33 + u11*u22*u33*v13*v25*v32 - u11*u22*u35*v13*v23*v32 - u11*u23*u32*v13*v22*v35 - u11*u23*u35*v13*v22*v32 + u11*u25*u32*v13*v22*v33 + u11*u25*u33*v13*v22*v32 + u12*u21*u32*v13*v23*v35 - u12*u21*u32*v15*v23*v33 - u12*u21*u33*v15*v23*v32 + u12*u21*u35*v13*v23*v32 - u12*u22*u31*v13*v25*v33 + u12*u22*u31*v15*v23*v33 - u12*u22*u33*v13*v25*v31 + u12*u22*u33*v15*v23*v31 + u12*u23*u31*v15*v22*v33 + u12*u23*u32*v13*v21*v35 - u12*u23*u32*v15*v21*v33 - u12*u23*u33*v15*v21*v32 + u12*u23*u33*v15*v22*v31 + u12*u23*u35*v13*v21*v32 - u12*u25*u31*v13*v22*v33 - u12*u25*u33*v13*v22*v31 + u13*u21*u32*v12*v23*v35 + u13*u21*u35*v12*v23*v32 - u13*u22*u31*v12*v25*v33 - u13*u22*u32*v11*v23*v35 + u13*u22*u32*v11*v25*v33 + u13*u22*u33*v11*v25*v32 - u13*u22*u33*v12*v25*v31 - u13*u22*u35*v11*v23*v32 - u13*u23*u32*v11*v22*v35 + u13*u23*u32*v12*v21*v35 - u13*u23*u35*v11*v22*v32 + u13*u23*u35*v12*v21*v32 - u13*u25*u31*v12*v22*v33 + u13*u25*u32*v11*v22*v33 + u13*u25*u33*v11*v22*v32 - u13*u25*u33*v12*v22*v31 - u15*u21*u32*v12*v23*v33 - u15*u21*u33*v12*v23*v32 + u15*u22*u31*v12*v23*v33 + u15*u22*u33*v12*v23*v31 + u15*u23*u31*v12*v22*v33 - u15*u23*u32*v12*v21*v33 - u15*u23*u33*v12*v21*v32 + u15*u23*u33*v12*v22*v31 + u11*u22*u33*v13*v23*v36 + u11*u22*u36*v13*v23*v33 - u11*u23*u32*v13*v26*v33 + u11*u23*u33*v13*v22*v36 - u11*u23*u33*v13*v26*v32 + u11*u23*u36*v13*v22*v33 - u11*u26*u32*v13*v23*v33 - u11*u26*u33*v13*v23*v32 - u12*u21*u33*v13*v23*v36 - u12*u21*u36*v13*v23*v33 + u12*u23*u31*v13*v26*v33 - u12*u23*u33*v13*v21*v36 + u12*u23*u33*v13*v26*v31 - u12*u23*u36*v13*v21*v33 + u12*u26*u31*v13*v23*v33 + u12*u26*u33*v13*v23*v31 + u13*u21*u32*v16*v23*v33 - u13*u21*u33*v12*v23*v36 + u13*u21*u33*v16*v23*v32 - u13*u21*u36*v12*v23*v33 - u13*u22*u31*v16*v23*v33 + u13*u22*u33*v11*v23*v36 - u13*u22*u33*v16*v23*v31 + u13*u22*u36*v11*v23*v33 + u13*u23*u31*v12*v26*v33 - u13*u23*u31*v16*v22*v33 - u13*u23*u32*v11*v26*v33 + u13*u23*u32*v16*v21*v33 + u13*u23*u33*v11*v22*v36 - u13*u23*u33*v11*v26*v32 - u13*u23*u33*v12*v21*v36 + u13*u23*u33*v12*v26*v31 + u13*u23*u33*v16*v21*v32 - u13*u23*u33*v16*v22*v31 + u13*u23*u36*v11*v22*v33 - u13*u23*u36*v12*v21*v33 + u13*u26*u31*v12*v23*v33 - u13*u26*u32*v11*v23*v33 - u13*u26*u33*v11*v23*v32 + u13*u26*u33*v12*v23*v31 + u16*u21*u32*v13*v23*v33 + u16*u21*u33*v13*v23*v32 - u16*u22*u31*v13*v23*v33 - u16*u22*u33*v13*v23*v31 - u16*u23*u31*v13*v22*v33 + u16*u23*u32*v13*v21*v33 + u16*u23*u33*v13*v21*v32 - u16*u23*u33*v13*v22*v31;
	c2 = 2*u11*u21*u33*v13*v24*v31 - 2*u11*u21*u33*v14*v23*v31 - 2*u11*u23*u31*v13*v21*v34 + 2*u11*u23*u31*v14*v21*v33 - 2*u11*u23*u34*v13*v21*v31 + 2*u11*u24*u33*v13*v21*v31 + 2*u13*u21*u31*v11*v23*v34 - 2*u13*u21*u31*v11*v24*v33 + 2*u13*u21*u34*v11*v23*v31 - 2*u13*u24*u31*v11*v21*v33 - 2*u14*u21*u33*v11*v23*v31 + 2*u14*u23*u31*v11*v21*v33 - 2*u11*u21*u32*v13*v25*v33 + 2*u11*u21*u32*v15*v23*v33 - 2*u11*u21*u33*v13*v25*v32 + 2*u11*u21*u33*v15*v23*v32 + 2*u11*u22*u31*v13*v23*v35 - 2*u11*u22*u31*v15*v23*v33 - 2*u11*u22*u32*v13*v23*v34 + 2*u11*u22*u32*v13*v24*v33 + 2*u11*u22*u33*v13*v24*v32 + 2*u11*u22*u33*v13*v25*v31 - 2*u11*u22*u33*v14*v23*v32 - 2*u11*u22*u33*v15*v23*v31 + 2*u11*u22*u34*v13*v23*v32 - 2*u11*u22*u35*v13*v23*v31 + 2*u11*u23*u31*v13*v22*v35 - 2*u11*u23*u31*v15*v22*v33 - 2*u11*u23*u32*v13*v21*v35 - 2*u11*u23*u32*v13*v22*v34 + 2*u11*u23*u32*v14*v22*v33 + 2*u11*u23*u32*v15*v21*v33 + 2*u11*u23*u33*v15*v21*v32 - 2*u11*u23*u33*v15*v22*v31 + 2*u11*u23*u34*v13*v22*v32 - 2*u11*u23*u35*v13*v21*v32 - 2*u11*u23*u35*v13*v22*v31 - 2*u11*u24*u32*v13*v22*v33 - 2*u11*u24*u33*v13*v22*v32 + 2*u11*u25*u32*v13*v21*v33 + 2*u11*u25*u33*v13*v21*v32 + 2*u11*u25*u33*v13*v22*v31 - 2*u12*u21*u31*v13*v23*v35 + 2*u12*u21*u31*v13*v25*v33 + 2*u12*u21*u32*v13*v23*v34 - 2*u12*u21*u32*v14*v23*v33 + 2*u12*u21*u33*v13*v24*v32 + 2*u12*u21*u33*v13*v25*v31 - 2*u12*u21*u33*v14*v23*v32 - 2*u12*u21*u33*v15*v23*v31 - 2*u12*u21*u34*v13*v23*v32 + 2*u12*u21*u35*v13*v23*v31 - 2*u12*u22*u31*v13*v24*v33 + 2*u12*u22*u31*v14*v23*v33 - 2*u12*u22*u33*v13*v24*v31 + 2*u12*u22*u33*v14*v23*v31 - 2*u12*u23*u31*v13*v21*v35 - 2*u12*u23*u31*v13*v22*v34 + 2*u12*u23*u31*v14*v22*v33 + 2*u12*u23*u31*v15*v21*v33 + 2*u12*u23*u32*v13*v21*v34 - 2*u12*u23*u32*v14*v21*v33 - 2*u12*u23*u33*v14*v21*v32 + 2*u12*u23*u33*v14*v22*v31 - 2*u12*u23*u34*v13*v21*v32 - 2*u12*u23*u34*v13*v22*v31 + 2*u12*u23*u35*v13*v21*v31 + 2*u12*u24*u31*v13*v22*v33 + 2*u12*u24*u33*v13*v21*v32 + 2*u12*u24*u33*v13*v22*v31 - 2*u12*u25*u31*v13*v21*v33 - 2*u12*u25*u33*v13*v21*v31 - 2*u13*u21*u31*v12*v23*v35 + 2*u13*u21*u31*v12*v25*v33 + 2*u13*u21*u32*v11*v23*v35 - 2*u13*u21*u32*v11*v25*v33 + 2*u13*u21*u32*v12*v23*v34 - 2*u13*u21*u32*v12*v24*v33 - 2*u13*u21*u33*v11*v25*v32 + 2*u13*u21*u33*v12*v25*v31 - 2*u13*u21*u34*v12*v23*v32 + 2*u13*u21*u35*v11*v23*v32 + 2*u13*u21*u35*v12*v23*v31 + 2*u13*u22*u31*v11*v23*v35 - 2*u13*u22*u31*v11*v25*v33 + 2*u13*u22*u31*v12*v23*v34 - 2*u13*u22*u31*v12*v24*v33 - 2*u13*u22*u32*v11*v23*v34 + 2*u13*u22*u32*v11*v24*v33 + 2*u13*u22*u33*v11*v24*v32 - 2*u13*u22*u33*v12*v24*v31 + 2*u13*u22*u34*v11*v23*v32 + 2*u13*u22*u34*v12*v23*v31 - 2*u13*u22*u35*v11*v23*v31 + 2*u13*u23*u31*v11*v22*v35 - 2*u13*u23*u31*v12*v21*v35 - 2*u13*u23*u32*v11*v22*v34 + 2*u13*u23*u32*v12*v21*v34 + 2*u13*u23*u34*v11*v22*v32 - 2*u13*u23*u34*v12*v21*v32 - 2*u13*u23*u35*v11*v22*v31 + 2*u13*u23*u35*v12*v21*v31 + 2*u13*u24*u31*v12*v22*v33 - 2*u13*u24*u32*v11*v22*v33 - 2*u13*u24*u32*v12*v21*v33 - 2*u13*u24*u33*v11*v22*v32 + 2*u13*u24*u33*v12*v22*v31 - 2*u13*u25*u31*v11*v22*v33 - 2*u13*u25*u31*v12*v21*v33 + 2*u13*u25*u32*v11*v21*v33 + 2*u13*u25*u33*v11*v21*v32 - 2*u13*u25*u33*v12*v21*v31 + 2*u14*u21*u32*v12*v23*v33 + 2*u14*u21*u33*v12*v23*v32 - 2*u14*u22*u31*v12*v23*v33 - 2*u14*u22*u33*v11*v23*v32 - 2*u14*u22*u33*v12*v23*v31 - 2*u14*u23*u31*v12*v22*v33 + 2*u14*u23*u32*v11*v22*v33 + 2*u14*u23*u32*v12*v21*v33 + 2*u14*u23*u33*v12*v21*v32 - 2*u14*u23*u33*v12*v22*v31 - 2*u15*u21*u32*v11*v23*v33 - 2*u15*u21*u33*v11*v23*v32 - 2*u15*u21*u33*v12*v23*v31 + 2*u15*u22*u31*v11*v23*v33 + 2*u15*u22*u33*v11*v23*v31 + 2*u15*u23*u31*v11*v22*v33 + 2*u15*u23*u31*v12*v21*v33 - 2*u15*u23*u32*v11*v21*v33 - 2*u15*u23*u33*v11*v21*v32 + 2*u15*u23*u33*v11*v22*v31 + 2*u11*u23*u33*v13*v21*v36 - 2*u11*u23*u33*v13*v26*v31 + 2*u11*u23*u36*v13*v21*v33 - 2*u11*u26*u33*v13*v23*v31 + 2*u12*u22*u33*v13*v25*v32 - 2*u12*u22*u33*v15*v23*v32 - 2*u12*u23*u32*v13*v22*v35 + 2*u12*u23*u32*v15*v22*v33 - 2*u12*u23*u35*v13*v22*v32 + 2*u12*u25*u33*v13*v22*v32 - 2*u13*u21*u33*v11*v23*v36 + 2*u13*u21*u33*v16*v23*v31 - 2*u13*u21*u36*v11*v23*v33 + 2*u13*u22*u32*v12*v23*v35 - 2*u13*u22*u32*v12*v25*v33 + 2*u13*u22*u35*v12*v23*v32 + 2*u13*u23*u31*v11*v26*v33 - 2*u13*u23*u31*v16*v21*v33 - 2*u13*u25*u32*v12*v22*v33 + 2*u13*u26*u31*v11*v23*v33 - 2*u15*u22*u33*v12*v23*v32 + 2*u15*u23*u32*v12*v22*v33 + 2*u16*u21*u33*v13*v23*v31 - 2*u16*u23*u31*v13*v21*v33 + 2*u12*u23*u33*v13*v22*v36 - 2*u12*u23*u33*v13*v26*v32 + 2*u12*u23*u36*v13*v22*v33 - 2*u12*u26*u33*v13*v23*v32 - 2*u13*u22*u33*v12*v23*v36 + 2*u13*u22*u33*v16*v23*v32 - 2*u13*u22*u36*v12*v23*v33 + 2*u13*u23*u32*v12*v26*v33 - 2*u13*u23*u32*v16*v22*v33 + 2*u13*u26*u32*v12*v23*v33 + 2*u16*u22*u33*v13*v23*v32 - 2*u16*u23*u32*v13*v22*v33;
	c3 = 2*u11*u21*u33*v14*v23*v32 - 4*u11*u21*u33*v13*v25*v31 - 2*u11*u21*u33*v13*v24*v32 + 4*u11*u21*u33*v15*v23*v31 + 4*u11*u22*u33*v13*v24*v31 - 2*u11*u22*u33*v14*v23*v31 + 4*u11*u23*u31*v13*v21*v35 + 2*u11*u23*u31*v13*v22*v34 - 2*u11*u23*u31*v14*v22*v33 - 4*u11*u23*u31*v15*v21*v33 - 4*u11*u23*u32*v13*v21*v34 + 2*u11*u23*u32*v14*v21*v33 + 4*u11*u23*u34*v13*v21*v32 + 2*u11*u23*u34*v13*v22*v31 - 4*u11*u23*u35*v13*v21*v31 - 2*u11*u24*u33*v13*v21*v32 - 4*u11*u24*u33*v13*v22*v31 + 4*u11*u25*u33*v13*v21*v31 + 2*u12*u21*u33*v13*v24*v31 - 4*u12*u21*u33*v14*v23*v31 - 2*u12*u23*u31*v13*v21*v34 + 4*u12*u23*u31*v14*v21*v33 - 2*u12*u23*u34*v13*v21*v31 + 2*u12*u24*u33*v13*v21*v31 - 4*u13*u21*u31*v11*v23*v35 + 4*u13*u21*u31*v11*v25*v33 - 2*u13*u21*u31*v12*v23*v34 + 2*u13*u21*u31*v12*v24*v33 + 4*u13*u21*u32*v11*v23*v34 - 2*u13*u21*u32*v11*v24*v33 - 4*u13*u21*u34*v11*v23*v32 - 2*u13*u21*u34*v12*v23*v31 + 4*u13*u21*u35*v11*v23*v31 + 2*u13*u22*u31*v11*v23*v34 - 4*u13*u22*u31*v11*v24*v33 + 2*u13*u22*u34*v11*v23*v31 + 4*u13*u24*u31*v11*v22*v33 + 2*u13*u24*u31*v12*v21*v33 - 2*u13*u24*u32*v11*v21*v33 - 4*u13*u25*u31*v11*v21*v33 + 2*u14*u21*u33*v11*v23*v32 + 4*u14*u21*u33*v12*v23*v31 - 2*u14*u22*u33*v11*v23*v31 - 2*u14*u23*u31*v11*v22*v33 - 4*u14*u23*u31*v12*v21*v33 + 2*u14*u23*u32*v11*v21*v33 - 4*u15*u21*u33*v11*v23*v31 + 4*u15*u23*u31*v11*v21*v33 - 2*u11*u22*u33*v13*v25*v32 + 4*u11*u22*u33*v15*v23*v32 + 2*u11*u23*u32*v13*v22*v35 - 4*u11*u23*u32*v15*v22*v33 + 2*u11*u23*u35*v13*v22*v32 - 2*u11*u25*u33*v13*v22*v32 - 4*u12*u21*u33*v13*v25*v32 + 2*u12*u21*u33*v15*v23*v32 + 4*u12*u22*u33*v13*v24*v32 + 2*u12*u22*u33*v13*v25*v31 - 4*u12*u22*u33*v14*v23*v32 - 2*u12*u22*u33*v15*v23*v31 + 4*u12*u23*u31*v13*v22*v35 - 2*u12*u23*u31*v15*v22*v33 - 2*u12*u23*u32*v13*v21*v35 - 4*u12*u23*u32*v13*v22*v34 + 4*u12*u23*u32*v14*v22*v33 + 2*u12*u23*u32*v15*v21*v33 + 4*u12*u23*u34*v13*v22*v32 - 2*u12*u23*u35*v13*v21*v32 - 4*u12*u23*u35*v13*v22*v31 - 4*u12*u24*u33*v13*v22*v32 + 4*u12*u25*u33*v13*v21*v32 + 2*u12*u25*u33*v13*v22*v31 - 2*u13*u21*u32*v12*v23*v35 + 4*u13*u21*u32*v12*v25*v33 - 2*u13*u21*u35*v12*v23*v32 - 4*u13*u22*u31*v12*v23*v35 + 2*u13*u22*u31*v12*v25*v33 + 2*u13*u22*u32*v11*v23*v35 - 2*u13*u22*u32*v11*v25*v33 + 4*u13*u22*u32*v12*v23*v34 - 4*u13*u22*u32*v12*v24*v33 - 4*u13*u22*u34*v12*v23*v32 + 2*u13*u22*u35*v11*v23*v32 + 4*u13*u22*u35*v12*v23*v31 + 4*u13*u24*u32*v12*v22*v33 + 2*u13*u25*u31*v12*v22*v33 - 2*u13*u25*u32*v11*v22*v33 - 4*u13*u25*u32*v12*v21*v33 + 4*u14*u22*u33*v12*v23*v32 - 4*u14*u23*u32*v12*v22*v33 + 2*u15*u21*u33*v12*v23*v32 - 4*u15*u22*u33*v11*v23*v32 - 2*u15*u22*u33*v12*v23*v31 - 2*u15*u23*u31*v12*v22*v33 + 4*u15*u23*u32*v11*v22*v33 + 2*u15*u23*u32*v12*v21*v33 + 2*u11*u22*u33*v13*v23*v36 + 2*u11*u22*u36*v13*v23*v33 - 2*u11*u23*u32*v13*v26*v33 - 2*u11*u26*u32*v13*v23*v33 - 2*u12*u21*u33*v13*v23*v36 - 2*u12*u21*u36*v13*v23*v33 + 2*u12*u23*u31*v13*v26*v33 + 2*u12*u26*u31*v13*v23*v33 + 2*u13*u21*u32*v16*v23*v33 - 2*u13*u22*u31*v16*v23*v33 + 2*u13*u23*u33*v11*v22*v36 - 2*u13*u23*u33*v11*v26*v32 - 2*u13*u23*u33*v12*v21*v36 + 2*u13*u23*u33*v12*v26*v31 + 2*u13*u23*u33*v16*v21*v32 - 2*u13*u23*u33*v16*v22*v31 + 2*u13*u23*u36*v11*v22*v33 - 2*u13*u23*u36*v12*v21*v33 - 2*u13*u26*u33*v11*v23*v32 + 2*u13*u26*u33*v12*v23*v31 + 2*u16*u21*u32*v13*v23*v33 - 2*u16*u22*u31*v13*v23*v33 + 2*u16*u23*u33*v13*v21*v32 - 2*u16*u23*u33*v13*v22*v31;
	c4 = 2*u11*u21*u33*v14*v23*v31 - 2*u11*u21*u33*v13*v24*v31 + 2*u11*u23*u31*v13*v21*v34 - 2*u11*u23*u31*v14*v21*v33 + 2*u11*u23*u34*v13*v21*v31 - 2*u11*u24*u33*v13*v21*v31 - 2*u13*u21*u31*v11*v23*v34 + 2*u13*u21*u31*v11*v24*v33 - 2*u13*u21*u34*v11*v23*v31 + 2*u13*u24*u31*v11*v21*v33 + 2*u14*u21*u33*v11*v23*v31 - 2*u14*u23*u31*v11*v21*v33 - 2*u11*u21*u32*v13*v25*v33 + 2*u11*u21*u32*v15*v23*v33 + 2*u11*u21*u33*v13*v25*v32 - 2*u11*u21*u33*v15*v23*v32 + 2*u11*u22*u31*v13*v23*v35 - 2*u11*u22*u31*v15*v23*v33 - 2*u11*u22*u32*v13*v23*v34 + 2*u11*u22*u32*v13*v24*v33 - 2*u11*u22*u33*v13*v24*v32 - 2*u11*u22*u33*v13*v25*v31 + 2*u11*u22*u33*v14*v23*v32 + 2*u11*u22*u33*v15*v23*v31 + 2*u11*u22*u34*v13*v23*v32 - 2*u11*u22*u35*v13*v23*v31 - 2*u11*u23*u31*v13*v22*v35 + 2*u11*u23*u31*v15*v22*v33 + 2*u11*u23*u32*v13*v21*v35 + 2*u11*u23*u32*v13*v22*v34 - 2*u11*u23*u32*v14*v22*v33 - 2*u11*u23*u32*v15*v21*v33 + 2*u11*u23*u33*v15*v21*v32 - 2*u11*u23*u33*v15*v22*v31 - 2*u11*u23*u34*v13*v22*v32 + 2*u11*u23*u35*v13*v21*v32 + 2*u11*u23*u35*v13*v22*v31 - 2*u11*u24*u32*v13*v22*v33 + 2*u11*u24*u33*v13*v22*v32 + 2*u11*u25*u32*v13*v21*v33 - 2*u11*u25*u33*v13*v21*v32 - 2*u11*u25*u33*v13*v22*v31 - 2*u12*u21*u31*v13*v23*v35 + 2*u12*u21*u31*v13*v25*v33 + 2*u12*u21*u32*v13*v23*v34 - 2*u12*u21*u32*v14*v23*v33 - 2*u12*u21*u33*v13*v24*v32 - 2*u12*u21*u33*v13*v25*v31 + 2*u12*u21*u33*v14*v23*v32 + 2*u12*u21*u33*v15*v23*v31 - 2*u12*u21*u34*v13*v23*v32 + 2*u12*u21*u35*v13*v23*v31 - 2*u12*u22*u31*v13*v24*v33 + 2*u12*u22*u31*v14*v23*v33 + 2*u12*u22*u33*v13*v24*v31 - 2*u12*u22*u33*v14*v23*v31 + 2*u12*u23*u31*v13*v21*v35 + 2*u12*u23*u31*v13*v22*v34 - 2*u12*u23*u31*v14*v22*v33 - 2*u12*u23*u31*v15*v21*v33 - 2*u12*u23*u32*v13*v21*v34 + 2*u12*u23*u32*v14*v21*v33 - 2*u12*u23*u33*v14*v21*v32 + 2*u12*u23*u33*v14*v22*v31 + 2*u12*u23*u34*v13*v21*v32 + 2*u12*u23*u34*v13*v22*v31 - 2*u12*u23*u35*v13*v21*v31 + 2*u12*u24*u31*v13*v22*v33 - 2*u12*u24*u33*v13*v21*v32 - 2*u12*u24*u33*v13*v22*v31 - 2*u12*u25*u31*v13*v21*v33 + 2*u12*u25*u33*v13*v21*v31 + 2*u13*u21*u31*v12*v23*v35 - 2*u13*u21*u31*v12*v25*v33 - 2*u13*u21*u32*v11*v23*v35 + 2*u13*u21*u32*v11*v25*v33 - 2*u13*u21*u32*v12*v23*v34 + 2*u13*u21*u32*v12*v24*v33 - 2*u13*u21*u33*v11*v25*v32 + 2*u13*u21*u33*v12*v25*v31 + 2*u13*u21*u34*v12*v23*v32 - 2*u13*u21*u35*v11*v23*v32 - 2*u13*u21*u35*v12*v23*v31 - 2*u13*u22*u31*v11*v23*v35 + 2*u13*u22*u31*v11*v25*v33 - 2*u13*u22*u31*v12*v23*v34 + 2*u13*u22*u31*v12*v24*v33 + 2*u13*u22*u32*v11*v23*v34 - 2*u13*u22*u32*v11*v24*v33 + 2*u13*u22*u33*v11*v24*v32 - 2*u13*u22*u33*v12*v24*v31 - 2*u13*u22*u34*v11*v23*v32 - 2*u13*u22*u34*v12*v23*v31 + 2*u13*u22*u35*v11*v23*v31 + 2*u13*u23*u31*v11*v22*v35 - 2*u13*u23*u31*v12*v21*v35 - 2*u13*u23*u32*v11*v22*v34 + 2*u13*u23*u32*v12*v21*v34 + 2*u13*u23*u34*v11*v22*v32 - 2*u13*u23*u34*v12*v21*v32 - 2*u13*u23*u35*v11*v22*v31 + 2*u13*u23*u35*v12*v21*v31 - 2*u13*u24*u31*v12*v22*v33 + 2*u13*u24*u32*v11*v22*v33 + 2*u13*u24*u32*v12*v21*v33 - 2*u13*u24*u33*v11*v22*v32 + 2*u13*u24*u33*v12*v22*v31 + 2*u13*u25*u31*v11*v22*v33 + 2*u13*u25*u31*v12*v21*v33 - 2*u13*u25*u32*v11*v21*v33 + 2*u13*u25*u33*v11*v21*v32 - 2*u13*u25*u33*v12*v21*v31 + 2*u14*u21*u32*v12*v23*v33 - 2*u14*u21*u33*v12*v23*v32 - 2*u14*u22*u31*v12*v23*v33 + 2*u14*u22*u33*v11*v23*v32 + 2*u14*u22*u33*v12*v23*v31 + 2*u14*u23*u31*v12*v22*v33 - 2*u14*u23*u32*v11*v22*v33 - 2*u14*u23*u32*v12*v21*v33 + 2*u14*u23*u33*v12*v21*v32 - 2*u14*u23*u33*v12*v22*v31 - 2*u15*u21*u32*v11*v23*v33 + 2*u15*u21*u33*v11*v23*v32 + 2*u15*u21*u33*v12*v23*v31 + 2*u15*u22*u31*v11*v23*v33 - 2*u15*u22*u33*v11*v23*v31 - 2*u15*u23*u31*v11*v22*v33 - 2*u15*u23*u31*v12*v21*v33 + 2*u15*u23*u32*v11*v21*v33 - 2*u15*u23*u33*v11*v21*v32 + 2*u15*u23*u33*v11*v22*v31 + 2*u11*u23*u33*v13*v21*v36 - 2*u11*u23*u33*v13*v26*v31 + 2*u11*u23*u36*v13*v21*v33 - 2*u11*u26*u33*v13*v23*v31 - 2*u12*u22*u33*v13*v25*v32 + 2*u12*u22*u33*v15*v23*v32 + 2*u12*u23*u32*v13*v22*v35 - 2*u12*u23*u32*v15*v22*v33 + 2*u12*u23*u35*v13*v22*v32 - 2*u12*u25*u33*v13*v22*v32 - 2*u13*u21*u33*v11*v23*v36 + 2*u13*u21*u33*v16*v23*v31 - 2*u13*u21*u36*v11*v23*v33 - 2*u13*u22*u32*v12*v23*v35 + 2*u13*u22*u32*v12*v25*v33 - 2*u13*u22*u35*v12*v23*v32 + 2*u13*u23*u31*v11*v26*v33 - 2*u13*u23*u31*v16*v21*v33 + 2*u13*u25*u32*v12*v22*v33 + 2*u13*u26*u31*v11*v23*v33 + 2*u15*u22*u33*v12*v23*v32 - 2*u15*u23*u32*v12*v22*v33 + 2*u16*u21*u33*v13*v23*v31 - 2*u16*u23*u31*v13*v21*v33 + 2*u12*u23*u33*v13*v22*v36 - 2*u12*u23*u33*v13*v26*v32 + 2*u12*u23*u36*v13*v22*v33 - 2*u12*u26*u33*v13*v23*v32 - 2*u13*u22*u33*v12*v23*v36 + 2*u13*u22*u33*v16*v23*v32 - 2*u13*u22*u36*v12*v23*v33 + 2*u13*u23*u32*v12*v26*v33 - 2*u13*u23*u32*v16*v22*v33 + 2*u13*u26*u32*v12*v23*v33 + 2*u16*u22*u33*v13*v23*v32 - 2*u16*u23*u32*v13*v22*v33;
	c5 = u11*u21*u32*v14*v23*v33 - u11*u21*u32*v13*v24*v33 + u11*u21*u33*v13*v24*v32 - u11*u21*u33*v14*v23*v32 + u11*u22*u31*v13*v23*v34 - u11*u22*u31*v14*v23*v33 + u11*u22*u33*v14*v23*v31 + u11*u22*u34*v13*v23*v31 - u11*u23*u31*v13*v22*v34 + u11*u23*u31*v14*v22*v33 - u11*u23*u32*v14*v21*v33 + u11*u23*u33*v14*v21*v32 - u11*u23*u33*v14*v22*v31 - u11*u23*u34*v13*v22*v31 - u11*u24*u32*v13*v21*v33 + u11*u24*u33*v13*v21*v32 - u12*u21*u31*v13*v23*v34 + u12*u21*u31*v13*v24*v33 - u12*u21*u33*v13*v24*v31 - u12*u21*u34*v13*v23*v31 + u12*u23*u31*v13*v21*v34 + u12*u23*u34*v13*v21*v31 + u12*u24*u31*v13*v21*v33 - u12*u24*u33*v13*v21*v31 + u13*u21*u31*v12*v23*v34 - u13*u21*u31*v12*v24*v33 + u13*u21*u32*v11*v24*v33 - u13*u21*u33*v11*v24*v32 + u13*u21*u33*v12*v24*v31 + u13*u21*u34*v12*v23*v31 - u13*u22*u31*v11*v23*v34 - u13*u22*u34*v11*v23*v31 + u13*u23*u31*v11*v22*v34 - u13*u23*u31*v12*v21*v34 + u13*u23*u34*v11*v22*v31 - u13*u23*u34*v12*v21*v31 - u13*u24*u31*v12*v21*v33 + u13*u24*u32*v11*v21*v33 - u13*u24*u33*v11*v21*v32 + u13*u24*u33*v12*v21*v31 + u14*u21*u32*v11*v23*v33 - u14*u21*u33*v11*v23*v32 - u14*u22*u31*v11*v23*v33 + u14*u22*u33*v11*v23*v31 + u14*u23*u31*v11*v22*v33 - u14*u23*u32*v11*v21*v33 + u14*u23*u33*v11*v21*v32 - u14*u23*u33*v11*v22*v31 + u11*u22*u32*v13*v23*v35 - u11*u22*u32*v13*v25*v33 + u11*u22*u33*v13*v25*v32 + u11*u22*u35*v13*v23*v32 - u11*u23*u32*v13*v22*v35 - u11*u23*u35*v13*v22*v32 - u11*u25*u32*v13*v22*v33 + u11*u25*u33*v13*v22*v32 - u12*u21*u32*v13*v23*v35 + u12*u21*u32*v15*v23*v33 - u12*u21*u33*v15*v23*v32 - u12*u21*u35*v13*v23*v32 + u12*u22*u31*v13*v25*v33 - u12*u22*u31*v15*v23*v33 - u12*u22*u33*v13*v25*v31 + u12*u22*u33*v15*v23*v31 + u12*u23*u31*v15*v22*v33 + u12*u23*u32*v13*v21*v35 - u12*u23*u32*v15*v21*v33 + u12*u23*u33*v15*v21*v32 - u12*u23*u33*v15*v22*v31 + u12*u23*u35*v13*v21*v32 + u12*u25*u31*v13*v22*v33 - u12*u25*u33*v13*v22*v31 + u13*u21*u32*v12*v23*v35 + u13*u21*u35*v12*v23*v32 - u13*u22*u31*v12*v25*v33 - u13*u22*u32*v11*v23*v35 + u13*u22*u32*v11*v25*v33 - u13*u22*u33*v11*v25*v32 + u13*u22*u33*v12*v25*v31 - u13*u22*u35*v11*v23*v32 + u13*u23*u32*v11*v22*v35 - u13*u23*u32*v12*v21*v35 + u13*u23*u35*v11*v22*v32 - u13*u23*u35*v12*v21*v32 - u13*u25*u31*v12*v22*v33 + u13*u25*u32*v11*v22*v33 - u13*u25*u33*v11*v22*v32 + u13*u25*u33*v12*v22*v31 + u15*u21*u32*v12*v23*v33 - u15*u21*u33*v12*v23*v32 - u15*u22*u31*v12*v23*v33 + u15*u22*u33*v12*v23*v31 + u15*u23*u31*v12*v22*v33 - u15*u23*u32*v12*v21*v33 + u15*u23*u33*v12*v21*v32 - u15*u23*u33*v12*v22*v31 + u11*u22*u33*v13*v23*v36 + u11*u22*u36*v13*v23*v33 - u11*u23*u32*v13*v26*v33 - u11*u23*u33*v13*v22*v36 + u11*u23*u33*v13*v26*v32 - u11*u23*u36*v13*v22*v33 - u11*u26*u32*v13*v23*v33 + u11*u26*u33*v13*v23*v32 - u12*u21*u33*v13*v23*v36 - u12*u21*u36*v13*v23*v33 + u12*u23*u31*v13*v26*v33 + u12*u23*u33*v13*v21*v36 - u12*u23*u33*v13*v26*v31 + u12*u23*u36*v13*v21*v33 + u12*u26*u31*v13*v23*v33 - u12*u26*u33*v13*v23*v31 + u13*u21*u32*v16*v23*v33 + u13*u21*u33*v12*v23*v36 - u13*u21*u33*v16*v23*v32 + u13*u21*u36*v12*v23*v33 - u13*u22*u31*v16*v23*v33 - u13*u22*u33*v11*v23*v36 + u13*u22*u33*v16*v23*v31 - u13*u22*u36*v11*v23*v33 - u13*u23*u31*v12*v26*v33 + u13*u23*u31*v16*v22*v33 + u13*u23*u32*v11*v26*v33 - u13*u23*u32*v16*v21*v33 + u13*u23*u33*v11*v22*v36 - u13*u23*u33*v11*v26*v32 - u13*u23*u33*v12*v21*v36 + u13*u23*u33*v12*v26*v31 + u13*u23*u33*v16*v21*v32 - u13*u23*u33*v16*v22*v31 + u13*u23*u36*v11*v22*v33 - u13*u23*u36*v12*v21*v33 - u13*u26*u31*v12*v23*v33 + u13*u26*u32*v11*v23*v33 - u13*u26*u33*v11*v23*v32 + u13*u26*u33*v12*v23*v31 + u16*u21*u32*v13*v23*v33 - u16*u21*u33*v13*v23*v32 - u16*u22*u31*v13*v23*v33 + u16*u22*u33*v13*v23*v31 + u16*u23*u31*v13*v22*v33 - u16*u23*u32*v13*v21*v33 + u16*u23*u33*v13*v21*v32 - u16*u23*u33*v13*v22*v31;

	//	std::cerr << "[ERR]: new version working" << std::endl;

	// get the roots (will be sTheta)
	Eigen::Matrix<floatPrec, 5, 1> factors;
	factors(0, 0) = c1;
	factors(1, 0) = c2;
	factors(2, 0) = c3;
	factors(3, 0) = c4;
	factors(4, 0) = c5;
	vector<floatPrec> realRoots = o4_roots(factors);
	if (verbose)
		cout << "[VERBOSE] The number of valid solutions is: " << realRoots.size() << endl;

	// estimate the resulting transformations for each of the roots
	floatPrec s, sTheta1, sTheta2, tx, ty;
	floatPrec a, b, shouldBeZero1, shouldBeZero2;
	Matrix<floatPrec, 4, 4> transOut;
	vector<Matrix<floatPrec, 4, 4>> out;
	unsigned int numSolutions = realRoots.size();
	for (unsigned int iter = 0; iter < numSolutions; iter++)
	{

		// get the cTheta
		s = realRoots.back();
		realRoots.pop_back();

		// get the transformation for sTheta1
        a = (1-s*s) / (1+s*s);
        b = 2*s / (1+s*s);
		
		tx = -(u13 * u23 * v11 * v26 - u13 * u23 * v16 * v21 + u13 * u26 * v11 * v23 - u16 * u23 * v13 * v21 - a * u11 * u23 * v14 * v21 + a * u13 * u21 * v11 * v24 + a * u13 * u24 * v11 * v21 - a * u14 * u23 * v11 * v21 - a * u12 * u23 * v15 * v21 + a * u13 * u22 * v11 * v25 + a * u13 * u25 * v11 * v22 - a * u15 * u23 * v12 * v21 - a * u11 * u23 * v13 * v26 - a * u11 * u26 * v13 * v23 + a * u13 * u21 * v16 * v23 + a * u16 * u21 * v13 * v23 - b * u11 * u23 * v15 * v21 + b * u12 * u23 * v14 * v21 + b * u13 * u21 * v11 * v25 - b * u13 * u22 * v11 * v24 + b * u13 * u24 * v11 * v22 - b * u13 * u25 * v11 * v21 - b * u14 * u23 * v12 * v21 + b * u15 * u23 * v11 * v21 + b * u12 * u23 * v13 * v26 + b * u12 * u26 * v13 * v23 - b * u13 * u22 * v16 * v23 - b * u16 * u22 * v13 * v23 - (a * a) * u11 * u21 * v13 * v24 + (a * a) * u11 * u21 * v14 * v23 - (a * a) * u11 * u24 * v13 * v21 + (a * a) * u14 * u21 * v11 * v23 - (a * a) * u11 * u22 * v13 * v25 - (a * a) * u11 * u25 * v13 * v22 + (a * a) * u12 * u21 * v15 * v23 + (a * a) * u15 * u21 * v12 * v23 - (b * b) * u11 * u22 * v15 * v23 + (b * b) * u12 * u21 * v13 * v25 - (b * b) * u12 * u22 * v13 * v24 + (b * b) * u12 * u22 * v14 * v23 + (b * b) * u12 * u24 * v13 * v22 - (b * b) * u12 * u25 * v13 * v21 - (b * b) * u14 * u22 * v12 * v23 + (b * b) * u15 * u22 * v11 * v23 - a * b * u11 * u21 * v13 * v25 + a * b * u11 * u21 * v15 * v23 + a * b * u11 * u22 * v13 * v24 - a * b * u11 * u22 * v14 * v23 - a * b * u11 * u24 * v13 * v22 + a * b * u11 * u25 * v13 * v21 + a * b * u12 * u21 * v13 * v24 - a * b * u12 * u21 * v14 * v23 + a * b * u12 * u24 * v13 * v21 + a * b * u14 * u21 * v12 * v23 - a * b * u14 * u22 * v11 * v23 - a * b * u15 * u21 * v11 * v23 + a * b * u12 * u22 * v13 * v25 - a * b * u12 * u22 * v15 * v23 + a * b * u12 * u25 * v13 * v22 - a * b * u15 * u22 * v12 * v23) / (u13 * u23 * v11 * v22 - u13 * u23 * v12 * v21 - a * u11 * u23 * v13 * v22 + a * u12 * u23 * v13 * v21 + a * u13 * u21 * v12 * v23 - a * u13 * u22 * v11 * v23 + b * u11 * u23 * v13 * v21 - b * u13 * u21 * v11 * v23 + b * u12 * u23 * v13 * v22 - b * u13 * u22 * v12 * v23 + (a * a) * u11 * u22 * v13 * v23 - (a * a) * u12 * u21 * v13 * v23 + (b * b) * u11 * u22 * v13 * v23 - (b * b) * u12 * u21 * v13 * v23);
		ty = -(u13 * u23 * v12 * v26 - u13 * u23 * v16 * v22 + u13 * u26 * v12 * v23 - u16 * u23 * v13 * v22 - a * u11 * u23 * v14 * v22 + a * u13 * u21 * v12 * v24 + a * u13 * u24 * v12 * v21 - a * u14 * u23 * v11 * v22 - a * u12 * u23 * v15 * v22 + a * u13 * u22 * v12 * v25 + a * u13 * u25 * v12 * v22 - a * u15 * u23 * v12 * v22 - a * u12 * u23 * v13 * v26 - a * u12 * u26 * v13 * v23 + a * u13 * u22 * v16 * v23 + a * u16 * u22 * v13 * v23 - b * u11 * u23 * v15 * v22 + b * u12 * u23 * v14 * v22 + b * u13 * u21 * v12 * v25 - b * u13 * u22 * v12 * v24 + b * u13 * u24 * v12 * v22 - b * u13 * u25 * v12 * v21 - b * u14 * u23 * v12 * v22 + b * u15 * u23 * v11 * v22 - b * u11 * u23 * v13 * v26 - b * u11 * u26 * v13 * v23 + b * u13 * u21 * v16 * v23 + b * u16 * u21 * v13 * v23 + (a * a) * u11 * u22 * v14 * v23 - (a * a) * u12 * u21 * v13 * v24 - (a * a) * u12 * u24 * v13 * v21 + (a * a) * u14 * u22 * v11 * v23 - (a * a) * u12 * u22 * v13 * v25 + (a * a) * u12 * u22 * v15 * v23 - (a * a) * u12 * u25 * v13 * v22 + (a * a) * u15 * u22 * v12 * v23 - (b * b) * u11 * u21 * v13 * v25 + (b * b) * u11 * u21 * v15 * v23 + (b * b) * u11 * u22 * v13 * v24 - (b * b) * u11 * u24 * v13 * v22 + (b * b) * u11 * u25 * v13 * v21 - (b * b) * u12 * u21 * v14 * v23 + (b * b) * u14 * u21 * v12 * v23 - (b * b) * u15 * u21 * v11 * v23 - a * b * u11 * u21 * v13 * v24 + a * b * u11 * u21 * v14 * v23 - a * b * u11 * u24 * v13 * v21 + a * b * u14 * u21 * v11 * v23 - a * b * u11 * u22 * v13 * v25 + a * b * u11 * u22 * v15 * v23 - a * b * u11 * u25 * v13 * v22 - a * b * u12 * u21 * v13 * v25 + a * b * u12 * u21 * v15 * v23 + a * b * u12 * u22 * v13 * v24 - a * b * u12 * u22 * v14 * v23 - a * b * u12 * u24 * v13 * v22 + a * b * u12 * u25 * v13 * v21 + a * b * u14 * u22 * v12 * v23 + a * b * u15 * u21 * v12 * v23 - a * b * u15 * u22 * v11 * v23) / (u13 * u23 * v11 * v22 - u13 * u23 * v12 * v21 - a * u11 * u23 * v13 * v22 + a * u12 * u23 * v13 * v21 + a * u13 * u21 * v12 * v23 - a * u13 * u22 * v11 * v23 + b * u11 * u23 * v13 * v21 - b * u13 * u21 * v11 * v23 + b * u12 * u23 * v13 * v22 - b * u13 * u22 * v12 * v23 + (a * a) * u11 * u22 * v13 * v23 - (a * a) * u12 * u21 * v13 * v23 + (b * b) * u11 * u22 * v13 * v23 - (b * b) * u12 * u21 * v13 * v23);
		
		transOut << a, -b, 0, tx,
			b, a, 0, ty,
			0, 0, 1, 0,
			0, 0, 0, 1;
		transOut = TV.inverse() * transOut * TU;
		
		// push the valid transformation to the Output
		out.push_back(transOut);
		if (verbose)
			cout << "[VERBOSE] The estimated " << iter + 1 << " solution is:" << endl
				 << transOut << endl;
	}

	return out;
}